

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

char * duckdb_yyjson::yyjson_mut_write_opts_impl
                 (yyjson_mut_val *val,usize estimated_val_num,yyjson_write_flag flg,
                 yyjson_alc *alc_ptr,usize *dat_len,yyjson_write_err *err)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  _func_void_ptr_void_ptr_size_t *p_Var4;
  _func_void_void_ptr_void_ptr *p_Var5;
  void *pvVar6;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint *puVar57;
  uint64_t uVar58;
  char *pcVar59;
  int iVar60;
  uint *puVar61;
  size_t sVar62;
  ulong uVar63;
  undefined1 *puVar64;
  yyjson_mut_val *pyVar65;
  yyjson_write_err *pyVar66;
  yyjson_write_err *pyVar67;
  undefined2 uVar68;
  uint uVar69;
  int iVar70;
  long lVar71;
  undefined8 uVar72;
  size_t sVar73;
  uint *puVar74;
  yyjson_mut_val *pyVar75;
  size_t sVar76;
  byte bVar77;
  ulong uVar78;
  uint *puVar79;
  byte *pbVar80;
  long lVar81;
  uint uVar82;
  ulong uVar83;
  long lVar84;
  ulong uVar85;
  long lVar86;
  uint uVar87;
  int iVar88;
  undefined2 *puVar89;
  int iVar90;
  undefined **ppuVar91;
  uint uVar92;
  ulong uVar93;
  char cVar94;
  uint uVar95;
  uint uVar96;
  long lVar97;
  ulong uVar98;
  undefined1 *puVar99;
  ulong uVar100;
  ulong *puVar101;
  uint *puVar102;
  uint *puVar103;
  undefined8 *puVar104;
  int iVar105;
  ulong *puVar106;
  ulong uVar107;
  byte *pbVar108;
  bool bVar109;
  bool bVar110;
  yyjson_write_err dummy_err;
  char local_fc;
  byte *local_f8;
  uint local_e8;
  ulong local_e0;
  uint *local_d0;
  ulong *local_90;
  ulong local_78;
  yyjson_mut_val *local_68;
  yyjson_write_err local_60;
  ulong local_50;
  ulong *local_48;
  uint *local_40;
  long local_38;
  
  ppuVar91 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar91 = &alc_ptr->malloc;
  }
  pyVar67 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar67 = &local_60;
  }
  if (val == (yyjson_mut_val *)0x0) {
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar66 = &local_60;
    if (err != (yyjson_write_err *)0x0) {
      pyVar66 = err;
    }
    pyVar66->msg = "input JSON is NULL";
    pyVar67->code = 1;
    return (char *)0x0;
  }
  p_Var4 = ((yyjson_alc *)ppuVar91)->malloc;
  p_Var5 = ((yyjson_alc *)ppuVar91)->free;
  pvVar6 = ((yyjson_alc *)ppuVar91)->ctx;
  uVar83 = val->tag;
  bVar77 = (byte)uVar83;
  local_fc = (char)flg;
  if (0xff < uVar83 && (~bVar77 & 6) == 0) {
    p_Var7 = ((yyjson_alc *)ppuVar91)->realloc;
    if ((flg & 0x41) == 0) {
      if ((flg & 2) == 0) {
        puVar64 = enc_table_cpy;
        puVar99 = enc_table_cpy_slash;
      }
      else {
        puVar64 = enc_table_esc;
        puVar99 = enc_table_esc_slash;
      }
      if ((flg & 4) == 0) {
        puVar99 = puVar64;
      }
      lVar97 = estimated_val_num * 9;
      local_e0 = estimated_val_num * 0x12 + 0x4f & 0xfffffffffffffff0;
      local_f8 = (byte *)(*p_Var4)(pvVar6,local_e0);
      if (local_f8 == (byte *)0x0) {
        local_f8 = (byte *)0x0;
LAB_0124020c:
        if (dat_len != (usize *)0x0) {
          *dat_len = 0;
        }
        pyVar66 = &local_60;
        if (err != (yyjson_write_err *)0x0) {
          pyVar66 = err;
        }
        pyVar67->code = 2;
        pyVar66->msg = "memory allocation failed";
        if (local_f8 == (byte *)0x0) {
          return (char *)0x0;
        }
        (*p_Var5)(pvVar6,local_f8);
        return (char *)0x0;
      }
      uVar83 = val->tag;
      uVar69 = (uint)uVar83 & 7;
      bVar110 = uVar69 == 7;
      local_50 = CONCAT71((int7)((ulong)lVar97 >> 8),bVar110);
      *local_f8 = bVar110 << 5 | 0x5b;
      pyVar65 = (yyjson_mut_val *)(val->uni).u64;
      if (uVar69 == 7) {
        pyVar65 = pyVar65->next;
      }
      puVar102 = (uint *)(local_f8 + local_e0);
      puVar74 = (uint *)(local_f8 + 1);
      lVar97 = (uVar83 >> 8) << bVar110;
      local_d0 = puVar102;
      local_68 = val;
LAB_0123d5cc:
      do {
        uVar83 = local_50 & 0xff;
        pyVar75 = pyVar65;
        puVar61 = puVar102;
        puVar79 = puVar74;
        do {
          pyVar75 = pyVar75->next;
          uVar63 = pyVar75->tag;
          bVar77 = (byte)uVar63 & 7;
          if (bVar77 == 4) {
            if (puVar61 <= puVar79 + 8) {
              uVar63 = local_e0 >> 1;
              if (uVar63 < 0x21) {
                uVar63 = 0x20;
              }
              sVar76 = (uVar63 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar76);
              if (pbVar80 == (byte *)0x0) goto LAB_0124020c;
              sVar73 = (long)local_d0 - (long)puVar61;
              memmove(pbVar80 + (sVar76 - sVar73),pbVar80 + ((long)puVar61 - (long)local_f8),sVar73)
              ;
              puVar79 = (uint *)(pbVar80 + ((long)puVar79 - (long)local_f8));
              local_d0 = (uint *)(pbVar80 + sVar76);
              uVar63 = pyVar75->tag;
              puVar61 = (uint *)(pbVar80 + (sVar76 - sVar73));
              local_f8 = pbVar80;
              local_e0 = sVar76;
            }
            uVar107 = (pyVar75->uni).u64;
            uVar69 = (uint)(uVar107 >> 0x20);
            if ((uVar63 & 0x10) == 0) {
              uVar69 = uVar69 >> 0x1f & (uint)(uVar63 >> 3);
              *(byte *)puVar79 = 0x2d;
              uVar63 = -uVar107;
              if (uVar69 == 0) {
                uVar63 = uVar107;
              }
              pbVar80 = (byte *)((ulong)uVar69 + (long)puVar79);
              if (uVar63 < 100000000) {
                if (uVar63 < 100) {
                  *(undefined2 *)pbVar80 =
                       *(undefined2 *)(digit_table + (ulong)(uVar63 < 10) + uVar63 * 2);
                  puVar79 = (uint *)(pbVar80 + (2 - (ulong)(uVar63 < 10)));
                }
                else {
                  iVar70 = (int)uVar63;
                  if (uVar63 < 10000) {
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(uVar63 < 1000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar63 + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    puVar79 = (uint *)(pbVar80 + (4 - uVar63));
                  }
                  else if (uVar63 < 1000000) {
                    iVar70 = (int)(uVar63 * 0x68db9 >> 0x20) * -10000 + iVar70;
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar107 = (ulong)(uVar63 < 100000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar107 + (uVar63 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar107)) =
                         *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar107)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    puVar79 = (uint *)(pbVar80 + (6 - uVar107));
                  }
                  else {
                    uVar69 = (uint)(uVar63 * 0x68db8bb >> 0x20);
                    uVar82 = uVar69 >> 8;
                    iVar70 = uVar82 * -10000 + iVar70;
                    uVar82 = uVar82 * 0x147b >> 0x13;
                    uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(uVar63 < 10000000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar63 + (ulong)uVar82 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                    *(undefined2 *)(pbVar80 + (6 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
                    puVar79 = (uint *)(pbVar80 + (8 - uVar63));
                  }
                }
              }
              else {
                uVar107 = uVar63 / 100000000;
                uVar100 = uVar107 * 0xfa0a1f00 + uVar63;
                iVar70 = (int)uVar107;
                if (uVar63 < 10000000000000000) {
                  if (uVar63 < 10000000000) {
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + (ulong)(uVar63 < 1000000000) + uVar107 * 2);
                    pbVar80 = pbVar80 + (2 - (ulong)(uVar63 < 1000000000));
                  }
                  else if (uVar63 < 1000000000000) {
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(uVar63 < 100000000000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar63 + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    pbVar80 = pbVar80 + (4 - uVar63);
                  }
                  else if (uVar63 < 100000000000000) {
                    iVar70 = (int)(uVar107 * 0x68db9 >> 0x20) * -10000 + iVar70;
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(uVar63 >> 0xd < 0x48c27395);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar63 + (uVar107 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    pbVar80 = pbVar80 + (6 - uVar63);
                  }
                  else {
                    uVar69 = (uint)(uVar107 * 0x68db8bb >> 0x20);
                    uVar82 = uVar69 >> 8;
                    iVar70 = uVar82 * -10000 + iVar70;
                    uVar82 = uVar82 * 0x147b >> 0x13;
                    uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(uVar63 < 1000000000000000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar63 + (ulong)uVar82 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                    *(undefined2 *)(pbVar80 + (6 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
                    pbVar80 = pbVar80 + (8 - uVar63);
                  }
                  uVar69 = (uint)((uVar100 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar82 = uVar69 >> 8;
                  iVar70 = uVar82 * -10000 + (int)uVar100;
                  uVar82 = uVar82 * 0x147b >> 0x13;
                  uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                  *(undefined2 *)(pbVar80 + 2) =
                       *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                  *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                  *(undefined2 *)(pbVar80 + 6) =
                       *(undefined2 *)(digit_table + (uVar87 * 0x7fffff9c + iVar70) * 2);
                  puVar79 = (uint *)(pbVar80 + 8);
                }
                else {
                  uVar107 = uVar63 / 1000000000000;
                  iVar60 = (int)uVar107;
                  if (uVar63 < 1000000000000000000) {
                    iVar90 = (int)(uVar107 * 0x68db9 >> 0x20) * -10000 + iVar60;
                    uVar69 = (uint)(iVar90 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(uVar63 < 100000000000000000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar63 + (uVar107 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar90) * 2);
                    lVar81 = 6 - uVar63;
                  }
                  else {
                    uVar69 = (uint)(uVar107 / 10000);
                    iVar90 = uVar69 * -10000 + iVar60;
                    uVar69 = uVar69 / 100;
                    uVar82 = (uint)(iVar90 * 0x147b) >> 0x13;
                    uVar63 = (ulong)(uVar63 < 10000000000000000000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar63 + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + (int)(uVar107 / 10000)) * 2)
                    ;
                    *(undefined2 *)(pbVar80 + (4 - uVar63)) =
                         *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                    *(undefined2 *)(pbVar80 + (6 - uVar63)) =
                         *(undefined2 *)(digit_table + (uVar82 * -100 + iVar90) * 2);
                    lVar81 = 8 - uVar63;
                  }
                  pbVar80 = pbVar80 + lVar81;
                  iVar70 = iVar70 + iVar60 * -10000;
                  uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                  *(undefined2 *)(pbVar80 + 2) =
                       *(undefined2 *)(digit_table + (uVar69 * 0x7fffff9c + iVar70) * 2);
                  uVar69 = (uint)((uVar100 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar82 = uVar69 >> 8;
                  iVar70 = uVar82 * -10000 + (int)uVar100;
                  uVar82 = uVar82 * 0x147b >> 0x13;
                  uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                  *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                  *(undefined2 *)(pbVar80 + 6) =
                       *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                  *(undefined2 *)(pbVar80 + 8) = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                  *(undefined2 *)(pbVar80 + 10) =
                       *(undefined2 *)(digit_table + (uVar87 * 0x7fffff9c + iVar70) * 2);
                  puVar79 = (uint *)(pbVar80 + 0xc);
                }
              }
            }
            else {
              uVar63 = uVar107 & 0xfffffffffffff;
              uVar69 = uVar69 >> 0x14 & 0x7ff;
              if (uVar69 == 0x7ff) {
                if ((flg & 0x10) == 0) {
                  if ((flg & 8) == 0) goto LAB_01240288;
                  if (uVar63 == 0) {
                    *(byte *)puVar79 = 0x2d;
                    puVar104 = (undefined8 *)((long)puVar79 - ((long)uVar107 >> 0x3f));
                    *puVar104 = 0x7974696e69666e49;
                    puVar79 = (uint *)(puVar104 + 1);
                  }
                  else {
                    *puVar79 = 0x4e614e;
                    puVar79 = (uint *)((long)puVar79 + 3);
                  }
                }
                else {
                  *puVar79 = 0x6c6c756e;
                  puVar79 = puVar79 + 1;
                }
              }
              else {
                *(byte *)puVar79 = 0x2d;
                lVar81 = -((long)uVar107 >> 0x3f);
                puVar104 = (undefined8 *)((long)puVar79 + lVar81);
                if ((uVar107 & 0x7fffffffffffffff) == 0) {
                  *(undefined4 *)puVar104 = 0x302e30;
                  puVar79 = (uint *)((long)puVar104 + 3);
                }
                else if (uVar69 == 0) {
                  yyjson_mut_write_opts_impl();
                  puVar79 = local_40;
                }
                else {
                  uVar100 = uVar63 + 0x10000000000000;
                  if (uVar69 - 0x3ff < 0x35) {
                    lVar84 = 0;
                    if (uVar100 != 0) {
                      for (; (uVar100 >> lVar84 & 1) == 0; lVar84 = lVar84 + 1) {
                      }
                    }
                    if ((uint)lVar84 < 0x433 - uVar69) goto LAB_0123d875;
                    uVar100 = uVar100 >> ((byte)(0x433 - uVar69) & 0x3f);
                    if (uVar100 < 100000000) {
                      if (uVar100 < 100) {
                        *(undefined2 *)puVar104 =
                             *(undefined2 *)(digit_table + (ulong)(uVar100 < 10) + uVar100 * 2);
                        pcVar59 = (char *)((long)puVar104 + (2 - (ulong)(uVar100 < 10)));
                      }
                      else {
                        iVar70 = (int)uVar100;
                        if (uVar100 < 10000) {
                          uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                          uVar63 = (ulong)(uVar100 < 1000);
                          *(undefined2 *)puVar104 =
                               *(undefined2 *)(digit_table + uVar63 + (ulong)uVar69 * 2);
                          *(undefined2 *)((long)puVar104 + (2 - uVar63)) =
                               *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                          pcVar59 = (char *)((long)puVar104 + (4 - uVar63));
                        }
                        else if (uVar100 < 1000000) {
                          iVar70 = (int)(uVar100 * 0x68db9 >> 0x20) * -10000 + iVar70;
                          uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                          uVar63 = (ulong)(uVar100 < 100000);
                          *(undefined2 *)puVar104 =
                               *(undefined2 *)
                                (digit_table + uVar63 + (uVar100 * 0x68db9 >> 0x20) * 2);
                          *(undefined2 *)((long)puVar104 + (2 - uVar63)) =
                               *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                          *(undefined2 *)((long)puVar104 + (4 - uVar63)) =
                               *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                          pcVar59 = (char *)((long)puVar104 + (6 - uVar63));
                        }
                        else {
                          uVar69 = (uint)(uVar100 * 0x68db8bb >> 0x20);
                          uVar82 = uVar69 >> 8;
                          iVar70 = uVar82 * -10000 + iVar70;
                          uVar82 = uVar82 * 0x147b >> 0x13;
                          uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                          uVar63 = (ulong)(uVar100 < 10000000);
                          *(undefined2 *)puVar104 =
                               *(undefined2 *)(digit_table + uVar63 + (ulong)uVar82 * 2);
                          *(undefined2 *)((long)puVar104 + (2 - uVar63)) =
                               *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                          *(undefined2 *)((long)puVar104 + (4 - uVar63)) =
                               *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                          *(undefined2 *)((long)puVar104 + (6 - uVar63)) =
                               *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
                          pcVar59 = (char *)((long)puVar104 + (8 - uVar63));
                        }
                      }
                    }
                    else {
                      auVar22._8_8_ = 0;
                      auVar22._0_8_ = uVar100;
                      uVar63 = SUB168(auVar22 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                      if (uVar100 < 10000000000) {
                        *(undefined2 *)puVar104 =
                             *(undefined2 *)
                              (digit_table + (ulong)(uVar100 < 1000000000) + uVar63 * 2);
                        puVar89 = (undefined2 *)
                                  ((long)puVar104 + (2 - (ulong)(uVar100 < 1000000000)));
                      }
                      else {
                        iVar70 = (int)uVar63;
                        if (uVar100 < 1000000000000) {
                          uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                          uVar107 = (ulong)(uVar100 < 100000000000);
                          *(undefined2 *)puVar104 =
                               *(undefined2 *)(digit_table + uVar107 + (ulong)uVar69 * 2);
                          *(undefined2 *)((long)puVar104 + (2 - uVar107)) =
                               *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                          puVar89 = (undefined2 *)((long)puVar104 + (4 - uVar107));
                        }
                        else if (uVar100 < 100000000000000) {
                          iVar70 = (int)(uVar63 * 0x68db9 >> 0x20) * -10000 + iVar70;
                          uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                          uVar107 = (ulong)(uVar100 >> 0xd < 0x48c27395);
                          *(undefined2 *)puVar104 =
                               *(undefined2 *)
                                (digit_table + uVar107 + (uVar63 * 0x68db9 >> 0x20) * 2);
                          *(undefined2 *)((long)puVar104 + (2 - uVar107)) =
                               *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                          *(undefined2 *)((long)puVar104 + (4 - uVar107)) =
                               *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                          puVar89 = (undefined2 *)((long)puVar104 + (6 - uVar107));
                        }
                        else {
                          uVar69 = (uint)(uVar63 * 0x68db8bb >> 0x20);
                          uVar82 = uVar69 >> 8;
                          iVar70 = uVar82 * -10000 + iVar70;
                          uVar82 = uVar82 * 0x147b >> 0x13;
                          uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                          uVar107 = (ulong)(uVar100 < 1000000000000000);
                          *(undefined2 *)puVar104 =
                               *(undefined2 *)(digit_table + uVar107 + (ulong)uVar82 * 2);
                          *(undefined2 *)((long)puVar104 + (2 - uVar107)) =
                               *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                          *(undefined2 *)((long)puVar104 + (4 - uVar107)) =
                               *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                          *(undefined2 *)((long)puVar104 + (6 - uVar107)) =
                               *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
                          puVar89 = (undefined2 *)((long)puVar104 + (8 - uVar107));
                        }
                      }
                      uVar100 = uVar63 * 0xfa0a1f00 + uVar100;
                      uVar69 = (uint)((uVar100 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar82 = uVar69 >> 8;
                      iVar70 = uVar82 * -10000 + (int)uVar100;
                      uVar82 = uVar82 * 0x147b >> 0x13;
                      uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                      *puVar89 = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                      puVar89[1] = *(undefined2 *)
                                    (digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                      puVar89[2] = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                      puVar89[3] = *(undefined2 *)(digit_table + (uVar87 * 0x7fffff9c + iVar70) * 2)
                      ;
                      pcVar59 = (char *)(puVar89 + 4);
                    }
                    pcVar59[0] = '.';
                    pcVar59[1] = '0';
LAB_0123f382:
                    puVar79 = (uint *)(pcVar59 + 2);
                  }
                  else {
LAB_0123d875:
                    uVar107 = (ulong)((uint)uVar107 & 1);
                    iVar70 = uVar69 * 0x4d105 + -0x200a5;
                    if (uVar69 == 1 || uVar63 != 0) {
                      iVar70 = uVar69 * 0x4d105;
                    }
                    iVar70 = iVar70 + -0x1439b7ff >> 0x14;
                    uVar78 = *(ulong *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2ae) * 8);
                    uVar93 = *(long *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2af) * 8) +
                             (ulong)(iVar70 - 1U < 0xffffffc8);
                    bVar77 = ((char)((uint)(iVar70 * -0x3526b) >> 0x10) + (char)uVar69) - 0x32;
                    uVar63 = (ulong)(uVar69 != 1 && uVar63 == 0) + uVar100 * 4 + -2 <<
                             (bVar77 & 0x3f);
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = uVar93;
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = uVar63;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = SUB168(auVar16 * auVar36,8);
                    auVar17._8_8_ = 0;
                    auVar17._0_8_ = uVar78;
                    auVar37._8_8_ = 0;
                    auVar37._0_8_ = uVar63;
                    auVar51 = auVar17 * auVar37 + auVar51;
                    uVar63 = uVar100 * 4 << (bVar77 & 0x3f);
                    auVar18._8_8_ = 0;
                    auVar18._0_8_ = uVar93;
                    auVar38._8_8_ = 0;
                    auVar38._0_8_ = uVar63;
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = SUB168(auVar18 * auVar38,8);
                    auVar19._8_8_ = 0;
                    auVar19._0_8_ = uVar78;
                    auVar39._8_8_ = 0;
                    auVar39._0_8_ = uVar63;
                    auVar52 = auVar19 * auVar39 + auVar52;
                    uVar85 = auVar52._8_8_;
                    uVar63 = uVar100 * 4 + 2 << (bVar77 & 0x3f);
                    auVar20._8_8_ = 0;
                    auVar20._0_8_ = uVar93;
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = uVar63;
                    auVar53._8_8_ = 0;
                    auVar53._0_8_ = SUB168(auVar20 * auVar40,8);
                    auVar21._8_8_ = 0;
                    auVar21._0_8_ = uVar78;
                    auVar41._8_8_ = 0;
                    auVar41._0_8_ = uVar63;
                    auVar53 = auVar21 * auVar41 + auVar53;
                    uVar63 = ((ulong)((auVar51 & (undefined1  [16])0xfffffffffffffffe) !=
                                     (undefined1  [16])0x0) | auVar51._8_8_) + uVar107;
                    uVar107 = ((ulong)((auVar53 & (undefined1  [16])0xfffffffffffffffe) !=
                                      (undefined1  [16])0x0) | auVar53._8_8_) - uVar107;
                    if (uVar85 < 0x28) {
LAB_0123d9d3:
                      uVar78 = (auVar52 & (undefined1  [16])0xfffffffffffffffe) !=
                               (undefined1  [16])0x0 | uVar85;
                      uVar100 = uVar85 & 0xfffffffffffffffc;
                      bVar110 = true;
                      if (uVar78 <= uVar100 + 2) {
                        bVar110 = (bool)((byte)((uVar85 & 0xffffffff) >> 2) & 0x3f &
                                        uVar78 == uVar100 + 2);
                      }
                      bVar109 = uVar100 + 4 <= uVar107;
                      if (uVar100 < uVar63 == bVar109) {
                        bVar110 = bVar109;
                      }
                      uVar63 = (ulong)bVar110 + (uVar85 >> 2);
                    }
                    else {
                      uVar78 = uVar85 / 0x28;
                      uVar100 = uVar78 * 0x28 + 0x28;
                      if (uVar78 * 0x28 < uVar63 != uVar100 <= uVar107) goto LAB_0123d9d3;
                      uVar63 = (uVar78 + 1) - (ulong)(uVar107 < uVar100);
                      iVar70 = iVar70 + 1;
                    }
                    iVar60 = (0x11 - (uint)(uVar63 < 10000000000000000)) -
                             (uint)(uVar63 < 1000000000000000);
                    uVar69 = iVar60 + iVar70;
                    if (iVar60 + iVar70 + 5U < 0x1b) {
                      if ((int)uVar69 < 1) {
                        uVar107 = uVar63 / 100000000;
                        uVar82 = (uint)uVar107;
                        puVar89 = (undefined2 *)
                                  ((long)puVar104 +
                                  (((ulong)(2 - uVar69) + 1) - (ulong)(uVar82 < 100000000)));
                        iVar90 = (int)((uVar107 & 0xffffffff) / 10000);
                        iVar60 = iVar90 * -10000 + uVar82;
                        uVar63 = uVar107 * 0xfa0a1f00 + uVar63;
                        iVar70 = (int)(((uVar107 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar95 = (uint)(iVar70 * 0x29) >> 0xc;
                        uVar92 = uVar95 * -100 + iVar70;
                        uVar87 = iVar70 * -100 + iVar90;
                        *(char *)((long)puVar104 + (ulong)(2 - uVar69)) = (char)uVar95 + '0';
                        uVar107 = (ulong)(uVar92 < 10 && uVar82 < 100000000);
                        *puVar89 = *(undefined2 *)(digit_table + uVar107 + uVar92 * 2);
                        *(undefined2 *)((long)puVar89 + (2 - uVar107)) =
                             *(undefined2 *)(digit_table + uVar87 * 2);
                        iVar70 = (int)uVar63;
                        if (iVar70 == 0) {
                          if (iVar60 == 0) {
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                            if (uVar87 != 0) {
                              uVar63 = 0;
                            }
                            uVar63 = uVar63 + (byte)dec_trailing_zero_table[uVar87];
                            lVar81 = 4;
                          }
                          else {
                            uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                            uVar87 = uVar82 * -100 + iVar60;
                            *(undefined2 *)((long)puVar89 + (4 - uVar107)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                            *(undefined2 *)((long)puVar89 + (6 - uVar107)) =
                                 *(undefined2 *)(digit_table + uVar87 * 2);
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar82] + 2;
                            if (uVar87 != 0) {
                              uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar87];
                            }
                            lVar81 = 8;
                          }
                          uVar63 = lVar81 - uVar63;
                        }
                        else {
                          uVar92 = (uint)(iVar60 * 0x147b) >> 0x13;
                          uVar82 = (uint)((uVar63 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar95 = uVar82 >> 8;
                          uVar87 = uVar95 * 0x147b >> 0x13;
                          uVar63 = (ulong)uVar87;
                          uVar82 = uVar87 * -100 + (uVar82 >> 8);
                          *(undefined2 *)((long)puVar89 + (4 - uVar107)) =
                               *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                          *(undefined2 *)((long)puVar89 + (6 - uVar107)) =
                               *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar60) * 2);
                          *(undefined2 *)((long)puVar89 + (8 - uVar107)) =
                               *(undefined2 *)(digit_table + uVar63 * 2);
                          *(undefined2 *)((long)puVar89 + (10 - uVar107)) =
                               *(undefined2 *)(digit_table + uVar82 * 2);
                          iVar70 = uVar95 * -10000 + iVar70;
                          if (iVar70 == 0) {
                            lVar81 = 0xc;
                          }
                          else {
                            uVar82 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar63 = (ulong)uVar82;
                            uVar82 = uVar82 * -100 + iVar70;
                            *(undefined2 *)((long)puVar89 + (0xc - uVar107)) =
                                 *(undefined2 *)(digit_table + uVar63 * 2);
                            *(undefined2 *)((long)puVar89 + (0xe - uVar107)) =
                                 *(undefined2 *)(digit_table + uVar82 * 2);
                            lVar81 = 0x10;
                          }
                          uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar63] + 2;
                          if (uVar82 != 0) {
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar82];
                          }
                          uVar63 = lVar81 - uVar63;
                        }
                        puVar79 = (uint *)((long)puVar89 + ((uVar63 & 0xffffffff) - uVar107));
                        *(undefined2 *)puVar104 = 0x2e30;
                        if ((int)uVar69 < 0) {
                          switchD_00569a20::default
                                    ((undefined2 *)((long)puVar104 + 2),0x30,(ulong)-uVar69);
                        }
                      }
                      else {
                        uVar107 = uVar63 / 100000000;
                        uVar82 = (uint)uVar107;
                        puVar89 = (undefined2 *)((long)puVar104 + (2 - (ulong)(uVar82 < 100000000)))
                        ;
                        iVar90 = (int)((uVar107 & 0xffffffff) / 10000);
                        iVar60 = iVar90 * -10000 + uVar82;
                        uVar63 = uVar107 * 0xfa0a1f00 + uVar63;
                        iVar70 = (int)(((uVar107 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar95 = (uint)(iVar70 * 0x29) >> 0xc;
                        uVar92 = uVar95 * -100 + iVar70;
                        uVar87 = iVar70 * -100 + iVar90;
                        *puVar104 = 0x3030303030303030;
                        puVar104[1] = 0x3030303030303030;
                        puVar104[2] = 0x3030303030303030;
                        *(char *)((long)puVar104 + 1) = (char)uVar95 + '0';
                        uVar107 = (ulong)(uVar92 < 10 && uVar82 < 100000000);
                        *puVar89 = *(undefined2 *)(digit_table + uVar107 + uVar92 * 2);
                        *(undefined2 *)((long)puVar89 + (2 - uVar107)) =
                             *(undefined2 *)(digit_table + uVar87 * 2);
                        iVar70 = (int)uVar63;
                        if (iVar70 == 0) {
                          if (iVar60 == 0) {
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                            if (uVar87 != 0) {
                              uVar63 = 0;
                            }
                            uVar63 = uVar63 + (byte)dec_trailing_zero_table[uVar87];
                            lVar84 = 4;
                          }
                          else {
                            uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                            uVar87 = uVar82 * -100 + iVar60;
                            *(undefined2 *)((long)puVar89 + (4 - uVar107)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                            *(undefined2 *)((long)puVar89 + (6 - uVar107)) =
                                 *(undefined2 *)(digit_table + uVar87 * 2);
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar82] + 2;
                            if (uVar87 != 0) {
                              uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar87];
                            }
                            lVar84 = 8;
                          }
                          uVar63 = lVar84 - uVar63;
                        }
                        else {
                          uVar92 = (uint)(iVar60 * 0x147b) >> 0x13;
                          uVar82 = (uint)((uVar63 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar95 = uVar82 >> 8;
                          uVar87 = uVar95 * 0x147b >> 0x13;
                          uVar63 = (ulong)uVar87;
                          uVar82 = uVar87 * -100 + (uVar82 >> 8);
                          *(undefined2 *)((long)puVar89 + (4 - uVar107)) =
                               *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                          *(undefined2 *)((long)puVar89 + (6 - uVar107)) =
                               *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar60) * 2);
                          *(undefined2 *)((long)puVar89 + (8 - uVar107)) =
                               *(undefined2 *)(digit_table + uVar63 * 2);
                          *(undefined2 *)((long)puVar89 + (10 - uVar107)) =
                               *(undefined2 *)(digit_table + uVar82 * 2);
                          iVar70 = uVar95 * -10000 + iVar70;
                          if (iVar70 == 0) {
                            lVar84 = 0xc;
                          }
                          else {
                            uVar82 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar63 = (ulong)uVar82;
                            uVar82 = uVar82 * -100 + iVar70;
                            *(undefined2 *)((long)puVar89 + (0xc - uVar107)) =
                                 *(undefined2 *)(digit_table + uVar63 * 2);
                            *(undefined2 *)((long)puVar89 + (0xe - uVar107)) =
                                 *(undefined2 *)(digit_table + uVar82 * 2);
                            lVar84 = 0x10;
                          }
                          uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar63] + 2;
                          if (uVar82 != 0) {
                            uVar63 = (ulong)(byte)dec_trailing_zero_table[uVar82];
                          }
                          uVar63 = lVar84 - uVar63;
                        }
                        puVar102 = (uint *)((long)puVar89 + ((uVar63 & 0xffffffff) - uVar107));
                        uVar63 = 0;
                        do {
                          *(byte *)((long)puVar79 + uVar63 + lVar81) =
                               *(byte *)((long)puVar79 + uVar63 + lVar81 + 1);
                          uVar63 = uVar63 + 1;
                        } while (uVar69 != uVar63);
                        puVar64 = (undefined1 *)((ulong)uVar69 + (long)puVar104);
                        puVar79 = (uint *)(puVar64 + 2);
                        *puVar64 = 0x2e;
                        if (puVar79 < puVar102) {
                          puVar79 = puVar102;
                        }
                      }
                    }
                    else {
                      uVar107 = uVar63 / 100000000;
                      uVar82 = (uint)uVar107;
                      lVar81 = 2 - (ulong)(uVar82 < 100000000);
                      iVar90 = (int)((uVar107 & 0xffffffff) / 10000);
                      iVar60 = iVar90 * -10000 + uVar82;
                      uVar63 = uVar107 * 0xfa0a1f00 + uVar63;
                      iVar70 = (int)(((uVar107 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar95 = (uint)(iVar70 * 0x29) >> 0xc;
                      uVar92 = uVar95 * -100 + iVar70;
                      uVar87 = iVar70 * -100 + iVar90;
                      *(char *)((long)puVar104 + 1) = (char)uVar95 + '0';
                      uVar107 = (ulong)(uVar92 < 10 && uVar82 < 100000000);
                      *(undefined2 *)((long)puVar104 + lVar81) =
                           *(undefined2 *)(digit_table + uVar107 + uVar92 * 2);
                      lVar81 = lVar81 - uVar107;
                      *(undefined2 *)((long)puVar104 + lVar81 + 2) =
                           *(undefined2 *)(digit_table + uVar87 * 2);
                      iVar70 = (int)uVar63;
                      if (iVar70 == 0) {
                        if (iVar60 == 0) {
                          uVar82 = (uint)(byte)dec_trailing_zero_table[uVar92];
                          if (uVar87 != 0) {
                            uVar82 = 0;
                          }
                          uVar82 = uVar82 + (byte)dec_trailing_zero_table[uVar87];
                          iVar70 = 4;
                        }
                        else {
                          uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                          uVar87 = uVar82 * -100 + iVar60;
                          *(undefined2 *)((long)puVar104 + lVar81 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                          *(undefined2 *)((long)puVar104 + lVar81 + 6) =
                               *(undefined2 *)(digit_table + uVar87 * 2);
                          uVar82 = (byte)dec_trailing_zero_table[uVar82] + 2;
                          if (uVar87 != 0) {
                            uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
                          }
                          iVar70 = 8;
                        }
                        uVar82 = iVar70 - uVar82;
                      }
                      else {
                        uVar95 = (uint)(iVar60 * 0x147b) >> 0x13;
                        uVar82 = (uint)((uVar63 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar96 = uVar82 >> 8;
                        uVar92 = uVar96 * 0x147b >> 0x13;
                        uVar87 = uVar92 * -100 + (uVar82 >> 8);
                        *(undefined2 *)((long)puVar104 + lVar81 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar95 * 2);
                        *(undefined2 *)((long)puVar104 + lVar81 + 6) =
                             *(undefined2 *)(digit_table + (uVar95 * 0x7fffff9c + iVar60) * 2);
                        *(undefined2 *)((long)puVar104 + lVar81 + 8) =
                             *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                        *(undefined2 *)((long)puVar104 + lVar81 + 10) =
                             *(undefined2 *)(digit_table + uVar87 * 2);
                        iVar70 = uVar96 * -10000 + iVar70;
                        if (iVar70 == 0) {
                          uVar82 = (byte)dec_trailing_zero_table[uVar92] + 2;
                          if (uVar87 != 0) {
                            uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
                          }
                          iVar70 = 0xc;
                        }
                        else {
                          uVar82 = (uint)(iVar70 * 0x147b) >> 0x13;
                          uVar87 = uVar82 * -100 + iVar70;
                          *(undefined2 *)((long)puVar104 + lVar81 + 0xc) =
                               *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                          *(undefined2 *)((long)puVar104 + lVar81 + 0xe) =
                               *(undefined2 *)(digit_table + uVar87 * 2);
                          uVar82 = (byte)dec_trailing_zero_table[uVar82] + 2;
                          if (uVar87 != 0) {
                            uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
                          }
                          iVar70 = 0x10;
                        }
                        uVar82 = iVar70 - uVar82;
                      }
                      puVar89 = (undefined2 *)
                                ((long)puVar104 +
                                (((ulong)uVar82 + lVar81) - (ulong)((ulong)uVar82 + lVar81 == 2)));
                      uVar69 = uVar69 - 1;
                      *(undefined1 *)puVar104 = *(undefined1 *)((long)puVar104 + 1);
                      *(undefined1 *)((long)puVar104 + 1) = 0x2e;
                      *puVar89 = 0x2d65;
                      uVar87 = uVar69 >> 0x1f;
                      pcVar59 = (char *)((long)puVar89 + (ulong)uVar87 + 1);
                      uVar82 = -uVar69;
                      if (0 < (int)uVar69) {
                        uVar82 = uVar69;
                      }
                      if (uVar82 < 100) {
                        *(undefined2 *)pcVar59 =
                             *(undefined2 *)(digit_table + (ulong)(uVar82 < 10) + (ulong)uVar82 * 2)
                        ;
                        pcVar59 = pcVar59 + -(ulong)(uVar82 < 10);
                        goto LAB_0123f382;
                      }
                      *pcVar59 = (char)(uVar82 * 0x290 >> 0x10) + '0';
                      *(undefined2 *)((long)puVar89 + (ulong)uVar87 + 2) =
                           *(undefined2 *)
                            (digit_table + ((uVar82 * 0x290 >> 0x10) * 0x7fffff9c + uVar82) * 2);
                      puVar79 = (uint *)((long)puVar89 + (ulong)uVar87 + 4);
                    }
                  }
                }
              }
            }
            *(byte *)puVar79 = 0x2c;
            puVar79 = (uint *)((long)puVar79 + 1);
          }
          else if (((uint)uVar63 & 7) == 5) {
            uVar107 = uVar63 >> 8;
            puVar102 = (uint *)(pyVar75->uni).str;
            puVar74 = puVar61;
            if (puVar61 <= (uint *)((long)puVar79 + uVar107 * 6 + 0x10)) {
              uVar100 = uVar107 * 6 + 0x10;
              uVar78 = local_e0 >> 1;
              if (local_e0 >> 1 <= uVar100) {
                uVar78 = uVar100;
              }
              sVar76 = (uVar78 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar76);
              if (pbVar80 == (byte *)0x0) goto LAB_0124020c;
              puVar74 = (uint *)(pbVar80 + (sVar76 - ((long)local_d0 - (long)puVar61)));
              memmove(puVar74,pbVar80 + ((long)puVar61 - (long)local_f8),
                      (long)local_d0 - (long)puVar61);
              puVar79 = (uint *)(pbVar80 + ((long)puVar79 - (long)local_f8));
              local_d0 = (uint *)(pbVar80 + sVar76);
              local_f8 = pbVar80;
              local_e0 = sVar76;
            }
            if (puVar99 != enc_table_cpy) {
              puVar61 = (uint *)(uVar107 + (long)puVar102);
              *(byte *)puVar79 = 0x22;
LAB_0123f513:
              lVar81 = (long)puVar61 - (long)puVar102;
              if (0xf < lVar81) {
                lVar84 = 0;
                do {
                  puVar103 = (uint *)((long)puVar79 + lVar84 + 1);
                  puVar57 = (uint *)(lVar84 + (long)puVar102);
                  bVar77 = *(byte *)((long)puVar102 + lVar84);
                  if (puVar99[bVar77] != '\0') goto LAB_0123f74d;
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 1)] != '\0') {
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 1);
                    puVar57 = (uint *)((long)puVar102 + lVar84);
                    goto LAB_0123f6ef;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 2)] != '\0') {
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 1);
                    puVar57 = (uint *)((long)puVar102 + lVar84);
                    goto LAB_0123f704;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 3)] != '\0') {
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 1);
                    puVar57 = (uint *)((long)puVar102 + lVar84);
                    goto LAB_0123f71f;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 4)] != '\0') {
                    puVar57 = (uint *)((byte *)(lVar84 + (long)puVar102) + 4);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 5);
                    *(undefined4 *)((long)puVar79 + lVar84 + 1) =
                         *(undefined4 *)(lVar84 + (long)puVar102);
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 5)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 5);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 6);
                    *(byte *)((long)puVar103 + -1) = pbVar80[4];
                    *(undefined4 *)((long)puVar103 + -5) = *(undefined4 *)pbVar80;
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 6)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 6);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 7);
                    *(ushort *)((long)puVar103 + -2) = *(ushort *)(pbVar80 + 4);
                    *(undefined4 *)((long)puVar103 + -6) = *(undefined4 *)pbVar80;
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 7)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 7);
                    uVar3 = *(undefined4 *)pbVar80;
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 8);
                    *(undefined4 *)((long)puVar79 + lVar84 + 4) = *(undefined4 *)(pbVar80 + 3);
                    *(undefined4 *)((long)puVar79 + lVar84 + 1) = uVar3;
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 8)] != '\0') {
                    puVar57 = (uint *)((byte *)(lVar84 + (long)puVar102) + 8);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 9);
                    *(undefined8 *)((long)puVar79 + lVar84 + 1) =
                         *(undefined8 *)(lVar84 + (long)puVar102);
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 9)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 9);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 10);
                    *(byte *)((long)puVar103 + -1) = pbVar80[8];
                    *(undefined8 *)((long)puVar103 + -9) = *(undefined8 *)pbVar80;
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 10)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 10);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xb);
                    *(ushort *)((long)puVar103 + -2) = *(ushort *)(pbVar80 + 8);
                    *(undefined8 *)((long)puVar103 + -10) = *(undefined8 *)pbVar80;
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 0xb)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xb);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xc);
                    puVar103[-1] = *(uint *)(pbVar80 + 7);
                    *(undefined8 *)((long)puVar103 + -0xb) = *(undefined8 *)pbVar80;
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 0xc)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xc);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xd);
                    puVar103[-1] = *(uint *)(pbVar80 + 8);
                    *(undefined8 *)(puVar103 + -3) = *(undefined8 *)pbVar80;
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 0xd)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xd);
                    uVar72 = *(undefined8 *)pbVar80;
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xe);
                    *(undefined8 *)((long)puVar79 + lVar84 + 6) = *(undefined8 *)(pbVar80 + 5);
                    *(undefined8 *)((long)puVar79 + lVar84 + 1) = uVar72;
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 0xe)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xe);
                    uVar72 = *(undefined8 *)pbVar80;
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xf);
                    *(undefined8 *)((long)puVar79 + lVar84 + 7) = *(undefined8 *)(pbVar80 + 6);
                    *(undefined8 *)((long)puVar79 + lVar84 + 1) = uVar72;
                    goto LAB_0123f74d;
                  }
                  if (puVar99[*(byte *)((long)puVar102 + lVar84 + 0xf)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xf);
                    uVar72 = *(undefined8 *)pbVar80;
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0x10);
                    *(undefined8 *)((long)puVar79 + lVar84 + 8) = *(undefined8 *)(pbVar80 + 7);
                    *(undefined8 *)((long)puVar79 + lVar84 + 1) = uVar72;
                    goto LAB_0123f74d;
                  }
                  uVar72 = *(undefined8 *)(puVar57 + 2);
                  *(undefined8 *)puVar103 = *(undefined8 *)puVar57;
                  *(undefined8 *)((long)puVar79 + lVar84 + 9) = uVar72;
                  lVar84 = lVar84 + 0x10;
                  lVar81 = lVar81 + -0x10;
                } while (0xf < lVar81);
                puVar79 = (uint *)((long)puVar79 + lVar84);
                puVar102 = (uint *)((long)puVar102 + lVar84);
              }
              puVar103 = (uint *)((long)puVar79 + 1);
              puVar57 = puVar102;
              if (3 < lVar81) {
                lVar81 = (long)puVar61 - (long)puVar102;
                do {
                  bVar77 = (byte)*puVar57;
                  if (puVar99[bVar77] != '\0') goto LAB_0123f74d;
                  if (puVar99[*(byte *)((long)puVar57 + 1)] != '\0') goto LAB_0123f6ef;
                  if (puVar99[*(byte *)((long)puVar57 + 2)] != '\0') goto LAB_0123f704;
                  if (puVar99[*(byte *)((long)puVar57 + 3)] != '\0') goto LAB_0123f71f;
                  *puVar103 = *puVar57;
                  puVar103 = puVar103 + 1;
                  puVar57 = puVar57 + 1;
                  lVar81 = lVar81 + -4;
                } while (3 < lVar81);
              }
              if (puVar57 < puVar61) {
                while (uVar69 = *puVar57, puVar99[(byte)uVar69] == '\0') {
                  puVar57 = (uint *)((long)puVar57 + 1);
                  *(byte *)puVar103 = (byte)uVar69;
                  puVar103 = (uint *)((long)puVar103 + 1);
                  if (puVar61 <= puVar57) goto switchD_0123dc70_default;
                }
                goto LAB_0123f74d;
              }
              goto switchD_0123dc70_default;
            }
            uVar58 = pyVar75->tag;
            *(byte *)puVar79 = 0x22;
            if ((uVar58 & 0x18) == 0) {
              puVar61 = (uint *)(uVar107 + (long)puVar102);
LAB_0123da2d:
              lVar81 = (long)puVar61 - (long)puVar102;
              if (0xf < lVar81) {
                lVar84 = 0;
                do {
                  puVar103 = (uint *)((long)puVar79 + lVar84 + 1);
                  puVar57 = (uint *)(lVar84 + (long)puVar102);
                  bVar77 = *(byte *)((long)puVar102 + lVar84);
                  if (enc_table_cpy[bVar77] != '\0') goto LAB_0123dc45;
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 1)] != '\0') {
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 1);
                    puVar57 = (uint *)((long)puVar102 + lVar84);
                    goto LAB_0123dbfa;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 2)] != '\0') {
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 1);
                    puVar57 = (uint *)((long)puVar102 + lVar84);
                    goto LAB_0123dc0f;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 3)] != '\0') {
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 1);
                    puVar57 = (uint *)((long)puVar102 + lVar84);
                    goto LAB_0123dc2a;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 4)] != '\0') {
                    puVar57 = (uint *)((byte *)(lVar84 + (long)puVar102) + 4);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 5);
                    *(undefined4 *)((long)puVar79 + lVar84 + 1) =
                         *(undefined4 *)(lVar84 + (long)puVar102);
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 5)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 5);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 6);
                    *(byte *)((long)puVar103 + -1) = pbVar80[4];
                    *(undefined4 *)((long)puVar103 + -5) = *(undefined4 *)pbVar80;
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 6)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 6);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 7);
                    *(ushort *)((long)puVar103 + -2) = *(ushort *)(pbVar80 + 4);
                    *(undefined4 *)((long)puVar103 + -6) = *(undefined4 *)pbVar80;
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 7)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 7);
                    uVar3 = *(undefined4 *)pbVar80;
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 8);
                    *(undefined4 *)((long)puVar79 + lVar84 + 4) = *(undefined4 *)(pbVar80 + 3);
                    *(undefined4 *)((long)puVar79 + lVar84 + 1) = uVar3;
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 8)] != '\0') {
                    puVar57 = (uint *)((byte *)(lVar84 + (long)puVar102) + 8);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 9);
                    *(undefined8 *)((long)puVar79 + lVar84 + 1) =
                         *(undefined8 *)(lVar84 + (long)puVar102);
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 9)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 9);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 10);
                    *(byte *)((long)puVar103 + -1) = pbVar80[8];
                    *(undefined8 *)((long)puVar103 + -9) = *(undefined8 *)pbVar80;
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 10)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 10);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xb);
                    *(ushort *)((long)puVar103 + -2) = *(ushort *)(pbVar80 + 8);
                    *(undefined8 *)((long)puVar103 + -10) = *(undefined8 *)pbVar80;
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 0xb)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xb);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xc);
                    puVar103[-1] = *(uint *)(pbVar80 + 7);
                    *(undefined8 *)((long)puVar103 + -0xb) = *(undefined8 *)pbVar80;
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 0xc)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xc);
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xd);
                    puVar103[-1] = *(uint *)(pbVar80 + 8);
                    *(undefined8 *)(puVar103 + -3) = *(undefined8 *)pbVar80;
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 0xd)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xd);
                    uVar72 = *(undefined8 *)pbVar80;
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xe);
                    *(undefined8 *)((long)puVar79 + lVar84 + 6) = *(undefined8 *)(pbVar80 + 5);
                    *(undefined8 *)((long)puVar79 + lVar84 + 1) = uVar72;
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 0xe)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xe);
                    uVar72 = *(undefined8 *)pbVar80;
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0xf);
                    *(undefined8 *)((long)puVar79 + lVar84 + 7) = *(undefined8 *)(pbVar80 + 6);
                    *(undefined8 *)((long)puVar79 + lVar84 + 1) = uVar72;
                    goto LAB_0123dc45;
                  }
                  if (enc_table_cpy[*(byte *)((long)puVar102 + lVar84 + 0xf)] != '\0') {
                    pbVar80 = (byte *)(lVar84 + (long)puVar102);
                    puVar57 = (uint *)(pbVar80 + 0xf);
                    uVar72 = *(undefined8 *)pbVar80;
                    puVar103 = (uint *)((long)puVar79 + lVar84 + 0x10);
                    *(undefined8 *)((long)puVar79 + lVar84 + 8) = *(undefined8 *)(pbVar80 + 7);
                    *(undefined8 *)((long)puVar79 + lVar84 + 1) = uVar72;
                    goto LAB_0123dc45;
                  }
                  uVar72 = *(undefined8 *)(puVar57 + 2);
                  *(undefined8 *)puVar103 = *(undefined8 *)puVar57;
                  *(undefined8 *)((long)puVar79 + lVar84 + 9) = uVar72;
                  lVar84 = lVar84 + 0x10;
                  lVar81 = lVar81 + -0x10;
                } while (0xf < lVar81);
                puVar79 = (uint *)((long)puVar79 + lVar84);
                puVar102 = (uint *)((long)puVar102 + lVar84);
              }
              puVar103 = (uint *)((long)puVar79 + 1);
              puVar57 = puVar102;
              if (3 < lVar81) {
                lVar81 = (long)puVar61 - (long)puVar102;
                do {
                  bVar77 = (byte)*puVar57;
                  if (enc_table_cpy[bVar77] != '\0') goto LAB_0123dc45;
                  if (enc_table_cpy[*(byte *)((long)puVar57 + 1)] != '\0') goto LAB_0123dbfa;
                  if (enc_table_cpy[*(byte *)((long)puVar57 + 2)] != '\0') goto LAB_0123dc0f;
                  if (enc_table_cpy[*(byte *)((long)puVar57 + 3)] != '\0') goto LAB_0123dc2a;
                  *puVar103 = *puVar57;
                  puVar103 = puVar103 + 1;
                  puVar57 = puVar57 + 1;
                  lVar81 = lVar81 + -4;
                } while (3 < lVar81);
              }
              if (puVar57 < puVar61) {
                while (uVar69 = *puVar57, enc_table_cpy[(byte)uVar69] == '\0') {
                  puVar57 = (uint *)((long)puVar57 + 1);
                  *(byte *)puVar103 = (byte)uVar69;
                  puVar103 = (uint *)((long)puVar103 + 1);
                  if (puVar61 <= puVar57) goto switchD_0123dc70_default;
                }
                goto LAB_0123dc45;
              }
              goto switchD_0123dc70_default;
            }
            puVar103 = (uint *)((long)puVar79 + 1);
            if (0xfff < uVar63) {
              do {
                uVar72 = *(undefined8 *)(puVar102 + 2);
                *(undefined8 *)puVar103 = *(undefined8 *)puVar102;
                *(undefined8 *)(puVar103 + 2) = uVar72;
                puVar103 = puVar103 + 4;
                puVar102 = puVar102 + 4;
                uVar107 = uVar107 - 0x10;
              } while (0xf < uVar107);
            }
            for (; 3 < uVar107; uVar107 = uVar107 - 4) {
              *puVar103 = *puVar102;
              puVar103 = puVar103 + 1;
              puVar102 = puVar102 + 1;
            }
            if (uVar107 != 0) {
              uVar63 = 0;
              do {
                *(byte *)((long)puVar103 + uVar63) = *(byte *)((long)puVar102 + uVar63);
                uVar63 = uVar63 + 1;
              } while (uVar107 != uVar63);
              puVar103 = (uint *)((long)puVar103 + uVar63);
            }
switchD_0123dc70_default:
            local_e8 = (uint)uVar83;
            bVar77 = 0x3a;
            if ((~(uint)lVar97 & local_e8) == 0) {
              bVar77 = 0x2c;
            }
            *(byte *)puVar103 = 0x22;
            *(byte *)((long)puVar103 + 1) = bVar77;
            puVar79 = (uint *)((long)puVar103 + 2);
            puVar61 = puVar74;
          }
          else if ((~(byte)uVar63 & 6) == 0) {
            if (puVar61 <= puVar79 + 4) {
              uVar107 = local_e0 >> 1;
              if (uVar107 < 0x11) {
                uVar107 = 0x10;
              }
              sVar76 = (uVar107 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar76);
              if (pbVar80 == (byte *)0x0) goto LAB_0124020c;
              sVar73 = (long)local_d0 - (long)puVar61;
              memmove(pbVar80 + (sVar76 - sVar73),pbVar80 + ((long)puVar61 - (long)local_f8),sVar73)
              ;
              puVar79 = (uint *)(pbVar80 + ((long)puVar79 - (long)local_f8));
              local_d0 = (uint *)(pbVar80 + sVar76);
              local_e0 = sVar76;
              puVar61 = (uint *)(pbVar80 + (sVar76 - sVar73));
              local_f8 = pbVar80;
            }
            if (0xff < uVar63) {
              lVar81 = (uVar63 >> 8) << (bVar77 == 7);
              puVar102 = puVar61 + -4;
              puVar74 = (uint *)((long)puVar79 + 1);
              *(ulong *)(puVar61 + -4) = uVar83 + lVar97 * 2;
              *(yyjson_mut_val **)(puVar61 + -2) = local_68;
              *(byte *)puVar79 = (bVar77 == 7) << 5 | 0x5b;
              local_50 = 0;
              pyVar65 = (yyjson_mut_val *)(pyVar75->uni).u64;
              lVar97 = lVar81;
              local_68 = pyVar75;
              if (bVar77 == 7) {
                pyVar65 = pyVar65->next;
                local_50 = 1;
              }
              goto LAB_0123d5cc;
            }
            bVar77 = (bVar77 == 7) * ' ';
            *(byte *)puVar79 = bVar77 + 0x5b;
            *(byte *)((long)puVar79 + 1) = bVar77 | 0x5d;
            *(byte *)((long)puVar79 + 2) = 0x2c;
            puVar79 = (uint *)((long)puVar79 + 3);
          }
          else if (bVar77 == 1) {
            uVar63 = uVar63 >> 8;
            pvVar8 = (pyVar75->uni).ptr;
            if (puVar61 <= (uint *)((long)puVar79 + uVar63 + 2)) {
              uVar107 = local_e0 >> 1;
              if (local_e0 >> 1 <= uVar63 + 2) {
                uVar107 = uVar63 + 2;
              }
              sVar76 = (uVar107 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar76);
              if (pbVar80 == (byte *)0x0) goto LAB_0124020c;
              sVar73 = (long)local_d0 - (long)puVar61;
              memmove(pbVar80 + (sVar76 - sVar73),pbVar80 + ((long)puVar61 - (long)local_f8),sVar73)
              ;
              puVar79 = (uint *)(pbVar80 + ((long)puVar79 - (long)local_f8));
              local_d0 = (uint *)(pbVar80 + sVar76);
              puVar61 = (uint *)(pbVar80 + (sVar76 - sVar73));
              local_f8 = pbVar80;
              local_e0 = sVar76;
            }
            switchD_00b041bd::default(puVar79,pvVar8,uVar63);
            pbVar80 = (byte *)((long)puVar79 + uVar63);
            puVar79 = (uint *)(pbVar80 + 1);
            *pbVar80 = 0x2c;
          }
          else if (bVar77 == 2) {
            puVar102 = puVar61;
            if (puVar61 <= puVar79 + 4) {
              uVar63 = local_e0 >> 1;
              if (uVar63 < 0x11) {
                uVar63 = 0x10;
              }
              sVar76 = (uVar63 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar76);
              if (pbVar80 == (byte *)0x0) goto LAB_0124020c;
              puVar102 = (uint *)(pbVar80 + (sVar76 - ((long)local_d0 - (long)puVar61)));
              memmove(puVar102,pbVar80 + ((long)puVar61 - (long)local_f8),
                      (long)local_d0 - (long)puVar61);
              puVar79 = (uint *)(pbVar80 + ((long)puVar79 - (long)local_f8));
              local_d0 = (uint *)(pbVar80 + sVar76);
              local_f8 = pbVar80;
              local_e0 = sVar76;
            }
            puVar79[0] = 0x6c6c756e;
            puVar79[1] = 0xa2c;
            puVar79 = (uint *)((long)puVar79 + 5);
            puVar61 = puVar102;
          }
          else {
            if (bVar77 != 3) goto LAB_0124024c;
            puVar102 = puVar61;
            if (puVar61 <= puVar79 + 4) {
              uVar63 = local_e0 >> 1;
              if (uVar63 < 0x11) {
                uVar63 = 0x10;
              }
              sVar76 = (uVar63 + 0xf & 0xfffffffffffffff0) + local_e0;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,sVar76);
              if (pbVar80 == (byte *)0x0) goto LAB_0124020c;
              puVar102 = (uint *)(pbVar80 + (sVar76 - ((long)local_d0 - (long)puVar61)));
              memmove(puVar102,pbVar80 + ((long)puVar61 - (long)local_f8),
                      (long)local_d0 - (long)puVar61);
              puVar79 = (uint *)(pbVar80 + ((long)puVar79 - (long)local_f8));
              local_d0 = (uint *)(pbVar80 + sVar76);
              uVar63 = pyVar75->tag;
              local_f8 = pbVar80;
              local_e0 = sVar76;
            }
            bVar110 = (uVar63 & 0x18) != 0;
            uVar72 = 0xa2c65736c6166;
            if (bVar110) {
              uVar72 = 0xa2c65757274;
            }
            *(undefined8 *)puVar79 = uVar72;
            puVar79 = (uint *)((long)puVar79 + (6 - (ulong)bVar110));
            puVar61 = puVar102;
          }
          lVar97 = lVar97 + -1;
        } while (lVar97 != 0);
        pbVar80 = local_f8 + ~(ulong)puVar79;
        lVar81 = 0;
        pyVar75 = local_68;
        do {
          local_68 = pyVar75;
          *(byte *)((long)puVar79 + -1) = (char)local_50 * ' ' + 0x5d;
          puVar74 = (uint *)((long)puVar79 + 1);
          *(byte *)puVar79 = 0x2c;
          if (local_d0 <= (uint *)((long)puVar61 + lVar81)) {
            if (local_fc < '\0') {
              if ((uint *)((long)puVar61 + lVar81) <= (uint *)((long)puVar79 + 3)) {
                uVar83 = 2;
                if (2 < local_e0 >> 1) {
                  uVar83 = local_e0 >> 1;
                }
                uVar83 = uVar83 + 0xf & 0xfffffffffffffff0;
                pbVar108 = (byte *)(*p_Var7)(pvVar6,local_f8,local_e0,uVar83 + local_e0);
                if (pbVar108 == (byte *)0x0) goto LAB_0124020c;
                memmove(pbVar108 +
                        (long)((long)puVar61 + lVar81 + ((uVar83 + local_e0) - (long)local_d0)),
                        (byte *)((long)puVar61 + (lVar81 - (long)local_f8)) + (long)pbVar108,
                        (size_t)((long)local_d0 + (-lVar81 - (long)puVar61)));
                puVar74 = (uint *)(pbVar108 + -(long)pbVar80);
                local_f8 = pbVar108;
              }
              *(byte *)((long)puVar74 + -1) = 10;
              puVar79 = puVar74;
            }
            *(byte *)puVar79 = 0;
            if (dat_len != (usize *)0x0) {
              *dat_len = (long)puVar79 - (long)local_f8;
            }
            goto LAB_01242978;
          }
          puVar101 = (ulong *)((long)puVar61 + lVar81);
          pyVar75 = *(yyjson_mut_val **)((long)puVar61 + lVar81 + 8);
          local_50 = *puVar101 & 0xffffffffffffff01;
          lVar81 = lVar81 + 0x10;
          pbVar80 = pbVar80 + -1;
          lVar97 = (*puVar101 >> 1) - 1;
          puVar79 = puVar74;
        } while (lVar97 == 0);
        puVar102 = (uint *)((long)puVar61 + lVar81);
        pyVar65 = local_68;
        local_68 = pyVar75;
      } while( true );
    }
    if ((flg & 2) == 0) {
      local_d0 = (uint *)enc_table_cpy_slash;
      if ((flg & 4) == 0) {
        local_d0 = (uint *)enc_table_cpy;
      }
    }
    else {
      local_d0 = (uint *)enc_table_esc_slash;
      if ((flg & 4) == 0) {
        local_d0 = (uint *)enc_table_esc;
      }
    }
    uVar83 = estimated_val_num * 0x20 + 0x40;
    local_f8 = (byte *)(*p_Var4)(pvVar6,uVar83);
    if (local_f8 == (byte *)0x0) {
      local_f8 = (byte *)0x0;
LAB_012401b4:
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar66 = &local_60;
      if (err != (yyjson_write_err *)0x0) {
        pyVar66 = err;
      }
      pyVar67->code = 2;
      pyVar66->msg = "memory allocation failed";
      if (local_f8 == (byte *)0x0) {
        return (char *)0x0;
      }
      (*p_Var5)(pvVar6,local_f8);
      return (char *)0x0;
    }
    uVar69 = (uint)val->tag & 7;
    bVar110 = uVar69 == 7;
    local_78 = (ulong)bVar110;
    lVar97 = (val->tag >> 8) << bVar110;
    *local_f8 = bVar110 << 5 | 0x5b;
    local_f8[1] = 10;
    uVar58 = (val->uni).u64;
    if (uVar69 == 7) {
      uVar58 = *(uint64_t *)(uVar58 + 0x10);
    }
    lVar81 = (ulong)((flg & 0x40) == 0) * 2 + 2;
    puVar101 = (ulong *)(local_f8 + (estimated_val_num * 8 + 0x10) * 4);
    puVar102 = (uint *)(local_f8 + 2);
    pyVar65 = *(yyjson_mut_val **)(uVar58 + 0x10);
    lVar84 = 1;
    local_90 = puVar101;
    local_68 = val;
LAB_0123a34d:
    do {
      uVar107 = local_78 & 0xff;
      uVar63 = lVar84 * 4 + 0x20;
      local_50 = lVar84 * 4 + 0x10;
      puVar106 = puVar101;
      pyVar75 = pyVar65;
      sVar76 = uVar83;
LAB_0123a37f:
      uVar100 = pyVar75->tag;
      bVar77 = (byte)uVar100 & 7;
      uVar69 = (uint)uVar107;
      uVar82 = (uint)lVar97;
      puVar101 = puVar106;
      sVar62 = sVar76;
      if (bVar77 == 4) {
        uVar83 = uVar63;
        if ((uVar82 & uVar69) != 0) {
          uVar83 = 0x20;
        }
        if (puVar106 <= (ulong *)((long)puVar102 + uVar83)) {
          uVar100 = sVar76 >> 1;
          if (sVar76 >> 1 <= uVar83) {
            uVar100 = uVar83;
          }
          sVar62 = (uVar100 + 0xf & 0xfffffffffffffff0) + sVar76;
          pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar76,sVar62);
          if (pbVar80 == (byte *)0x0) goto LAB_012401b4;
          puVar101 = (ulong *)(pbVar80 + (sVar62 - ((long)local_90 - (long)puVar106)));
          memmove(puVar101,pbVar80 + ((long)puVar106 - (long)local_f8),
                  (long)local_90 - (long)puVar106);
          puVar102 = (uint *)(pbVar80 + ((long)puVar102 - (long)local_f8));
          local_90 = (ulong *)(pbVar80 + sVar62);
          local_f8 = pbVar80;
        }
        lVar86 = lVar84;
        puVar74 = puVar102;
        if (lVar84 != 0 && (uVar82 & uVar69) == 0) {
          do {
            puVar102 = (uint *)((long)puVar74 + lVar81);
            *puVar74 = 0x20202020;
            lVar86 = lVar86 + -1;
            puVar74 = puVar102;
          } while (lVar86 != 0);
        }
        uVar83 = (pyVar75->uni).u64;
        uVar69 = (uint)(uVar83 >> 0x20);
        if ((pyVar75->tag & 0x10) == 0) {
          uVar69 = uVar69 >> 0x1f & (uint)(pyVar75->tag >> 3);
          *(byte *)puVar102 = 0x2d;
          uVar100 = -uVar83;
          if (uVar69 == 0) {
            uVar100 = uVar83;
          }
          pbVar80 = (byte *)((ulong)uVar69 + (long)puVar102);
          if (uVar100 < 100000000) {
            if (uVar100 < 100) {
              *(undefined2 *)pbVar80 =
                   *(undefined2 *)(digit_table + (ulong)(uVar100 < 10) + uVar100 * 2);
              puVar102 = (uint *)(pbVar80 + (2 - (ulong)(uVar100 < 10)));
            }
            else {
              iVar70 = (int)uVar100;
              if (uVar100 < 10000) {
                uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                uVar83 = (ulong)(uVar100 < 1000);
                *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar83 + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar83)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                puVar102 = (uint *)(pbVar80 + (4 - uVar83));
              }
              else if (uVar100 < 1000000) {
                iVar70 = (int)(uVar100 * 0x68db9 >> 0x20) * -10000 + iVar70;
                uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                uVar83 = (ulong)(uVar100 < 100000);
                *(undefined2 *)pbVar80 =
                     *(undefined2 *)(digit_table + uVar83 + (uVar100 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar83)) =
                     *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar83)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                puVar102 = (uint *)(pbVar80 + (6 - uVar83));
              }
              else {
                uVar69 = (uint)(uVar100 * 0x68db8bb >> 0x20);
                uVar82 = uVar69 >> 8;
                iVar70 = uVar82 * -10000 + iVar70;
                uVar82 = uVar82 * 0x147b >> 0x13;
                uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                uVar83 = (ulong)(uVar100 < 10000000);
                *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar83 + (ulong)uVar82 * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar83)) =
                     *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar83)) =
                     *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                *(undefined2 *)(pbVar80 + (6 - uVar83)) =
                     *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
                puVar102 = (uint *)(pbVar80 + (8 - uVar83));
              }
            }
          }
          else {
            uVar83 = uVar100 / 100000000;
            uVar78 = uVar83 * 0xfa0a1f00 + uVar100;
            iVar70 = (int)uVar83;
            if (uVar100 < 10000000000000000) {
              if (uVar100 < 10000000000) {
                *(undefined2 *)pbVar80 =
                     *(undefined2 *)(digit_table + (ulong)(uVar100 < 1000000000) + uVar83 * 2);
                pbVar80 = pbVar80 + (2 - (ulong)(uVar100 < 1000000000));
              }
              else if (uVar100 < 1000000000000) {
                uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                uVar83 = (ulong)(uVar100 < 100000000000);
                *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar83 + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar83)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                pbVar80 = pbVar80 + (4 - uVar83);
              }
              else if (uVar100 < 100000000000000) {
                iVar70 = (int)(uVar83 * 0x68db9 >> 0x20) * -10000 + iVar70;
                uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                uVar100 = (ulong)(uVar100 >> 0xd < 0x48c27395);
                *(undefined2 *)pbVar80 =
                     *(undefined2 *)(digit_table + uVar100 + (uVar83 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar100)) =
                     *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar100)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                pbVar80 = pbVar80 + (6 - uVar100);
              }
              else {
                uVar69 = (uint)(uVar83 * 0x68db8bb >> 0x20);
                uVar82 = uVar69 >> 8;
                iVar70 = uVar82 * -10000 + iVar70;
                uVar82 = uVar82 * 0x147b >> 0x13;
                uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                uVar83 = (ulong)(uVar100 < 1000000000000000);
                *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar83 + (ulong)uVar82 * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar83)) =
                     *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar83)) =
                     *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                *(undefined2 *)(pbVar80 + (6 - uVar83)) =
                     *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
                pbVar80 = pbVar80 + (8 - uVar83);
              }
              uVar69 = (uint)((uVar78 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar82 = uVar69 >> 8;
              iVar70 = uVar82 * -10000 + (int)uVar78;
              uVar82 = uVar82 * 0x147b >> 0x13;
              uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
              *(undefined2 *)(pbVar80 + 2) =
                   *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
              *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
              *(undefined2 *)(pbVar80 + 6) =
                   *(undefined2 *)(digit_table + (uVar87 * 0x7fffff9c + iVar70) * 2);
              puVar102 = (uint *)(pbVar80 + 8);
            }
            else {
              uVar83 = uVar100 / 1000000000000;
              iVar60 = (int)uVar83;
              if (uVar100 < 1000000000000000000) {
                iVar90 = (int)(uVar83 * 0x68db9 >> 0x20) * -10000 + iVar60;
                uVar69 = (uint)(iVar90 * 0x147b) >> 0x13;
                uVar100 = (ulong)(uVar100 < 100000000000000000);
                *(undefined2 *)pbVar80 =
                     *(undefined2 *)(digit_table + uVar100 + (uVar83 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar100)) =
                     *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar100)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + iVar90) * 2);
                lVar86 = 6 - uVar100;
              }
              else {
                uVar69 = (uint)(uVar83 / 10000);
                iVar90 = uVar69 * -10000 + iVar60;
                uVar69 = uVar69 / 100;
                uVar82 = (uint)(iVar90 * 0x147b) >> 0x13;
                uVar100 = (ulong)(uVar100 < 10000000000000000000);
                *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar100 + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar100)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + (int)(uVar83 / 10000)) * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar100)) =
                     *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                *(undefined2 *)(pbVar80 + (6 - uVar100)) =
                     *(undefined2 *)(digit_table + (uVar82 * -100 + iVar90) * 2);
                lVar86 = 8 - uVar100;
              }
              pbVar80 = pbVar80 + lVar86;
              iVar70 = iVar70 + iVar60 * -10000;
              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + 2) =
                   *(undefined2 *)(digit_table + (uVar69 * 0x7fffff9c + iVar70) * 2);
              uVar69 = (uint)((uVar78 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar82 = uVar69 >> 8;
              iVar70 = uVar82 * -10000 + (int)uVar78;
              uVar82 = uVar82 * 0x147b >> 0x13;
              uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
              *(undefined2 *)(pbVar80 + 6) =
                   *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
              *(undefined2 *)(pbVar80 + 8) = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
              *(undefined2 *)(pbVar80 + 10) =
                   *(undefined2 *)(digit_table + (uVar87 * 0x7fffff9c + iVar70) * 2);
              puVar102 = (uint *)(pbVar80 + 0xc);
            }
          }
        }
        else {
          uVar100 = uVar83 & 0xfffffffffffff;
          uVar69 = uVar69 >> 0x14 & 0x7ff;
          if (uVar69 == 0x7ff) {
            if ((flg & 0x10) == 0) {
              if ((flg & 8) == 0) {
LAB_01240288:
                if (dat_len != (usize *)0x0) {
                  *dat_len = 0;
                }
                pyVar66 = &local_60;
                if (err != (yyjson_write_err *)0x0) {
                  pyVar66 = err;
                }
                pyVar67->code = 4;
                pyVar66->msg = "nan or inf number is not allowed";
                if (local_f8 == (byte *)0x0) {
                  return (char *)0x0;
                }
                (*p_Var5)(pvVar6,local_f8);
                return (char *)0x0;
              }
              if (uVar100 == 0) {
                *(byte *)puVar102 = 0x2d;
                puVar104 = (undefined8 *)((long)puVar102 - ((long)uVar83 >> 0x3f));
                *puVar104 = 0x7974696e69666e49;
                puVar102 = (uint *)(puVar104 + 1);
              }
              else {
                *puVar102 = 0x4e614e;
                puVar102 = (uint *)((long)puVar102 + 3);
              }
            }
            else {
              *puVar102 = 0x6c6c756e;
              puVar102 = puVar102 + 1;
            }
          }
          else {
            *(byte *)puVar102 = 0x2d;
            lVar86 = -((long)uVar83 >> 0x3f);
            puVar106 = (ulong *)((long)puVar102 + lVar86);
            if ((uVar83 & 0x7fffffffffffffff) == 0) {
              *(undefined4 *)puVar106 = 0x302e30;
              puVar102 = (uint *)((long)puVar106 + 3);
            }
            else if (uVar69 == 0) {
              yyjson_mut_write_opts_impl();
              puVar102 = local_40;
            }
            else {
              uVar78 = uVar100 + 0x10000000000000;
              if (uVar69 - 0x3ff < 0x35) {
                lVar71 = 0;
                if (uVar78 != 0) {
                  for (; (uVar78 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                  }
                }
                if (0x433 - uVar69 <= (uint)lVar71) {
                  uVar78 = uVar78 >> ((byte)(0x433 - uVar69) & 0x3f);
                  if (uVar78 < 100000000) {
                    if (uVar78 < 100) {
                      *(undefined2 *)puVar106 =
                           *(undefined2 *)(digit_table + (ulong)(uVar78 < 10) + uVar78 * 2);
                      pbVar80 = (byte *)((long)puVar106 + (2 - (ulong)(uVar78 < 10)));
                    }
                    else {
                      iVar70 = (int)uVar78;
                      if (uVar78 < 10000) {
                        uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                        uVar83 = (ulong)(uVar78 < 1000);
                        *(undefined2 *)puVar106 =
                             *(undefined2 *)(digit_table + uVar83 + (ulong)uVar69 * 2);
                        *(undefined2 *)((long)puVar106 + (2 - uVar83)) =
                             *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                        pbVar80 = (byte *)((long)puVar106 + (4 - uVar83));
                      }
                      else if (uVar78 < 1000000) {
                        iVar70 = (int)(uVar78 * 0x68db9 >> 0x20) * -10000 + iVar70;
                        uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                        uVar83 = (ulong)(uVar78 < 100000);
                        *(undefined2 *)puVar106 =
                             *(undefined2 *)(digit_table + uVar83 + (uVar78 * 0x68db9 >> 0x20) * 2);
                        *(undefined2 *)((long)puVar106 + (2 - uVar83)) =
                             *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                        *(undefined2 *)((long)puVar106 + (4 - uVar83)) =
                             *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                        pbVar80 = (byte *)((long)puVar106 + (6 - uVar83));
                      }
                      else {
                        uVar69 = (uint)(uVar78 * 0x68db8bb >> 0x20);
                        uVar82 = uVar69 >> 8;
                        iVar70 = uVar82 * -10000 + iVar70;
                        uVar82 = uVar82 * 0x147b >> 0x13;
                        uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                        uVar83 = (ulong)(uVar78 < 10000000);
                        *(undefined2 *)puVar106 =
                             *(undefined2 *)(digit_table + uVar83 + (ulong)uVar82 * 2);
                        *(undefined2 *)((long)puVar106 + (2 - uVar83)) =
                             *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                        *(undefined2 *)((long)puVar106 + (4 - uVar83)) =
                             *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                        *(undefined2 *)((long)puVar106 + (6 - uVar83)) =
                             *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
                        pbVar80 = (byte *)((long)puVar106 + (8 - uVar83));
                      }
                    }
                  }
                  else {
                    auVar15._8_8_ = 0;
                    auVar15._0_8_ = uVar78;
                    uVar83 = SUB168(auVar15 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                    if (uVar78 < 10000000000) {
                      *(undefined2 *)puVar106 =
                           *(undefined2 *)(digit_table + (ulong)(uVar78 < 1000000000) + uVar83 * 2);
                      pbVar80 = (byte *)((long)puVar106 + (2 - (ulong)(uVar78 < 1000000000)));
                    }
                    else {
                      iVar70 = (int)uVar83;
                      if (uVar78 < 1000000000000) {
                        uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                        uVar100 = (ulong)(uVar78 < 100000000000);
                        *(undefined2 *)puVar106 =
                             *(undefined2 *)(digit_table + uVar100 + (ulong)uVar69 * 2);
                        *(undefined2 *)((long)puVar106 + (2 - uVar100)) =
                             *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                        pbVar80 = (byte *)((long)puVar106 + (4 - uVar100));
                      }
                      else if (uVar78 < 100000000000000) {
                        iVar70 = (int)(uVar83 * 0x68db9 >> 0x20) * -10000 + iVar70;
                        uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                        uVar100 = (ulong)(uVar78 >> 0xd < 0x48c27395);
                        *(undefined2 *)puVar106 =
                             *(undefined2 *)(digit_table + uVar100 + (uVar83 * 0x68db9 >> 0x20) * 2)
                        ;
                        *(undefined2 *)((long)puVar106 + (2 - uVar100)) =
                             *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                        *(undefined2 *)((long)puVar106 + (4 - uVar100)) =
                             *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                        pbVar80 = (byte *)((long)puVar106 + (6 - uVar100));
                      }
                      else {
                        uVar69 = (uint)(uVar83 * 0x68db8bb >> 0x20);
                        uVar82 = uVar69 >> 8;
                        iVar70 = uVar82 * -10000 + iVar70;
                        uVar82 = uVar82 * 0x147b >> 0x13;
                        uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                        uVar100 = (ulong)(uVar78 < 1000000000000000);
                        *(undefined2 *)puVar106 =
                             *(undefined2 *)(digit_table + uVar100 + (ulong)uVar82 * 2);
                        *(undefined2 *)((long)puVar106 + (2 - uVar100)) =
                             *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                        *(undefined2 *)((long)puVar106 + (4 - uVar100)) =
                             *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                        *(undefined2 *)((long)puVar106 + (6 - uVar100)) =
                             *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
                        pbVar80 = (byte *)((long)puVar106 + (8 - uVar100));
                      }
                    }
                    uVar78 = uVar83 * 0xfa0a1f00 + uVar78;
                    uVar69 = (uint)((uVar78 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar82 = uVar69 >> 8;
                    iVar70 = uVar82 * -10000 + (int)uVar78;
                    uVar82 = uVar82 * 0x147b >> 0x13;
                    uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                    *(undefined2 *)(pbVar80 + 2) =
                         *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                    *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                    *(undefined2 *)(pbVar80 + 6) =
                         *(undefined2 *)(digit_table + (uVar87 * 0x7fffff9c + iVar70) * 2);
                    pbVar80 = pbVar80 + 8;
                  }
                  pbVar80[0] = 0x2e;
                  pbVar80[1] = 0x30;
                  puVar102 = (uint *)(pbVar80 + 2);
                  goto LAB_0123c3fb;
                }
              }
              uVar83 = (ulong)((uint)uVar83 & 1);
              iVar70 = uVar69 * 0x4d105 + -0x200a5;
              if (uVar69 == 1 || uVar100 != 0) {
                iVar70 = uVar69 * 0x4d105;
              }
              iVar70 = iVar70 + -0x1439b7ff >> 0x14;
              uVar85 = *(ulong *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2ae) * 8);
              uVar98 = *(long *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2af) * 8) +
                       (ulong)(iVar70 - 1U < 0xffffffc8);
              bVar77 = ((char)((uint)(iVar70 * -0x3526b) >> 0x10) + (char)uVar69) - 0x32;
              uVar100 = (ulong)(uVar69 != 1 && uVar100 == 0) + uVar78 * 4 + -2 << (bVar77 & 0x3f);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = uVar98;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar100;
              auVar48._8_8_ = 0;
              auVar48._0_8_ = SUB168(auVar9 * auVar30,8);
              auVar10._8_8_ = 0;
              auVar10._0_8_ = uVar85;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar100;
              auVar48 = auVar10 * auVar31 + auVar48;
              uVar100 = uVar78 * 4 << (bVar77 & 0x3f);
              auVar11._8_8_ = 0;
              auVar11._0_8_ = uVar98;
              auVar32._8_8_ = 0;
              auVar32._0_8_ = uVar100;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = SUB168(auVar11 * auVar32,8);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = uVar85;
              auVar33._8_8_ = 0;
              auVar33._0_8_ = uVar100;
              auVar49 = auVar12 * auVar33 + auVar49;
              uVar93 = auVar49._8_8_;
              uVar100 = uVar78 * 4 + 2 << (bVar77 & 0x3f);
              auVar13._8_8_ = 0;
              auVar13._0_8_ = uVar98;
              auVar34._8_8_ = 0;
              auVar34._0_8_ = uVar100;
              auVar50._8_8_ = 0;
              auVar50._0_8_ = SUB168(auVar13 * auVar34,8);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = uVar85;
              auVar35._8_8_ = 0;
              auVar35._0_8_ = uVar100;
              auVar50 = auVar14 * auVar35 + auVar50;
              uVar100 = ((ulong)((auVar48 & (undefined1  [16])0xfffffffffffffffe) !=
                                (undefined1  [16])0x0) | auVar48._8_8_) + uVar83;
              uVar83 = ((ulong)((auVar50 & (undefined1  [16])0xfffffffffffffffe) !=
                               (undefined1  [16])0x0) | auVar50._8_8_) - uVar83;
              if (uVar93 < 0x28) {
LAB_0123a830:
                uVar85 = (auVar49 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                         uVar93;
                uVar78 = uVar93 & 0xfffffffffffffffc;
                bVar110 = true;
                if (uVar85 <= uVar78 + 2) {
                  bVar110 = (bool)((byte)((uVar93 & 0xffffffff) >> 2) & 0x3f & uVar85 == uVar78 + 2)
                  ;
                }
                bVar109 = uVar78 + 4 <= uVar83;
                if (uVar78 < uVar100 == bVar109) {
                  bVar110 = bVar109;
                }
                uVar83 = (ulong)bVar110 + (uVar93 >> 2);
              }
              else {
                uVar85 = uVar93 / 0x28;
                uVar78 = uVar85 * 0x28 + 0x28;
                if (uVar85 * 0x28 < uVar100 != uVar78 <= uVar83) goto LAB_0123a830;
                uVar83 = (uVar85 + 1) - (ulong)(uVar83 < uVar78);
                iVar70 = iVar70 + 1;
              }
              iVar60 = (0x11 - (uint)(uVar83 < 10000000000000000)) -
                       (uint)(uVar83 < 1000000000000000);
              uVar69 = iVar60 + iVar70;
              local_48 = puVar106;
              local_38 = lVar86;
              if (iVar60 + iVar70 + 5U < 0x1b) {
                if ((int)uVar69 < 1) {
                  uVar100 = uVar83 / 100000000;
                  uVar82 = (uint)uVar100;
                  pbVar80 = (byte *)((long)puVar106 +
                                    (((ulong)(2 - uVar69) + 1) - (ulong)(uVar82 < 100000000)));
                  iVar90 = (int)((uVar100 & 0xffffffff) / 10000);
                  iVar60 = iVar90 * -10000 + uVar82;
                  uVar83 = uVar100 * 0xfa0a1f00 + uVar83;
                  iVar70 = (int)(((uVar100 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                  uVar95 = (uint)(iVar70 * 0x29) >> 0xc;
                  uVar92 = uVar95 * -100 + iVar70;
                  uVar87 = iVar70 * -100 + iVar90;
                  *(byte *)((long)puVar106 + (ulong)(2 - uVar69)) = (char)uVar95 + 0x30;
                  uVar100 = (ulong)(uVar92 < 10 && uVar82 < 100000000);
                  *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar100 + uVar92 * 2);
                  *(undefined2 *)(pbVar80 + (2 - uVar100)) =
                       *(undefined2 *)(digit_table + uVar87 * 2);
                  iVar70 = (int)uVar83;
                  if (iVar70 == 0) {
                    if (iVar60 == 0) {
                      uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                      if (uVar87 != 0) {
                        uVar83 = 0;
                      }
                      uVar83 = uVar83 + (byte)dec_trailing_zero_table[uVar87];
                      lVar86 = 4;
                    }
                    else {
                      uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                      uVar87 = uVar82 * -100 + iVar60;
                      *(undefined2 *)(pbVar80 + (4 - uVar100)) =
                           *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                      *(undefined2 *)(pbVar80 + (6 - uVar100)) =
                           *(undefined2 *)(digit_table + uVar87 * 2);
                      uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar82] + 2;
                      if (uVar87 != 0) {
                        uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar87];
                      }
                      lVar86 = 8;
                    }
                    uVar83 = lVar86 - uVar83;
                  }
                  else {
                    uVar92 = (uint)(iVar60 * 0x147b) >> 0x13;
                    uVar82 = (uint)((uVar83 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar95 = uVar82 >> 8;
                    uVar87 = uVar95 * 0x147b >> 0x13;
                    uVar83 = (ulong)uVar87;
                    uVar82 = uVar87 * -100 + (uVar82 >> 8);
                    *(undefined2 *)(pbVar80 + (4 - uVar100)) =
                         *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                    *(undefined2 *)(pbVar80 + (6 - uVar100)) =
                         *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar60) * 2);
                    *(undefined2 *)(pbVar80 + (8 - uVar100)) =
                         *(undefined2 *)(digit_table + uVar83 * 2);
                    *(undefined2 *)(pbVar80 + (10 - uVar100)) =
                         *(undefined2 *)(digit_table + uVar82 * 2);
                    iVar70 = uVar95 * -10000 + iVar70;
                    if (iVar70 == 0) {
                      lVar86 = 0xc;
                    }
                    else {
                      uVar82 = (uint)(iVar70 * 0x147b) >> 0x13;
                      uVar83 = (ulong)uVar82;
                      uVar82 = uVar82 * -100 + iVar70;
                      *(undefined2 *)(pbVar80 + (0xc - uVar100)) =
                           *(undefined2 *)(digit_table + uVar83 * 2);
                      *(undefined2 *)(pbVar80 + (0xe - uVar100)) =
                           *(undefined2 *)(digit_table + uVar82 * 2);
                      lVar86 = 0x10;
                    }
                    uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar83] + 2;
                    if (uVar82 != 0) {
                      uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar82];
                    }
                    uVar83 = lVar86 - uVar83;
                  }
                  *(undefined2 *)puVar106 = 0x2e30;
                  puVar102 = (uint *)(pbVar80 + ((uVar83 & 0xffffffff) - uVar100));
                  if ((int)uVar69 < 0) {
                    switchD_00569a20::default((byte *)((long)puVar106 + 2),0x30,(ulong)-uVar69);
                  }
                }
                else {
                  uVar100 = uVar83 / 100000000;
                  uVar82 = (uint)uVar100;
                  pbVar80 = (byte *)((long)puVar106 + (2 - (ulong)(uVar82 < 100000000)));
                  iVar90 = (int)((uVar100 & 0xffffffff) / 10000);
                  iVar60 = iVar90 * -10000 + uVar82;
                  uVar83 = uVar100 * 0xfa0a1f00 + uVar83;
                  iVar70 = (int)(((uVar100 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                  uVar95 = (uint)(iVar70 * 0x29) >> 0xc;
                  uVar92 = uVar95 * -100 + iVar70;
                  uVar87 = iVar70 * -100 + iVar90;
                  *puVar106 = 0x3030303030303030;
                  puVar106[1] = 0x3030303030303030;
                  puVar106[2] = 0x3030303030303030;
                  *(byte *)((long)puVar106 + 1) = (char)uVar95 + 0x30;
                  uVar100 = (ulong)(uVar92 < 10 && uVar82 < 100000000);
                  *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar100 + uVar92 * 2);
                  *(undefined2 *)(pbVar80 + (2 - uVar100)) =
                       *(undefined2 *)(digit_table + uVar87 * 2);
                  iVar70 = (int)uVar83;
                  if (iVar70 == 0) {
                    if (iVar60 == 0) {
                      uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                      if (uVar87 != 0) {
                        uVar83 = 0;
                      }
                      uVar83 = uVar83 + (byte)dec_trailing_zero_table[uVar87];
                      lVar71 = 4;
                    }
                    else {
                      uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                      uVar87 = uVar82 * -100 + iVar60;
                      *(undefined2 *)(pbVar80 + (4 - uVar100)) =
                           *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                      *(undefined2 *)(pbVar80 + (6 - uVar100)) =
                           *(undefined2 *)(digit_table + uVar87 * 2);
                      uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar82] + 2;
                      if (uVar87 != 0) {
                        uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar87];
                      }
                      lVar71 = 8;
                    }
                    uVar83 = lVar71 - uVar83;
                  }
                  else {
                    uVar92 = (uint)(iVar60 * 0x147b) >> 0x13;
                    uVar82 = (uint)((uVar83 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar95 = uVar82 >> 8;
                    uVar87 = uVar95 * 0x147b >> 0x13;
                    uVar83 = (ulong)uVar87;
                    uVar82 = uVar87 * -100 + (uVar82 >> 8);
                    *(undefined2 *)(pbVar80 + (4 - uVar100)) =
                         *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                    *(undefined2 *)(pbVar80 + (6 - uVar100)) =
                         *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar60) * 2);
                    *(undefined2 *)(pbVar80 + (8 - uVar100)) =
                         *(undefined2 *)(digit_table + uVar83 * 2);
                    *(undefined2 *)(pbVar80 + (10 - uVar100)) =
                         *(undefined2 *)(digit_table + uVar82 * 2);
                    iVar70 = uVar95 * -10000 + iVar70;
                    if (iVar70 == 0) {
                      lVar71 = 0xc;
                    }
                    else {
                      uVar82 = (uint)(iVar70 * 0x147b) >> 0x13;
                      uVar83 = (ulong)uVar82;
                      uVar82 = uVar82 * -100 + iVar70;
                      *(undefined2 *)(pbVar80 + (0xc - uVar100)) =
                           *(undefined2 *)(digit_table + uVar83 * 2);
                      *(undefined2 *)(pbVar80 + (0xe - uVar100)) =
                           *(undefined2 *)(digit_table + uVar82 * 2);
                      lVar71 = 0x10;
                    }
                    uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar83] + 2;
                    if (uVar82 != 0) {
                      uVar83 = (ulong)(byte)dec_trailing_zero_table[uVar82];
                    }
                    uVar83 = lVar71 - uVar83;
                  }
                  uVar78 = 0;
                  do {
                    *(byte *)((long)puVar102 + uVar78 + lVar86) =
                         *(byte *)((long)puVar102 + uVar78 + lVar86 + 1);
                    uVar78 = uVar78 + 1;
                  } while (uVar69 != uVar78);
                  pbVar108 = (byte *)((long)puVar106 + (ulong)uVar69);
                  puVar102 = (uint *)(pbVar108 + 2);
                  *pbVar108 = 0x2e;
                  if (puVar102 < pbVar80 + ((uVar83 & 0xffffffff) - uVar100)) {
                    puVar102 = (uint *)(pbVar80 + ((uVar83 & 0xffffffff) - uVar100));
                  }
                }
              }
              else {
                uVar100 = uVar83 / 100000000;
                uVar82 = (uint)uVar100;
                lVar86 = 2 - (ulong)(uVar82 < 100000000);
                iVar90 = (int)((uVar100 & 0xffffffff) / 10000);
                iVar60 = iVar90 * -10000 + uVar82;
                uVar83 = uVar100 * 0xfa0a1f00 + uVar83;
                iVar70 = (int)(((uVar100 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                uVar95 = (uint)(iVar70 * 0x29) >> 0xc;
                uVar92 = uVar95 * -100 + iVar70;
                uVar87 = iVar70 * -100 + iVar90;
                *(byte *)((long)puVar106 + 1) = (char)uVar95 + 0x30;
                uVar100 = (ulong)(uVar92 < 10 && uVar82 < 100000000);
                *(undefined2 *)((long)puVar106 + lVar86) =
                     *(undefined2 *)(digit_table + uVar100 + uVar92 * 2);
                lVar86 = lVar86 - uVar100;
                *(undefined2 *)((long)puVar106 + lVar86 + 2) =
                     *(undefined2 *)(digit_table + uVar87 * 2);
                iVar70 = (int)uVar83;
                if (iVar70 == 0) {
                  if (iVar60 == 0) {
                    uVar82 = (uint)(byte)dec_trailing_zero_table[uVar92];
                    if (uVar87 != 0) {
                      uVar82 = 0;
                    }
                    uVar82 = uVar82 + (byte)dec_trailing_zero_table[uVar87];
                    iVar70 = 4;
                  }
                  else {
                    uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                    uVar87 = uVar82 * -100 + iVar60;
                    *(undefined2 *)((long)puVar106 + lVar86 + 4) =
                         *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                    *(undefined2 *)((long)puVar106 + lVar86 + 6) =
                         *(undefined2 *)(digit_table + uVar87 * 2);
                    uVar82 = (byte)dec_trailing_zero_table[uVar82] + 2;
                    if (uVar87 != 0) {
                      uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
                    }
                    iVar70 = 8;
                  }
                  uVar82 = iVar70 - uVar82;
                }
                else {
                  uVar95 = (uint)(iVar60 * 0x147b) >> 0x13;
                  uVar82 = (uint)((uVar83 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar96 = uVar82 >> 8;
                  uVar92 = uVar96 * 0x147b >> 0x13;
                  uVar87 = uVar92 * -100 + (uVar82 >> 8);
                  *(undefined2 *)((long)puVar106 + lVar86 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar95 * 2);
                  *(undefined2 *)((long)puVar106 + lVar86 + 6) =
                       *(undefined2 *)(digit_table + (uVar95 * 0x7fffff9c + iVar60) * 2);
                  *(undefined2 *)((long)puVar106 + lVar86 + 8) =
                       *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                  *(undefined2 *)((long)puVar106 + lVar86 + 10) =
                       *(undefined2 *)(digit_table + uVar87 * 2);
                  iVar70 = uVar96 * -10000 + iVar70;
                  if (iVar70 == 0) {
                    uVar82 = (byte)dec_trailing_zero_table[uVar92] + 2;
                    if (uVar87 != 0) {
                      uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
                    }
                    iVar70 = 0xc;
                  }
                  else {
                    uVar82 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar87 = uVar82 * -100 + iVar70;
                    *(undefined2 *)((long)puVar106 + lVar86 + 0xc) =
                         *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                    *(undefined2 *)((long)puVar106 + lVar86 + 0xe) =
                         *(undefined2 *)(digit_table + uVar87 * 2);
                    uVar82 = (byte)dec_trailing_zero_table[uVar82] + 2;
                    if (uVar87 != 0) {
                      uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
                    }
                    iVar70 = 0x10;
                  }
                  uVar82 = iVar70 - uVar82;
                }
                pbVar80 = (byte *)((long)puVar106 +
                                  (((ulong)uVar82 + lVar86) - (ulong)((ulong)uVar82 + lVar86 == 2)))
                ;
                uVar69 = uVar69 - 1;
                *(byte *)puVar106 = *(byte *)((long)puVar106 + 1);
                *(byte *)((long)puVar106 + 1) = 0x2e;
                pbVar80[0] = 0x65;
                pbVar80[1] = 0x2d;
                uVar87 = uVar69 >> 0x1f;
                pbVar108 = pbVar80 + (ulong)uVar87 + 1;
                uVar82 = -uVar69;
                if (0 < (int)uVar69) {
                  uVar82 = uVar69;
                }
                if (uVar82 < 100) {
                  *(undefined2 *)pbVar108 =
                       *(undefined2 *)(digit_table + (ulong)(uVar82 < 10) + (ulong)uVar82 * 2);
                  puVar102 = (uint *)(pbVar108 + (2 - (ulong)(uVar82 < 10)));
                }
                else {
                  *pbVar108 = (char)(uVar82 * 0x290 >> 0x10) + 0x30;
                  *(undefined2 *)(pbVar80 + (ulong)uVar87 + 2) =
                       *(undefined2 *)
                        (digit_table + ((uVar82 * 0x290 >> 0x10) * 0x7fffff9c + uVar82) * 2);
                  puVar102 = (uint *)(pbVar80 + (ulong)uVar87 + 4);
                }
              }
            }
          }
        }
LAB_0123c3fb:
        *(ushort *)puVar102 = 0xa2c;
        puVar102 = (uint *)((long)puVar102 + 2);
LAB_0123c405:
        lVar97 = lVar97 + -1;
        lVar86 = lVar84;
        if (lVar97 == 0) goto LAB_0123d336;
        pyVar75 = pyVar75->next;
        puVar106 = puVar101;
        sVar76 = sVar62;
        goto LAB_0123a37f;
      }
      if (((uint)uVar100 & 7) == 5) {
        uVar78 = uVar100 >> 8;
        puVar74 = (uint *)(pyVar75->uni).str;
        uVar83 = local_50;
        if ((uVar82 & uVar69) != 0) {
          uVar83 = 0x10;
        }
        uVar83 = uVar83 + uVar78 * 6;
        if (puVar106 <= (ulong *)((long)puVar102 + uVar83)) {
          uVar85 = sVar76 >> 1;
          if (sVar76 >> 1 <= uVar83) {
            uVar85 = uVar83;
          }
          sVar62 = (uVar85 + 0xf & 0xfffffffffffffff0) + sVar76;
          pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar76,sVar62);
          if (pbVar80 == (byte *)0x0) goto LAB_012401b4;
          local_48 = (ulong *)(pbVar80 + (sVar62 - ((long)local_90 - (long)puVar106)));
          memmove(local_48,pbVar80 + ((long)puVar106 - (long)local_f8),
                  (long)local_90 - (long)puVar106);
          puVar102 = (uint *)(pbVar80 + ((long)puVar102 - (long)local_f8));
          local_90 = (ulong *)(pbVar80 + sVar62);
          puVar106 = local_48;
          local_f8 = pbVar80;
        }
        lVar86 = lVar84;
        puVar79 = puVar102;
        if (lVar84 != 0 && (uVar69 & uVar82) == 0) {
          do {
            puVar102 = (uint *)((long)puVar79 + lVar81);
            *puVar79 = 0x20202020;
            lVar86 = lVar86 + -1;
            puVar79 = puVar102;
          } while (lVar86 != 0);
        }
        if (local_d0 != (uint *)enc_table_cpy) {
          puVar79 = (uint *)(uVar78 + (long)puVar74);
          *(byte *)puVar102 = 0x22;
LAB_0123c587:
          lVar86 = (long)puVar79 - (long)puVar74;
          if (0xf < lVar86) {
            lVar71 = 0;
            do {
              puVar57 = (uint *)((long)puVar102 + lVar71 + 1);
              puVar61 = (uint *)((long)puVar74 + lVar71);
              bVar77 = *(byte *)((long)puVar74 + lVar71);
              if (*(char *)((long)local_d0 + (ulong)bVar77) != '\0') goto LAB_0123c841;
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 1)) != '\0')
              {
                puVar57 = (uint *)((long)puVar102 + lVar71 + 1);
                puVar61 = (uint *)((long)puVar74 + lVar71);
                goto LAB_0123c7cd;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 2)) != '\0')
              {
                puVar57 = (uint *)((long)puVar102 + lVar71 + 1);
                puVar61 = (uint *)((long)puVar74 + lVar71);
                goto LAB_0123c7e7;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 3)) != '\0')
              {
                puVar57 = (uint *)((long)puVar102 + lVar71 + 1);
                puVar61 = (uint *)((long)puVar74 + lVar71);
                goto LAB_0123c807;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 4)) != '\0')
              {
                puVar61 = (uint *)((byte *)((long)puVar74 + lVar71) + 4);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 5);
                *(undefined4 *)((long)puVar102 + lVar71 + 1) =
                     *(undefined4 *)((long)puVar74 + lVar71);
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 5)) != '\0')
              {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 5);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 6);
                *(byte *)((long)puVar57 + -1) = pbVar80[4];
                *(undefined4 *)((long)puVar57 + -5) = *(undefined4 *)pbVar80;
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 6)) != '\0')
              {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 6);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 7);
                *(ushort *)((long)puVar57 + -2) = *(ushort *)(pbVar80 + 4);
                *(undefined4 *)((long)puVar57 + -6) = *(undefined4 *)pbVar80;
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 7)) != '\0')
              {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 7);
                uVar3 = *(undefined4 *)pbVar80;
                puVar57 = (uint *)((long)puVar102 + lVar71 + 8);
                *(undefined4 *)((long)puVar102 + lVar71 + 4) = *(undefined4 *)(pbVar80 + 3);
                *(undefined4 *)((long)puVar102 + lVar71 + 1) = uVar3;
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 8)) != '\0')
              {
                puVar61 = (uint *)((byte *)((long)puVar74 + lVar71) + 8);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 9);
                *(undefined8 *)((long)puVar102 + lVar71 + 1) =
                     *(undefined8 *)((long)puVar74 + lVar71);
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 9)) != '\0')
              {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 9);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 10);
                *(byte *)((long)puVar57 + -1) = pbVar80[8];
                *(undefined8 *)((long)puVar57 + -9) = *(undefined8 *)pbVar80;
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 10)) != '\0')
              {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 10);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xb);
                *(ushort *)((long)puVar57 + -2) = *(ushort *)(pbVar80 + 8);
                *(undefined8 *)((long)puVar57 + -10) = *(undefined8 *)pbVar80;
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 0xb)) != '\0'
                 ) {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xb);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xc);
                puVar57[-1] = *(uint *)(pbVar80 + 7);
                *(undefined8 *)((long)puVar57 + -0xb) = *(undefined8 *)pbVar80;
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 0xc)) != '\0'
                 ) {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xc);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xd);
                puVar57[-1] = *(uint *)(pbVar80 + 8);
                *(undefined8 *)(puVar57 + -3) = *(undefined8 *)pbVar80;
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 0xd)) != '\0'
                 ) {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xd);
                uVar72 = *(undefined8 *)pbVar80;
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xe);
                *(undefined8 *)((long)puVar102 + lVar71 + 6) = *(undefined8 *)(pbVar80 + 5);
                *(undefined8 *)((long)puVar102 + lVar71 + 1) = uVar72;
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 0xe)) != '\0'
                 ) {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xe);
                uVar72 = *(undefined8 *)pbVar80;
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xf);
                *(undefined8 *)((long)puVar102 + lVar71 + 7) = *(undefined8 *)(pbVar80 + 6);
                *(undefined8 *)((long)puVar102 + lVar71 + 1) = uVar72;
                goto LAB_0123c841;
              }
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar74 + lVar71 + 0xf)) != '\0'
                 ) {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xf);
                uVar72 = *(undefined8 *)pbVar80;
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0x10);
                *(undefined8 *)((long)puVar102 + lVar71 + 8) = *(undefined8 *)(pbVar80 + 7);
                *(undefined8 *)((long)puVar102 + lVar71 + 1) = uVar72;
                goto LAB_0123c841;
              }
              uVar72 = *(undefined8 *)(puVar61 + 2);
              *(undefined8 *)puVar57 = *(undefined8 *)puVar61;
              *(undefined8 *)((long)puVar102 + lVar71 + 9) = uVar72;
              lVar71 = lVar71 + 0x10;
              lVar86 = lVar86 + -0x10;
            } while (0xf < lVar86);
            puVar102 = (uint *)((long)puVar102 + lVar71);
            puVar74 = (uint *)((long)puVar74 + lVar71);
          }
          puVar57 = (uint *)((long)puVar102 + 1);
          puVar61 = puVar74;
          if (3 < lVar86) {
            lVar86 = (long)puVar79 - (long)puVar74;
            do {
              bVar77 = (byte)*puVar61;
              if (*(char *)((long)local_d0 + (ulong)bVar77) != '\0') goto LAB_0123c841;
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar61 + 1)) != '\0')
              goto LAB_0123c7cd;
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar61 + 2)) != '\0')
              goto LAB_0123c7e7;
              if (*(char *)((long)local_d0 + (ulong)*(byte *)((long)puVar61 + 3)) != '\0')
              goto LAB_0123c807;
              *puVar57 = *puVar61;
              puVar57 = puVar57 + 1;
              puVar61 = puVar61 + 1;
              lVar86 = lVar86 + -4;
            } while (3 < lVar86);
          }
          if (puVar61 < puVar79) {
            while (uVar87 = *puVar61, *(char *)((long)local_d0 + (ulong)(byte)uVar87) == '\0') {
              puVar61 = (uint *)((long)puVar61 + 1);
              *(byte *)puVar57 = (byte)uVar87;
              puVar57 = (uint *)((long)puVar57 + 1);
              if (puVar79 <= puVar61) goto switchD_0123ab17_default;
            }
            goto LAB_0123c841;
          }
          goto switchD_0123ab17_default;
        }
        uVar58 = pyVar75->tag;
        *(byte *)puVar102 = 0x22;
        if ((uVar58 & 0x18) == 0) {
          puVar79 = (uint *)(uVar78 + (long)puVar74);
LAB_0123a888:
          lVar86 = (long)puVar79 - (long)puVar74;
          if (0xf < lVar86) {
            lVar71 = 0;
            do {
              puVar57 = (uint *)((long)puVar102 + lVar71 + 1);
              puVar61 = (uint *)((long)puVar74 + lVar71);
              bVar77 = *(byte *)((long)puVar74 + lVar71);
              if (enc_table_cpy[bVar77] != '\0') goto LAB_0123aaea;
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 1)] != '\0') {
                puVar57 = (uint *)((long)puVar102 + lVar71 + 1);
                puVar61 = (uint *)((long)puVar74 + lVar71);
                goto LAB_0123aa8d;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 2)] != '\0') {
                puVar57 = (uint *)((long)puVar102 + lVar71 + 1);
                puVar61 = (uint *)((long)puVar74 + lVar71);
                goto LAB_0123aaa2;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 3)] != '\0') {
                puVar57 = (uint *)((long)puVar102 + lVar71 + 1);
                puVar61 = (uint *)((long)puVar74 + lVar71);
                goto LAB_0123aabd;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 4)] != '\0') {
                puVar61 = (uint *)((byte *)((long)puVar74 + lVar71) + 4);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 5);
                *(undefined4 *)((long)puVar102 + lVar71 + 1) =
                     *(undefined4 *)((long)puVar74 + lVar71);
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 5)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 5);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 6);
                *(byte *)((long)puVar57 + -1) = pbVar80[4];
                *(undefined4 *)((long)puVar57 + -5) = *(undefined4 *)pbVar80;
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 6)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 6);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 7);
                *(ushort *)((long)puVar57 + -2) = *(ushort *)(pbVar80 + 4);
                *(undefined4 *)((long)puVar57 + -6) = *(undefined4 *)pbVar80;
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 7)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 7);
                uVar3 = *(undefined4 *)pbVar80;
                puVar57 = (uint *)((long)puVar102 + lVar71 + 8);
                *(undefined4 *)((long)puVar102 + lVar71 + 4) = *(undefined4 *)(pbVar80 + 3);
                *(undefined4 *)((long)puVar102 + lVar71 + 1) = uVar3;
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 8)] != '\0') {
                puVar61 = (uint *)((byte *)((long)puVar74 + lVar71) + 8);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 9);
                *(undefined8 *)((long)puVar102 + lVar71 + 1) =
                     *(undefined8 *)((long)puVar74 + lVar71);
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 9)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 9);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 10);
                *(byte *)((long)puVar57 + -1) = pbVar80[8];
                *(undefined8 *)((long)puVar57 + -9) = *(undefined8 *)pbVar80;
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 10)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 10);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xb);
                *(ushort *)((long)puVar57 + -2) = *(ushort *)(pbVar80 + 8);
                *(undefined8 *)((long)puVar57 + -10) = *(undefined8 *)pbVar80;
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 0xb)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xb);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xc);
                puVar57[-1] = *(uint *)(pbVar80 + 7);
                *(undefined8 *)((long)puVar57 + -0xb) = *(undefined8 *)pbVar80;
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 0xc)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xc);
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xd);
                puVar57[-1] = *(uint *)(pbVar80 + 8);
                *(undefined8 *)(puVar57 + -3) = *(undefined8 *)pbVar80;
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 0xd)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xd);
                uVar72 = *(undefined8 *)pbVar80;
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xe);
                *(undefined8 *)((long)puVar102 + lVar71 + 6) = *(undefined8 *)(pbVar80 + 5);
                *(undefined8 *)((long)puVar102 + lVar71 + 1) = uVar72;
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 0xe)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xe);
                uVar72 = *(undefined8 *)pbVar80;
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0xf);
                *(undefined8 *)((long)puVar102 + lVar71 + 7) = *(undefined8 *)(pbVar80 + 6);
                *(undefined8 *)((long)puVar102 + lVar71 + 1) = uVar72;
                goto LAB_0123aaea;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar71 + 0xf)] != '\0') {
                pbVar80 = (byte *)((long)puVar74 + lVar71);
                puVar61 = (uint *)(pbVar80 + 0xf);
                uVar72 = *(undefined8 *)pbVar80;
                puVar57 = (uint *)((long)puVar102 + lVar71 + 0x10);
                *(undefined8 *)((long)puVar102 + lVar71 + 8) = *(undefined8 *)(pbVar80 + 7);
                *(undefined8 *)((long)puVar102 + lVar71 + 1) = uVar72;
                goto LAB_0123aaea;
              }
              uVar72 = *(undefined8 *)(puVar61 + 2);
              *(undefined8 *)puVar57 = *(undefined8 *)puVar61;
              *(undefined8 *)((long)puVar102 + lVar71 + 9) = uVar72;
              lVar71 = lVar71 + 0x10;
              lVar86 = lVar86 + -0x10;
            } while (0xf < lVar86);
            puVar102 = (uint *)((long)puVar102 + lVar71);
            puVar74 = (uint *)((long)puVar74 + lVar71);
          }
          puVar57 = (uint *)((long)puVar102 + 1);
          puVar61 = puVar74;
          if (3 < lVar86) {
            lVar86 = (long)puVar79 - (long)puVar74;
            do {
              bVar77 = (byte)*puVar61;
              if (enc_table_cpy[bVar77] != '\0') goto LAB_0123aaea;
              if (enc_table_cpy[*(byte *)((long)puVar61 + 1)] != '\0') goto LAB_0123aa8d;
              if (enc_table_cpy[*(byte *)((long)puVar61 + 2)] != '\0') goto LAB_0123aaa2;
              if (enc_table_cpy[*(byte *)((long)puVar61 + 3)] != '\0') goto LAB_0123aabd;
              *puVar57 = *puVar61;
              puVar57 = puVar57 + 1;
              puVar61 = puVar61 + 1;
              lVar86 = lVar86 + -4;
            } while (3 < lVar86);
          }
          if (puVar61 < puVar79) {
            while (uVar87 = *puVar61, enc_table_cpy[(byte)uVar87] == '\0') {
              puVar61 = (uint *)((long)puVar61 + 1);
              *(byte *)puVar57 = (byte)uVar87;
              puVar57 = (uint *)((long)puVar57 + 1);
              if (puVar79 <= puVar61) goto switchD_0123ab17_default;
            }
            goto LAB_0123aaea;
          }
          goto switchD_0123ab17_default;
        }
        puVar57 = (uint *)((long)puVar102 + 1);
        if (0xfff < uVar100) {
          do {
            uVar72 = *(undefined8 *)(puVar74 + 2);
            *(undefined8 *)puVar57 = *(undefined8 *)puVar74;
            *(undefined8 *)(puVar57 + 2) = uVar72;
            puVar57 = puVar57 + 4;
            puVar74 = puVar74 + 4;
            uVar78 = uVar78 - 0x10;
          } while (0xf < uVar78);
        }
        for (; 3 < uVar78; uVar78 = uVar78 - 4) {
          *puVar57 = *puVar74;
          puVar57 = puVar57 + 1;
          puVar74 = puVar74 + 1;
        }
        if (uVar78 != 0) {
          uVar83 = 0;
          do {
            *(byte *)((long)puVar57 + uVar83) = *(byte *)((long)puVar74 + uVar83);
            uVar83 = uVar83 + 1;
          } while (uVar78 != uVar83);
          puVar57 = (uint *)((long)puVar57 + uVar83);
        }
switchD_0123ab17_default:
        bVar110 = (~uVar82 & uVar69) == 0;
        *(byte *)puVar57 = 0x22;
        bVar77 = 0x3a;
        if (bVar110) {
          bVar77 = 0x2c;
        }
        *(byte *)((long)puVar57 + 1) = bVar77;
        bVar77 = 0x20;
        if (bVar110) {
          bVar77 = 10;
        }
        *(byte *)((long)puVar57 + 2) = bVar77;
        puVar102 = (uint *)((long)puVar57 + 3);
        puVar101 = puVar106;
        goto LAB_0123c405;
      }
      if ((~(byte)uVar100 & 6) != 0) {
        if (bVar77 == 1) {
          uVar100 = uVar100 >> 8;
          puVar101 = (ulong *)(pyVar75->uni).ptr;
          if (puVar106 <= (ulong *)((long)puVar102 + uVar100 + 3)) {
            uVar83 = sVar76 >> 1;
            if (sVar76 >> 1 <= uVar100 + 3) {
              uVar83 = uVar100 + 3;
            }
            sVar62 = (uVar83 + 0xf & 0xfffffffffffffff0) + sVar76;
            local_48 = puVar101;
            pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar76,sVar62);
            if (pbVar80 == (byte *)0x0) goto LAB_012401b4;
            sVar73 = (long)local_90 - (long)puVar106;
            memmove(pbVar80 + (sVar62 - sVar73),pbVar80 + ((long)puVar106 - (long)local_f8),sVar73);
            puVar102 = (uint *)(pbVar80 + ((long)puVar102 - (long)local_f8));
            local_90 = (ulong *)(pbVar80 + sVar62);
            puVar106 = (ulong *)(pbVar80 + (sVar62 - sVar73));
            sVar76 = sVar62;
            puVar101 = local_48;
            local_f8 = pbVar80;
          }
          switchD_00b041bd::default(puVar102,puVar101,uVar100);
          pbVar80 = (byte *)((long)puVar102 + uVar100);
          puVar102 = (uint *)(pbVar80 + 2);
          pbVar80[0] = 0x2c;
          pbVar80[1] = 10;
          puVar101 = puVar106;
          sVar62 = sVar76;
        }
        else if (bVar77 == 2) {
          uVar83 = local_50;
          if ((uVar82 & uVar69) != 0) {
            uVar83 = 0x10;
          }
          if (puVar106 <= (ulong *)((long)puVar102 + uVar83)) {
            uVar100 = sVar76 >> 1;
            if (sVar76 >> 1 <= uVar83) {
              uVar100 = uVar83;
            }
            sVar62 = (uVar100 + 0xf & 0xfffffffffffffff0) + sVar76;
            pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar76,sVar62);
            if (pbVar80 == (byte *)0x0) goto LAB_012401b4;
            puVar101 = (ulong *)(pbVar80 + (sVar62 - ((long)local_90 - (long)puVar106)));
            memmove(puVar101,pbVar80 + ((long)puVar106 - (long)local_f8),
                    (long)local_90 - (long)puVar106);
            puVar102 = (uint *)(pbVar80 + ((long)puVar102 - (long)local_f8));
            local_90 = (ulong *)(pbVar80 + sVar62);
            local_f8 = pbVar80;
          }
          lVar86 = lVar84;
          puVar74 = puVar102;
          if (lVar84 != 0 && (uVar82 & uVar69) == 0) {
            do {
              puVar102 = (uint *)((long)puVar74 + lVar81);
              *puVar74 = 0x20202020;
              lVar86 = lVar86 + -1;
              puVar74 = puVar102;
            } while (lVar86 != 0);
          }
          puVar102[0] = 0x6c6c756e;
          puVar102[1] = 0xa2c;
          puVar102 = (uint *)((long)puVar102 + 6);
        }
        else {
          if (bVar77 != 3) goto LAB_0124024c;
          uVar83 = local_50;
          if ((uVar82 & uVar69) != 0) {
            uVar83 = 0x10;
          }
          if (puVar106 <= (ulong *)((long)puVar102 + uVar83)) {
            uVar100 = sVar76 >> 1;
            if (sVar76 >> 1 <= uVar83) {
              uVar100 = uVar83;
            }
            sVar62 = (uVar100 + 0xf & 0xfffffffffffffff0) + sVar76;
            pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar76,sVar62);
            if (pbVar80 == (byte *)0x0) goto LAB_012401b4;
            puVar101 = (ulong *)(pbVar80 + (sVar62 - ((long)local_90 - (long)puVar106)));
            memmove(puVar101,pbVar80 + ((long)puVar106 - (long)local_f8),
                    (long)local_90 - (long)puVar106);
            puVar102 = (uint *)(pbVar80 + ((long)puVar102 - (long)local_f8));
            local_90 = (ulong *)(pbVar80 + sVar62);
            local_f8 = pbVar80;
          }
          lVar86 = lVar84;
          puVar74 = puVar102;
          if (lVar84 != 0 && (uVar82 & uVar69) == 0) {
            do {
              puVar102 = (uint *)((long)puVar74 + lVar81);
              *puVar74 = 0x20202020;
              lVar86 = lVar86 + -1;
              puVar74 = puVar102;
            } while (lVar86 != 0);
          }
          bVar110 = (pyVar75->tag & 0x18) != 0;
          uVar72 = 0xa2c65736c6166;
          if (bVar110) {
            uVar72 = 0xa2c65757274;
          }
          *(undefined8 *)puVar102 = uVar72;
          puVar102 = (uint *)((long)puVar102 + (7 - (ulong)bVar110));
        }
        goto LAB_0123c405;
      }
      if (uVar100 < 0x100) {
        uVar83 = local_50;
        if ((uVar82 & uVar69) != 0) {
          uVar83 = 0x10;
        }
        if (puVar106 <= (ulong *)((long)puVar102 + uVar83)) {
          uVar100 = sVar76 >> 1;
          if (sVar76 >> 1 <= uVar83) {
            uVar100 = uVar83;
          }
          sVar62 = (uVar100 + 0xf & 0xfffffffffffffff0) + sVar76;
          pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar76,sVar62);
          if (pbVar80 == (byte *)0x0) goto LAB_012401b4;
          puVar101 = (ulong *)(pbVar80 + (sVar62 - ((long)local_90 - (long)puVar106)));
          memmove(puVar101,pbVar80 + ((long)puVar106 - (long)local_f8),
                  (long)local_90 - (long)puVar106);
          puVar102 = (uint *)(pbVar80 + ((long)puVar102 - (long)local_f8));
          local_90 = (ulong *)(pbVar80 + sVar62);
          local_f8 = pbVar80;
        }
        lVar86 = lVar84;
        puVar74 = puVar102;
        if (lVar84 != 0 && (uVar82 & uVar69) == 0) {
          do {
            puVar102 = (uint *)((long)puVar74 + lVar81);
            *puVar74 = 0x20202020;
            lVar86 = lVar86 + -1;
            puVar74 = puVar102;
          } while (lVar86 != 0);
        }
        bVar77 = (bVar77 == 7) * ' ';
        *(byte *)puVar102 = bVar77 + 0x5b;
        *(byte *)((long)puVar102 + 1) = bVar77 | 0x5d;
        *(ushort *)((long)puVar102 + 2) = 0xa2c;
        puVar102 = puVar102 + 1;
        goto LAB_0123c405;
      }
      local_78 = (ulong)(bVar77 == 7);
      if ((uVar82 & uVar69) != 0) {
        uVar63 = 0x20;
      }
      uVar83 = sVar76;
      if (puVar106 <= (ulong *)((long)puVar102 + uVar63)) {
        uVar83 = sVar76 >> 1;
        if (sVar76 >> 1 <= uVar63) {
          uVar83 = uVar63;
        }
        uVar83 = (uVar83 + 0xf & 0xfffffffffffffff0) + sVar76;
        pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar76,uVar83);
        if (pbVar80 == (byte *)0x0) goto LAB_012401b4;
        puVar101 = (ulong *)(pbVar80 + (uVar83 - ((long)local_90 - (long)puVar106)));
        memmove(puVar101,pbVar80 + ((long)puVar106 - (long)local_f8),(long)local_90 - (long)puVar106
               );
        puVar102 = (uint *)(pbVar80 + ((long)puVar102 - (long)local_f8));
        local_90 = (ulong *)(pbVar80 + uVar83);
        local_f8 = pbVar80;
      }
      puVar101[-2] = uVar107 + lVar97 * 2;
      lVar97 = (uVar100 >> 8) << (bVar77 == 7);
      puVar101[-1] = (ulong)local_68;
      lVar86 = lVar84;
      puVar74 = puVar102;
      if (lVar84 != 0 && (uVar82 & uVar69) == 0) {
        do {
          puVar102 = (uint *)((long)puVar74 + lVar81);
          *puVar74 = 0x20202020;
          lVar86 = lVar86 + -1;
          puVar74 = puVar102;
        } while (lVar86 != 0);
      }
      *(byte *)puVar102 = (bVar77 == 7) << 5 | 0x5b;
      *(byte *)((long)puVar102 + 1) = 10;
      uVar58 = (pyVar75->uni).u64;
      if (bVar77 == 7) {
        uVar58 = *(uint64_t *)(uVar58 + 0x10);
      }
      puVar101 = puVar101 + -2;
      lVar84 = lVar84 + 1;
      puVar102 = (uint *)((long)puVar102 + 2);
      pyVar65 = *(yyjson_mut_val **)(uVar58 + 0x10);
      local_68 = pyVar75;
    } while( true );
  }
  if ((flg & 2) == 0) {
    puVar99 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar99 = enc_table_cpy;
    }
    switch(bVar77 & 7) {
    case 0:
      goto switchD_0123a220_caseD_0;
    case 1:
switchD_0123a220_caseD_1:
      uVar83 = uVar83 >> 8;
      pvVar8 = (val->uni).ptr;
      puVar102 = (uint *)(*p_Var4)(pvVar6,uVar83 + 2);
      if (puVar102 != (uint *)0x0) {
        switchD_00b041bd::default(puVar102,pvVar8,uVar83);
        local_40 = (uint *)((long)puVar102 + uVar83);
        goto LAB_0124059d;
      }
      break;
    case 2:
switchD_0123a220_caseD_2:
      puVar102 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar102 != (uint *)0x0) {
        puVar102[0] = 0x6c6c756e;
        puVar102[1] = 0xa2c;
LAB_01240438:
        local_40 = puVar102 + 1;
        goto LAB_0124059d;
      }
      break;
    case 3:
switchD_0123a220_caseD_3:
      puVar102 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar102 != (uint *)0x0) {
        bVar110 = (val->tag & 0x18) != 0;
        uVar72 = 0xa2c65736c6166;
        if (bVar110) {
          uVar72 = 0xa2c65757274;
        }
        *(undefined8 *)puVar102 = uVar72;
        local_40 = (uint *)((long)puVar102 + (5 - (ulong)bVar110));
        goto LAB_0124059d;
      }
      break;
    case 4:
switchD_0123a220_caseD_4:
      puVar102 = (uint *)(*p_Var4)(pvVar6,0x22);
      if (puVar102 != (uint *)0x0) {
        uVar83 = (val->uni).u64;
        uVar69 = (uint)(uVar83 >> 0x20);
        if ((val->tag & 0x10) == 0) {
          uVar69 = uVar69 >> 0x1f & (uint)(val->tag >> 3);
          uVar63 = -uVar83;
          if (uVar69 == 0) {
            uVar63 = uVar83;
          }
          *(byte *)puVar102 = 0x2d;
          pbVar80 = (byte *)((long)puVar102 + (ulong)uVar69);
          if (uVar63 < 100000000) {
            if (uVar63 < 100) {
              *(undefined2 *)pbVar80 =
                   *(undefined2 *)(digit_table + (ulong)(uVar63 < 10) + uVar63 * 2);
              pbVar80 = pbVar80 + -(ulong)(uVar63 < 10);
              goto LAB_01242020;
            }
            iVar70 = (int)uVar63;
            if (uVar63 < 10000) {
              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
              uVar83 = (ulong)(uVar63 < 1000);
              *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar83 + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + (2 - uVar83)) =
                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
              local_40 = (uint *)(pbVar80 + (4 - uVar83));
              goto LAB_0124059d;
            }
            if (uVar63 < 1000000) {
              iVar70 = (int)(uVar63 * 0x68db9 >> 0x20) * -10000 + iVar70;
              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
              uVar83 = (ulong)(uVar63 < 100000);
              *(undefined2 *)pbVar80 =
                   *(undefined2 *)(digit_table + uVar83 + (uVar63 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar80 + (2 - uVar83)) =
                   *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + (4 - uVar83)) =
                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
              local_40 = (uint *)(pbVar80 + (6 - uVar83));
              goto LAB_0124059d;
            }
            uVar69 = (uint)(uVar63 * 0x68db8bb >> 0x20);
            uVar82 = uVar69 >> 8;
            iVar70 = uVar82 * -10000 + iVar70;
            uVar82 = uVar82 * 0x147b >> 0x13;
            uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
            iVar70 = uVar87 * -100 + iVar70;
            *(undefined2 *)pbVar80 =
                 *(undefined2 *)(digit_table + (ulong)(uVar63 < 10000000) + (ulong)uVar82 * 2);
            pbVar80 = pbVar80 + -(ulong)(uVar63 < 10000000);
            *(undefined2 *)(pbVar80 + 2) =
                 *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
            uVar68 = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
          }
          else {
            uVar83 = uVar63 / 100000000;
            uVar107 = uVar83 * 0xfa0a1f00 + uVar63;
            iVar70 = (int)uVar83;
            if (9999999999999999 < uVar63) {
              uVar83 = uVar63 / 1000000000000;
              iVar60 = (int)uVar83;
              iVar70 = iVar70 + iVar60 * -10000;
              if (uVar63 < 1000000000000000000) {
                iVar60 = (int)(uVar83 * 0x68db9 >> 0x20) * -10000 + iVar60;
                uVar69 = (uint)(iVar60 * 0x147b) >> 0x13;
                uVar63 = (ulong)(uVar63 < 100000000000000000);
                *(undefined2 *)pbVar80 =
                     *(undefined2 *)(digit_table + uVar63 + (uVar83 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                     *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar63)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + iVar60) * 2);
                lVar97 = 6 - uVar63;
              }
              else {
                uVar69 = (uint)(uVar83 / 10000);
                iVar60 = uVar69 * -10000 + iVar60;
                uVar69 = uVar69 / 100;
                uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                uVar63 = (ulong)(uVar63 < 10000000000000000000);
                *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar63 + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + (int)(uVar83 / 10000)) * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar63)) =
                     *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                *(undefined2 *)(pbVar80 + (6 - uVar63)) =
                     *(undefined2 *)(digit_table + (uVar82 * -100 + iVar60) * 2);
                lVar97 = 8 - uVar63;
              }
              pbVar80 = pbVar80 + lVar97;
              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
              *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + 2) =
                   *(undefined2 *)(digit_table + (uVar69 * 0x7fffff9c + iVar70) * 2);
              uVar69 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
              uVar82 = uVar69 >> 8;
              iVar70 = uVar82 * -10000 + (int)uVar107;
              uVar82 = uVar82 * 0x147b >> 0x13;
              uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
              *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
              *(undefined2 *)(pbVar80 + 6) =
                   *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
              *(undefined2 *)(pbVar80 + 8) = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
              *(undefined2 *)(pbVar80 + 10) =
                   *(undefined2 *)(digit_table + (uVar87 * 0x7fffff9c + iVar70) * 2);
              local_40 = (uint *)(pbVar80 + 0xc);
              goto LAB_0124059d;
            }
            if (uVar63 >> 10 < 0x9502f9) {
              *(undefined2 *)pbVar80 =
                   *(undefined2 *)(digit_table + (ulong)(uVar63 < 1000000000) + uVar83 * 2);
              pbVar80 = pbVar80 + (2 - (ulong)(uVar63 < 1000000000));
            }
            else if (uVar63 >> 0xc < 0xe8d4a51) {
              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
              uVar83 = (ulong)(uVar63 >> 0xb < 0x2e90edd);
              *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar83 + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + (2 - uVar83)) =
                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
              pbVar80 = pbVar80 + (4 - uVar83);
            }
            else if (uVar63 < 100000000000000) {
              iVar70 = (int)(uVar83 * 0x68db9 >> 0x20) * -10000 + iVar70;
              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
              uVar63 = (ulong)(uVar63 >> 0xd < 0x48c27395);
              *(undefined2 *)pbVar80 =
                   *(undefined2 *)(digit_table + uVar63 + (uVar83 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar80 + (2 - uVar63)) =
                   *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + (4 - uVar63)) =
                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
              pbVar80 = pbVar80 + (6 - uVar63);
            }
            else {
              uVar69 = (uint)(uVar83 * 0x68db8bb >> 0x20);
              uVar82 = uVar69 >> 8;
              iVar70 = uVar82 * -10000 + iVar70;
              uVar82 = uVar82 * 0x147b >> 0x13;
              uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
              uVar83 = (ulong)(uVar63 < 1000000000000000);
              *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar83 + (ulong)uVar82 * 2);
              *(undefined2 *)(pbVar80 + (2 - uVar83)) =
                   *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
              *(undefined2 *)(pbVar80 + (4 - uVar83)) =
                   *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
              *(undefined2 *)(pbVar80 + (6 - uVar83)) =
                   *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
              pbVar80 = pbVar80 + (8 - uVar83);
            }
            uVar69 = (uint)((uVar107 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar82 = uVar69 >> 8;
            iVar70 = uVar82 * -10000 + (int)uVar107;
            uVar82 = uVar82 * 0x147b >> 0x13;
            uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
            iVar70 = uVar87 * 0x7fffff9c + iVar70;
            *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
            *(undefined2 *)(pbVar80 + 2) =
                 *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
            uVar68 = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
          }
          *(undefined2 *)(pbVar80 + 4) = uVar68;
          *(undefined2 *)(pbVar80 + 6) = *(undefined2 *)(digit_table + (uint)(iVar70 * 2));
          local_40 = (uint *)(pbVar80 + 8);
        }
        else {
          uVar63 = uVar83 & 0xfffffffffffff;
          uVar69 = uVar69 >> 0x14 & 0x7ff;
          if (uVar69 == 0x7ff) {
            if ((flg & 0x10) == 0) {
              if ((flg & 8) != 0) {
                if (uVar63 == 0) {
                  *(byte *)puVar102 = 0x2d;
                  lVar97 = -((long)uVar83 >> 0x3f);
                  *(undefined8 *)((long)puVar102 + lVar97) = 0x7974696e69666e49;
                  local_40 = (uint *)((long)puVar102 + lVar97 + 8);
                }
                else {
                  *puVar102 = 0x4e614e;
                  local_40 = (uint *)((long)puVar102 + 3);
                }
                goto LAB_0124059d;
              }
              (*p_Var5)(pvVar6,puVar102);
              if (dat_len != (usize *)0x0) {
                *dat_len = 0;
              }
              pyVar66 = &local_60;
              if (err != (yyjson_write_err *)0x0) {
                pyVar66 = err;
              }
              pyVar67->code = 4;
              pcVar59 = "nan or inf number is not allowed";
              goto LAB_01240601;
            }
            *puVar102 = 0x6c6c756e;
            goto LAB_01240438;
          }
          *(byte *)puVar102 = 0x2d;
          lVar97 = -((long)uVar83 >> 0x3f);
          puVar104 = (undefined8 *)(lVar97 + (long)puVar102);
          if ((uVar83 & 0x7fffffffffffffff) == 0) {
            *(undefined4 *)puVar104 = 0x302e30;
            local_40 = (uint *)((long)puVar104 + 3);
            goto LAB_0124059d;
          }
          if (uVar69 == 0) {
            yyjson_mut_write_opts_impl();
            goto LAB_0124059d;
          }
          uVar107 = uVar63 + 0x10000000000000;
          if (uVar69 - 0x3ff < 0x35) {
            lVar81 = 0;
            if (uVar107 != 0) {
              for (; (uVar107 >> lVar81 & 1) == 0; lVar81 = lVar81 + 1) {
              }
            }
            if (0x433 - uVar69 <= (uint)lVar81) {
              uVar107 = uVar107 >> ((byte)(0x433 - uVar69) & 0x3f);
              iVar70 = (int)uVar107;
              if (uVar107 < 100000000) {
                if (uVar107 < 100) {
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + (ulong)(uVar107 < 10) + uVar107 * 2);
                  pbVar80 = (byte *)((long)puVar104 + (2 - (ulong)(uVar107 < 10)));
                }
                else if (uVar107 < 10000) {
                  uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                  uVar83 = (ulong)(uVar107 < 1000);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar83 + (ulong)uVar69 * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar83)) =
                       *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                  pbVar80 = (byte *)((long)puVar104 + (4 - uVar83));
                }
                else if (uVar107 < 1000000) {
                  iVar70 = (int)(uVar107 * 0x68db9 >> 0x20) * -10000 + iVar70;
                  uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                  uVar83 = (ulong)(uVar107 < 100000);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar83 + (uVar107 * 0x68db9 >> 0x20) * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar83)) =
                       *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                  *(undefined2 *)((long)puVar104 + (4 - uVar83)) =
                       *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                  pbVar80 = (byte *)((long)puVar104 + (6 - uVar83));
                }
                else {
                  uVar69 = (uint)(uVar107 * 0x68db8bb >> 0x20);
                  uVar82 = uVar69 >> 8;
                  iVar70 = uVar82 * -10000 + iVar70;
                  uVar82 = uVar82 * 0x147b >> 0x13;
                  uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                  uVar83 = (ulong)(uVar107 < 10000000);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar83 + (ulong)uVar82 * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar83)) =
                       *(undefined2 *)(digit_table + (uVar82 * -100 + (uVar69 >> 8)) * 2);
                  *(undefined2 *)((long)puVar104 + (4 - uVar83)) =
                       *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                  *(undefined2 *)((long)puVar104 + (6 - uVar83)) =
                       *(undefined2 *)(digit_table + (uVar87 * -100 + iVar70) * 2);
                  pbVar80 = (byte *)((long)puVar104 + (8 - uVar83));
                }
              }
              else {
                auVar29._8_8_ = 0;
                auVar29._0_8_ = uVar107;
                uVar83 = SUB168(auVar29 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                iVar60 = (int)uVar83;
                uVar69 = iVar60 * -100000000 + iVar70;
                if (uVar107 >> 10 < 0x9502f9) {
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + (ulong)(uVar107 < 1000000000) + uVar83 * 2);
                  puVar89 = (undefined2 *)((long)puVar104 + (2 - (ulong)(uVar107 < 1000000000)));
                }
                else if (uVar107 >> 0xc < 0xe8d4a51) {
                  uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                  uVar83 = (ulong)(uVar107 >> 0xb < 0x2e90edd);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar83 + (ulong)uVar82 * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar83)) =
                       *(undefined2 *)(digit_table + (uVar82 * -100 + iVar60) * 2);
                  puVar89 = (undefined2 *)((long)puVar104 + (4 - uVar83));
                }
                else if (uVar107 < 100000000000000) {
                  iVar60 = (int)(uVar83 * 0x68db9 >> 0x20) * -10000 + iVar60;
                  uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                  uVar63 = (ulong)(uVar107 >> 0xd < 0x48c27395);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar63 + (uVar83 * 0x68db9 >> 0x20) * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar63)) =
                       *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                  *(undefined2 *)((long)puVar104 + (4 - uVar63)) =
                       *(undefined2 *)(digit_table + (uVar82 * -100 + iVar60) * 2);
                  puVar89 = (undefined2 *)((long)puVar104 + (6 - uVar63));
                }
                else {
                  uVar82 = (uint)(uVar83 * 0x68db8bb >> 0x20);
                  uVar87 = uVar82 >> 8;
                  iVar60 = uVar87 * -10000 + iVar60;
                  uVar87 = uVar87 * 0x147b >> 0x13;
                  uVar92 = (uint)(iVar60 * 0x147b) >> 0x13;
                  uVar83 = (ulong)(uVar107 < 1000000000000000);
                  *(undefined2 *)puVar104 =
                       *(undefined2 *)(digit_table + uVar83 + (ulong)uVar87 * 2);
                  *(undefined2 *)((long)puVar104 + (2 - uVar83)) =
                       *(undefined2 *)(digit_table + (uVar87 * -100 + (uVar82 >> 8)) * 2);
                  *(undefined2 *)((long)puVar104 + (4 - uVar83)) =
                       *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                  *(undefined2 *)((long)puVar104 + (6 - uVar83)) =
                       *(undefined2 *)(digit_table + (uVar92 * -100 + iVar60) * 2);
                  puVar89 = (undefined2 *)((long)puVar104 + (8 - uVar83));
                }
                uVar82 = (uint)((ulong)uVar69 * 0x68db8bb >> 0x20);
                uVar87 = uVar82 >> 8;
                iVar70 = uVar87 * -10000 + uVar69;
                uVar69 = uVar87 * 0x147b >> 0x13;
                uVar87 = (uint)(iVar70 * 0x147b) >> 0x13;
                *puVar89 = *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                puVar89[1] = *(undefined2 *)(digit_table + (uVar69 * -100 + (uVar82 >> 8)) * 2);
                puVar89[2] = *(undefined2 *)(digit_table + (ulong)uVar87 * 2);
                puVar89[3] = *(undefined2 *)(digit_table + (uVar87 * 0x7fffff9c + iVar70) * 2);
                pbVar80 = (byte *)(puVar89 + 4);
              }
              pbVar80[0] = 0x2e;
              pbVar80[1] = 0x30;
              goto LAB_01242020;
            }
          }
          uVar83 = (ulong)((uint)uVar83 & 1);
          iVar70 = uVar69 * 0x4d105 + -0x200a5;
          if (uVar69 == 1 || uVar63 != 0) {
            iVar70 = uVar69 * 0x4d105;
          }
          iVar70 = iVar70 + -0x1439b7ff >> 0x14;
          uVar100 = *(ulong *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2ae) * 8);
          uVar78 = *(long *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2af) * 8) +
                   (ulong)(iVar70 - 1U < 0xffffffc8);
          bVar77 = ((char)((uint)(iVar70 * -0x3526b) >> 0x10) + (char)uVar69) - 0x32;
          uVar63 = (ulong)(uVar69 != 1 && uVar63 == 0) + uVar107 * 4 + -2 << (bVar77 & 0x3f);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = uVar78;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = uVar63;
          auVar54._8_8_ = 0;
          auVar54._0_8_ = SUB168(auVar23 * auVar42,8);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = uVar100;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = uVar63;
          auVar54 = auVar24 * auVar43 + auVar54;
          uVar63 = uVar107 * 4 << (bVar77 & 0x3f);
          auVar25._8_8_ = 0;
          auVar25._0_8_ = uVar78;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar63;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = SUB168(auVar25 * auVar44,8);
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar100;
          auVar45._8_8_ = 0;
          auVar45._0_8_ = uVar63;
          auVar55 = auVar26 * auVar45 + auVar55;
          uVar63 = auVar55._8_8_;
          uVar107 = uVar107 * 4 + 2 << (bVar77 & 0x3f);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar78;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = uVar107;
          auVar56._8_8_ = 0;
          auVar56._0_8_ = SUB168(auVar27 * auVar46,8);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = uVar100;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = uVar107;
          auVar56 = auVar28 * auVar47 + auVar56;
          uVar107 = ((ulong)((auVar54 & (undefined1  [16])0xfffffffffffffffe) !=
                            (undefined1  [16])0x0) | auVar54._8_8_) + uVar83;
          uVar83 = ((ulong)((auVar56 & (undefined1  [16])0xfffffffffffffffe) !=
                           (undefined1  [16])0x0) | auVar56._8_8_) - uVar83;
          if (uVar63 < 0x28) {
LAB_012407e2:
            uVar78 = (auVar55 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                     uVar63;
            uVar100 = uVar63 & 0xfffffffffffffffc;
            bVar110 = true;
            if (uVar78 <= uVar100 + 2) {
              bVar110 = (bool)((byte)(uVar63 >> 2) & 0x3f & uVar78 == uVar100 + 2);
            }
            bVar109 = uVar100 + 4 <= uVar83;
            if (uVar100 < uVar107 == bVar109) {
              bVar110 = bVar109;
            }
            uVar83 = (uVar63 >> 2) + (ulong)bVar110;
          }
          else {
            uVar78 = uVar63 / 0x28;
            uVar100 = uVar78 * 0x28 + 0x28;
            if (uVar78 * 0x28 < uVar107 != uVar100 <= uVar83) goto LAB_012407e2;
            uVar83 = (uVar78 + 1) - (ulong)(uVar83 < uVar100);
            iVar70 = iVar70 + 1;
          }
          iVar90 = (0x11 - (uint)(uVar83 < 10000000000000000)) - (uint)(uVar83 < 1000000000000000);
          uVar69 = iVar90 + iVar70;
          uVar63 = uVar83 / 100000000;
          uVar83 = uVar63 * 0xfa0a1f00 + uVar83;
          uVar82 = (uint)uVar63;
          iVar105 = (int)((uVar63 & 0xffffffff) / 10000);
          iVar88 = iVar105 * -10000 + uVar82;
          iVar60 = (int)(((uVar63 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
          uVar95 = (uint)(iVar60 * 0x29) >> 0xc;
          uVar92 = uVar95 * -100 + iVar60;
          uVar87 = iVar60 * -100 + iVar105;
          cVar94 = (char)uVar95 + '0';
          iVar60 = (int)uVar83;
          if (iVar90 + iVar70 + 5U < 0x1b) {
            if ((int)uVar69 < 1) {
              puVar89 = (undefined2 *)
                        ((long)puVar104 + (((ulong)(2 - uVar69) + 1) - (ulong)(uVar82 < 100000000)))
              ;
              *(char *)((long)puVar104 + (ulong)(2 - uVar69)) = cVar94;
              uVar63 = (ulong)(uVar92 < 10 && uVar82 < 100000000);
              *puVar89 = *(undefined2 *)(digit_table + uVar63 + uVar92 * 2);
              *(undefined2 *)((long)puVar89 + (2 - uVar63)) =
                   *(undefined2 *)(digit_table + uVar87 * 2);
              if (iVar60 == 0) {
                if (iVar88 == 0) {
                  uVar82 = 0;
                  if (uVar87 == 0) {
                    uVar82 = (uint)(byte)dec_trailing_zero_table[uVar92];
                  }
                  uVar82 = 4 - (uVar82 + (byte)dec_trailing_zero_table[uVar87]);
                }
                else {
                  uVar82 = (uint)(iVar88 * 0x147b) >> 0x13;
                  uVar87 = uVar82 * -100 + iVar88;
                  *(undefined2 *)((long)puVar89 + (4 - uVar63)) =
                       *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                  *(undefined2 *)((long)puVar89 + (6 - uVar63)) =
                       *(undefined2 *)(digit_table + uVar87 * 2);
                  uVar82 = (byte)dec_trailing_zero_table[uVar82] + 2;
                  if (uVar87 != 0) {
                    uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
                  }
                  uVar82 = 8 - uVar82;
                }
              }
              else {
                uVar95 = (uint)(iVar88 * 0x147b) >> 0x13;
                uVar82 = (uint)((uVar83 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar87 = uVar82 >> 8;
                uVar92 = uVar87 * 0x147b >> 0x13;
                uVar83 = (ulong)uVar92;
                uVar92 = uVar92 * -100 + (uVar82 >> 8);
                *(undefined2 *)((long)puVar89 + (4 - uVar63)) =
                     *(undefined2 *)(digit_table + (ulong)uVar95 * 2);
                *(undefined2 *)((long)puVar89 + (6 - uVar63)) =
                     *(undefined2 *)(digit_table + (uVar95 * 0x7fffff9c + iVar88) * 2);
                *(undefined2 *)((long)puVar89 + (8 - uVar63)) =
                     *(undefined2 *)(digit_table + uVar83 * 2);
                *(undefined2 *)((long)puVar89 + (10 - uVar63)) =
                     *(undefined2 *)(digit_table + uVar92 * 2);
                iVar60 = uVar87 * -10000 + iVar60;
                if (iVar60 == 0) {
                  iVar70 = 0xc;
                }
                else {
                  uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                  uVar83 = (ulong)uVar82;
                  uVar92 = uVar82 * -100 + iVar60;
                  *(undefined2 *)((long)puVar89 + (0xc - uVar63)) =
                       *(undefined2 *)(digit_table + uVar83 * 2);
                  *(undefined2 *)((long)puVar89 + (0xe - uVar63)) =
                       *(undefined2 *)(digit_table + uVar92 * 2);
                  iVar70 = 0x10;
                }
                uVar82 = (byte)dec_trailing_zero_table[uVar83] + 2;
                if (uVar92 != 0) {
                  uVar82 = (uint)(byte)dec_trailing_zero_table[uVar92];
                }
                uVar82 = iVar70 - uVar82;
              }
              local_40 = (uint *)((long)puVar89 + (uVar82 - uVar63));
              *(undefined2 *)puVar104 = 0x2e30;
              if ((int)uVar69 < 0) {
                switchD_00569a20::default((undefined2 *)((long)puVar104 + 2),0x30,(ulong)-uVar69);
              }
            }
            else {
              puVar89 = (undefined2 *)((long)puVar104 + (2 - (ulong)(uVar82 < 100000000)));
              *puVar104 = 0x3030303030303030;
              puVar104[1] = 0x3030303030303030;
              puVar104[2] = 0x3030303030303030;
              *(char *)((long)puVar104 + 1) = cVar94;
              uVar63 = (ulong)(uVar92 < 10 && uVar82 < 100000000);
              *puVar89 = *(undefined2 *)(digit_table + uVar63 + uVar92 * 2);
              *(undefined2 *)((long)puVar89 + (2 - uVar63)) =
                   *(undefined2 *)(digit_table + uVar87 * 2);
              if (iVar60 == 0) {
                if (iVar88 == 0) {
                  uVar82 = 0;
                  if (uVar87 == 0) {
                    uVar82 = (uint)(byte)dec_trailing_zero_table[uVar92];
                  }
                  uVar82 = uVar82 + (byte)dec_trailing_zero_table[uVar87];
                  iVar70 = 4;
                }
                else {
                  uVar82 = (uint)(iVar88 * 0x147b) >> 0x13;
                  uVar87 = uVar82 * -100 + iVar88;
                  *(undefined2 *)((long)puVar89 + (4 - uVar63)) =
                       *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
                  *(undefined2 *)((long)puVar89 + (6 - uVar63)) =
                       *(undefined2 *)(digit_table + uVar87 * 2);
                  uVar82 = (byte)dec_trailing_zero_table[uVar82] + 2;
                  if (uVar87 != 0) {
                    uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
                  }
                  iVar70 = 8;
                }
                uVar82 = iVar70 - uVar82;
              }
              else {
                uVar92 = (uint)(iVar88 * 0x147b) >> 0x13;
                uVar82 = (uint)((uVar83 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar95 = uVar82 >> 8;
                uVar87 = uVar95 * 0x147b >> 0x13;
                uVar83 = (ulong)uVar87;
                uVar87 = uVar87 * -100 + (uVar82 >> 8);
                *(undefined2 *)((long)puVar89 + (4 - uVar63)) =
                     *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                *(undefined2 *)((long)puVar89 + (6 - uVar63)) =
                     *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar88) * 2);
                *(undefined2 *)((long)puVar89 + (8 - uVar63)) =
                     *(undefined2 *)(digit_table + uVar83 * 2);
                *(undefined2 *)((long)puVar89 + (10 - uVar63)) =
                     *(undefined2 *)(digit_table + uVar87 * 2);
                iVar60 = uVar95 * -10000 + iVar60;
                if (iVar60 == 0) {
                  iVar70 = 0xc;
                }
                else {
                  uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
                  uVar83 = (ulong)uVar82;
                  uVar87 = uVar82 * -100 + iVar60;
                  *(undefined2 *)((long)puVar89 + (0xc - uVar63)) =
                       *(undefined2 *)(digit_table + uVar83 * 2);
                  *(undefined2 *)((long)puVar89 + (0xe - uVar63)) =
                       *(undefined2 *)(digit_table + uVar87 * 2);
                  iVar70 = 0x10;
                }
                uVar82 = (byte)dec_trailing_zero_table[uVar83] + 2;
                if (uVar87 != 0) {
                  uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
                }
                uVar82 = iVar70 - uVar82;
              }
              puVar74 = (uint *)((long)puVar89 + (uVar82 - uVar63));
              uVar83 = 0;
              do {
                *(byte *)((long)puVar102 + uVar83 + lVar97) =
                     *(byte *)((long)puVar102 + uVar83 + lVar97 + 1);
                uVar83 = uVar83 + 1;
              } while (uVar69 != uVar83);
              puVar99 = (undefined1 *)((long)puVar104 + (ulong)uVar69);
              local_40 = (uint *)(puVar99 + 2);
              *puVar99 = 0x2e;
              if (local_40 < puVar74) {
                local_40 = puVar74;
              }
            }
            goto LAB_0124059d;
          }
          lVar97 = 2 - (ulong)(uVar82 < 100000000);
          *(char *)((long)puVar104 + 1) = cVar94;
          uVar63 = (ulong)(uVar92 < 10 && uVar82 < 100000000);
          *(undefined2 *)((long)puVar104 + lVar97) =
               *(undefined2 *)(digit_table + uVar63 + uVar92 * 2);
          lVar97 = lVar97 - uVar63;
          *(undefined2 *)((long)puVar104 + lVar97 + 2) = *(undefined2 *)(digit_table + uVar87 * 2);
          if (iVar60 == 0) {
            if (iVar88 == 0) {
              uVar82 = 0;
              if (uVar87 == 0) {
                uVar82 = (uint)(byte)dec_trailing_zero_table[uVar92];
              }
              uVar82 = uVar82 + (byte)dec_trailing_zero_table[uVar87];
              iVar70 = 4;
            }
            else {
              uVar82 = (uint)(iVar88 * 0x147b) >> 0x13;
              uVar87 = uVar82 * -100 + iVar88;
              *(undefined2 *)((long)puVar104 + lVar97 + 4) =
                   *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
              *(undefined2 *)((long)puVar104 + lVar97 + 6) =
                   *(undefined2 *)(digit_table + uVar87 * 2);
              uVar82 = (byte)dec_trailing_zero_table[uVar82] + 2;
              if (uVar87 != 0) {
                uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
              }
              iVar70 = 8;
            }
            uVar82 = iVar70 - uVar82;
          }
          else {
            uVar95 = (uint)(iVar88 * 0x147b) >> 0x13;
            uVar82 = (uint)((uVar83 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar96 = uVar82 >> 8;
            uVar92 = uVar96 * 0x147b >> 0x13;
            uVar87 = uVar92 * -100 + (uVar82 >> 8);
            *(undefined2 *)((long)puVar104 + lVar97 + 4) =
                 *(undefined2 *)(digit_table + (ulong)uVar95 * 2);
            *(undefined2 *)((long)puVar104 + lVar97 + 6) =
                 *(undefined2 *)(digit_table + (uVar95 * 0x7fffff9c + iVar88) * 2);
            *(undefined2 *)((long)puVar104 + lVar97 + 8) =
                 *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
            *(undefined2 *)((long)puVar104 + lVar97 + 10) =
                 *(undefined2 *)(digit_table + uVar87 * 2);
            iVar60 = uVar96 * -10000 + iVar60;
            if (iVar60 == 0) {
              uVar82 = (byte)dec_trailing_zero_table[uVar92] + 2;
              if (uVar87 != 0) {
                uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
              }
              uVar82 = 0xc - uVar82;
            }
            else {
              uVar82 = (uint)(iVar60 * 0x147b) >> 0x13;
              uVar87 = uVar82 * -100 + iVar60;
              *(undefined2 *)((long)puVar104 + lVar97 + 0xc) =
                   *(undefined2 *)(digit_table + (ulong)uVar82 * 2);
              *(undefined2 *)((long)puVar104 + lVar97 + 0xe) =
                   *(undefined2 *)(digit_table + uVar87 * 2);
              uVar82 = (byte)dec_trailing_zero_table[uVar82] + 2;
              if (uVar87 != 0) {
                uVar82 = (uint)(byte)dec_trailing_zero_table[uVar87];
              }
              uVar82 = 0x10 - uVar82;
            }
          }
          puVar89 = (undefined2 *)
                    ((long)puVar104 +
                    (((ulong)uVar82 + lVar97) - (ulong)((ulong)uVar82 + lVar97 == 2)));
          uVar69 = uVar69 - 1;
          *(undefined1 *)puVar104 = *(undefined1 *)((long)puVar104 + 1);
          *(undefined1 *)((long)puVar104 + 1) = 0x2e;
          *puVar89 = 0x2d65;
          uVar87 = uVar69 >> 0x1f;
          pcVar59 = (char *)((long)puVar89 + (ulong)uVar87 + 1);
          uVar82 = -uVar69;
          if (0 < (int)uVar69) {
            uVar82 = uVar69;
          }
          if (99 < uVar82) {
            *pcVar59 = (char)(uVar82 * 0x290 >> 0x10) + '0';
            *(undefined2 *)((long)puVar89 + (ulong)uVar87 + 2) =
                 *(undefined2 *)(digit_table + ((uVar82 * 0x290 >> 0x10) * 0x7fffff9c + uVar82) * 2)
            ;
            local_40 = (uint *)((long)puVar89 + (ulong)uVar87 + 4);
            goto LAB_0124059d;
          }
          *(undefined2 *)pcVar59 =
               *(undefined2 *)(digit_table + (ulong)(uVar82 < 10) + (ulong)uVar82 * 2);
          pbVar80 = (byte *)(pcVar59 + -(ulong)(uVar82 < 10));
LAB_01242020:
          local_40 = (uint *)(pbVar80 + 2);
        }
LAB_0124059d:
        if (local_fc < '\0') {
          *(byte *)local_40 = 10;
          local_40 = (uint *)((long)local_40 + 1);
        }
        *(byte *)local_40 = 0;
        if (dat_len != (usize *)0x0) {
          *dat_len = (long)local_40 - (long)puVar102;
        }
        *(undefined8 *)pyVar67 = 0;
        pyVar67->msg = (char *)0x0;
        return (char *)puVar102;
      }
      break;
    case 5:
switchD_0123a220_caseD_5:
      uVar63 = uVar83 >> 8;
      puVar74 = (uint *)(val->uni).str;
      puVar102 = (uint *)(*p_Var4)(pvVar6,uVar63 * 6 + 4);
      if (puVar102 != (uint *)0x0) {
        if (puVar99 != enc_table_cpy) {
          puVar61 = (uint *)(uVar63 + (long)puVar74);
          *(byte *)puVar102 = 0x22;
          puVar79 = puVar102;
LAB_01242079:
          lVar97 = (long)puVar61 - (long)puVar74;
          if (0xf < lVar97) {
            lVar81 = 0;
            do {
              local_40 = (uint *)((long)puVar79 + lVar81 + 1);
              puVar57 = (uint *)(lVar81 + (long)puVar74);
              bVar77 = *(byte *)((long)puVar74 + lVar81);
              if (puVar99[bVar77] != '\0') goto LAB_012422b1;
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 1)] != '\0') {
                local_40 = (uint *)((long)puVar79 + lVar81 + 1);
                puVar57 = (uint *)((long)puVar74 + lVar81);
                goto LAB_01242260;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 2)] != '\0') {
                local_40 = (uint *)((long)puVar79 + lVar81 + 1);
                puVar57 = (uint *)((long)puVar74 + lVar81);
                goto LAB_01242275;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 3)] != '\0') {
                local_40 = (uint *)((long)puVar79 + lVar81 + 1);
                puVar57 = (uint *)((long)puVar74 + lVar81);
                goto LAB_01242292;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 4)] != '\0') {
                puVar57 = (uint *)((byte *)(lVar81 + (long)puVar74) + 4);
                local_40 = (uint *)((long)puVar79 + lVar81 + 5);
                *(undefined4 *)((long)puVar79 + lVar81 + 1) =
                     *(undefined4 *)(lVar81 + (long)puVar74);
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 5)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 5);
                local_40 = (uint *)((long)puVar79 + lVar81 + 6);
                *(byte *)((long)local_40 + -1) = pbVar80[4];
                *(undefined4 *)((long)local_40 + -5) = *(undefined4 *)pbVar80;
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 6)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 6);
                local_40 = (uint *)((long)puVar79 + lVar81 + 7);
                *(ushort *)((long)local_40 + -2) = *(ushort *)(pbVar80 + 4);
                *(undefined4 *)((long)local_40 + -6) = *(undefined4 *)pbVar80;
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 7)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 7);
                uVar3 = *(undefined4 *)pbVar80;
                local_40 = (uint *)((long)puVar79 + lVar81 + 8);
                *(undefined4 *)((long)puVar79 + lVar81 + 4) = *(undefined4 *)(pbVar80 + 3);
                *(undefined4 *)((long)puVar79 + lVar81 + 1) = uVar3;
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 8)] != '\0') {
                puVar57 = (uint *)((byte *)(lVar81 + (long)puVar74) + 8);
                local_40 = (uint *)((long)puVar79 + lVar81 + 9);
                *(undefined8 *)((long)puVar79 + lVar81 + 1) =
                     *(undefined8 *)(lVar81 + (long)puVar74);
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 9)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 9);
                local_40 = (uint *)((long)puVar79 + lVar81 + 10);
                *(byte *)((long)local_40 + -1) = pbVar80[8];
                *(undefined8 *)((long)local_40 + -9) = *(undefined8 *)pbVar80;
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 10)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 10);
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xb);
                *(ushort *)((long)local_40 + -2) = *(ushort *)(pbVar80 + 8);
                *(undefined8 *)((long)local_40 + -10) = *(undefined8 *)pbVar80;
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 0xb)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xb);
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xc);
                local_40[-1] = *(uint *)(pbVar80 + 7);
                *(undefined8 *)((long)local_40 + -0xb) = *(undefined8 *)pbVar80;
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 0xc)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xc);
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xd);
                local_40[-1] = *(uint *)(pbVar80 + 8);
                *(undefined8 *)(local_40 + -3) = *(undefined8 *)pbVar80;
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 0xd)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xd);
                uVar72 = *(undefined8 *)pbVar80;
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xe);
                *(undefined8 *)((long)puVar79 + lVar81 + 6) = *(undefined8 *)(pbVar80 + 5);
                *(undefined8 *)((long)puVar79 + lVar81 + 1) = uVar72;
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 0xe)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xe);
                uVar72 = *(undefined8 *)pbVar80;
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xf);
                *(undefined8 *)((long)puVar79 + lVar81 + 7) = *(undefined8 *)(pbVar80 + 6);
                *(undefined8 *)((long)puVar79 + lVar81 + 1) = uVar72;
                goto LAB_012422b1;
              }
              if (puVar99[*(byte *)((long)puVar74 + lVar81 + 0xf)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xf);
                uVar72 = *(undefined8 *)pbVar80;
                local_40 = (uint *)((long)puVar79 + lVar81 + 0x10);
                *(undefined8 *)((long)puVar79 + lVar81 + 8) = *(undefined8 *)(pbVar80 + 7);
                *(undefined8 *)((long)puVar79 + lVar81 + 1) = uVar72;
                goto LAB_012422b1;
              }
              uVar69 = puVar57[1];
              uVar82 = puVar57[2];
              uVar87 = puVar57[3];
              *local_40 = *puVar57;
              *(uint *)((long)puVar79 + lVar81 + 5) = uVar69;
              *(uint *)((long)puVar79 + lVar81 + 9) = uVar82;
              *(uint *)((long)puVar79 + lVar81 + 0xd) = uVar87;
              lVar81 = lVar81 + 0x10;
              lVar97 = lVar97 + -0x10;
            } while (0xf < lVar97);
            puVar79 = (uint *)((long)puVar79 + lVar81);
            puVar74 = (uint *)((long)puVar74 + lVar81);
          }
          local_40 = (uint *)((long)puVar79 + 1);
          puVar57 = puVar74;
          if (3 < lVar97) {
            lVar97 = (long)puVar61 - (long)puVar74;
            do {
              bVar77 = (byte)*puVar57;
              if (puVar99[bVar77] != '\0') goto LAB_012422b1;
              if (puVar99[*(byte *)((long)puVar57 + 1)] != '\0') goto LAB_01242260;
              if (puVar99[*(byte *)((long)puVar57 + 2)] != '\0') goto LAB_01242275;
              if (puVar99[*(byte *)((long)puVar57 + 3)] != '\0') goto LAB_01242292;
              *local_40 = *puVar57;
              local_40 = local_40 + 1;
              puVar57 = puVar57 + 1;
              lVar97 = lVar97 + -4;
            } while (3 < lVar97);
          }
          if (puVar57 < puVar61) {
            while (uVar69 = *puVar57, puVar99[(byte)uVar69] == '\0') {
              puVar57 = (uint *)((long)puVar57 + 1);
              *(byte *)local_40 = (byte)uVar69;
              local_40 = (uint *)((long)local_40 + 1);
              if (puVar61 <= puVar57) goto LAB_01242883;
            }
            goto LAB_012422b1;
          }
LAB_01242883:
          *(byte *)local_40 = 0x22;
          local_40 = (uint *)((long)local_40 + 1);
          goto LAB_0124059d;
        }
        uVar58 = val->tag;
        *(byte *)puVar102 = 0x22;
        if ((uVar58 & 0x18) == 0) {
          puVar61 = (uint *)(uVar63 + (long)puVar74);
          puVar79 = puVar102;
LAB_01240852:
          lVar97 = (long)puVar61 - (long)puVar74;
          if (0xf < lVar97) {
            lVar81 = 0;
            do {
              local_40 = (uint *)((long)puVar79 + lVar81 + 1);
              puVar57 = (uint *)(lVar81 + (long)puVar74);
              bVar77 = *(byte *)((long)puVar74 + lVar81);
              if (enc_table_cpy[bVar77] != '\0') goto LAB_01240a92;
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 1)] != '\0') {
                local_40 = (uint *)((long)puVar79 + lVar81 + 1);
                puVar57 = (uint *)((long)puVar74 + lVar81);
                goto LAB_01240a3c;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 2)] != '\0') {
                local_40 = (uint *)((long)puVar79 + lVar81 + 1);
                puVar57 = (uint *)((long)puVar74 + lVar81);
                goto LAB_01240a51;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 3)] != '\0') {
                local_40 = (uint *)((long)puVar79 + lVar81 + 1);
                puVar57 = (uint *)((long)puVar74 + lVar81);
                goto LAB_01240a6e;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 4)] != '\0') {
                puVar57 = (uint *)((byte *)(lVar81 + (long)puVar74) + 4);
                local_40 = (uint *)((long)puVar79 + lVar81 + 5);
                *(undefined4 *)((long)puVar79 + lVar81 + 1) =
                     *(undefined4 *)(lVar81 + (long)puVar74);
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 5)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 5);
                local_40 = (uint *)((long)puVar79 + lVar81 + 6);
                *(byte *)((long)local_40 + -1) = pbVar80[4];
                *(undefined4 *)((long)local_40 + -5) = *(undefined4 *)pbVar80;
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 6)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 6);
                local_40 = (uint *)((long)puVar79 + lVar81 + 7);
                *(ushort *)((long)local_40 + -2) = *(ushort *)(pbVar80 + 4);
                *(undefined4 *)((long)local_40 + -6) = *(undefined4 *)pbVar80;
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 7)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 7);
                uVar3 = *(undefined4 *)pbVar80;
                local_40 = (uint *)((long)puVar79 + lVar81 + 8);
                *(undefined4 *)((long)puVar79 + lVar81 + 4) = *(undefined4 *)(pbVar80 + 3);
                *(undefined4 *)((long)puVar79 + lVar81 + 1) = uVar3;
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 8)] != '\0') {
                puVar57 = (uint *)((byte *)(lVar81 + (long)puVar74) + 8);
                local_40 = (uint *)((long)puVar79 + lVar81 + 9);
                *(undefined8 *)((long)puVar79 + lVar81 + 1) =
                     *(undefined8 *)(lVar81 + (long)puVar74);
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 9)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 9);
                local_40 = (uint *)((long)puVar79 + lVar81 + 10);
                *(byte *)((long)local_40 + -1) = pbVar80[8];
                *(undefined8 *)((long)local_40 + -9) = *(undefined8 *)pbVar80;
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 10)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 10);
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xb);
                *(ushort *)((long)local_40 + -2) = *(ushort *)(pbVar80 + 8);
                *(undefined8 *)((long)local_40 + -10) = *(undefined8 *)pbVar80;
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 0xb)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xb);
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xc);
                local_40[-1] = *(uint *)(pbVar80 + 7);
                *(undefined8 *)((long)local_40 + -0xb) = *(undefined8 *)pbVar80;
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 0xc)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xc);
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xd);
                local_40[-1] = *(uint *)(pbVar80 + 8);
                *(undefined8 *)(local_40 + -3) = *(undefined8 *)pbVar80;
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 0xd)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xd);
                uVar72 = *(undefined8 *)pbVar80;
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xe);
                *(undefined8 *)((long)puVar79 + lVar81 + 6) = *(undefined8 *)(pbVar80 + 5);
                *(undefined8 *)((long)puVar79 + lVar81 + 1) = uVar72;
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 0xe)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xe);
                uVar72 = *(undefined8 *)pbVar80;
                local_40 = (uint *)((long)puVar79 + lVar81 + 0xf);
                *(undefined8 *)((long)puVar79 + lVar81 + 7) = *(undefined8 *)(pbVar80 + 6);
                *(undefined8 *)((long)puVar79 + lVar81 + 1) = uVar72;
                goto LAB_01240a92;
              }
              if (enc_table_cpy[*(byte *)((long)puVar74 + lVar81 + 0xf)] != '\0') {
                pbVar80 = (byte *)(lVar81 + (long)puVar74);
                puVar57 = (uint *)(pbVar80 + 0xf);
                uVar72 = *(undefined8 *)pbVar80;
                local_40 = (uint *)((long)puVar79 + lVar81 + 0x10);
                *(undefined8 *)((long)puVar79 + lVar81 + 8) = *(undefined8 *)(pbVar80 + 7);
                *(undefined8 *)((long)puVar79 + lVar81 + 1) = uVar72;
                goto LAB_01240a92;
              }
              uVar69 = puVar57[1];
              uVar82 = puVar57[2];
              uVar87 = puVar57[3];
              *local_40 = *puVar57;
              *(uint *)((long)puVar79 + lVar81 + 5) = uVar69;
              *(uint *)((long)puVar79 + lVar81 + 9) = uVar82;
              *(uint *)((long)puVar79 + lVar81 + 0xd) = uVar87;
              lVar81 = lVar81 + 0x10;
              lVar97 = lVar97 + -0x10;
            } while (0xf < lVar97);
            puVar79 = (uint *)((long)puVar79 + lVar81);
            puVar74 = (uint *)((long)puVar74 + lVar81);
          }
          local_40 = (uint *)((long)puVar79 + 1);
          puVar57 = puVar74;
          if (3 < lVar97) {
            lVar97 = (long)puVar61 - (long)puVar74;
            do {
              bVar77 = (byte)*puVar57;
              if (enc_table_cpy[bVar77] != '\0') goto LAB_01240a92;
              if (enc_table_cpy[*(byte *)((long)puVar57 + 1)] != '\0') goto LAB_01240a3c;
              if (enc_table_cpy[*(byte *)((long)puVar57 + 2)] != '\0') goto LAB_01240a51;
              if (enc_table_cpy[*(byte *)((long)puVar57 + 3)] != '\0') goto LAB_01240a6e;
              *local_40 = *puVar57;
              local_40 = local_40 + 1;
              puVar57 = puVar57 + 1;
              lVar97 = lVar97 + -4;
            } while (3 < lVar97);
          }
          if (puVar57 < puVar61) {
            while (uVar69 = *puVar57, enc_table_cpy[(byte)uVar69] == '\0') {
              puVar57 = (uint *)((long)puVar57 + 1);
              *(byte *)local_40 = (byte)uVar69;
              local_40 = (uint *)((long)local_40 + 1);
              if (puVar61 <= puVar57) goto LAB_01241024;
            }
            goto LAB_01240a92;
          }
LAB_01241024:
          *(byte *)local_40 = 0x22;
          local_40 = (uint *)((long)local_40 + 1);
          goto LAB_0124059d;
        }
        puVar79 = (uint *)((long)puVar102 + 1);
        if (0xfff < uVar83) {
          do {
            uVar72 = *(undefined8 *)(puVar74 + 2);
            *(undefined8 *)puVar79 = *(undefined8 *)puVar74;
            *(undefined8 *)(puVar79 + 2) = uVar72;
            puVar79 = puVar79 + 4;
            puVar74 = puVar74 + 4;
            uVar63 = uVar63 - 0x10;
          } while (0xf < uVar63);
        }
        for (; 3 < uVar63; uVar63 = uVar63 - 4) {
          *puVar79 = *puVar74;
          puVar79 = puVar79 + 1;
          puVar74 = puVar74 + 1;
        }
        if (uVar63 != 0) {
          uVar83 = 0;
          do {
            *(byte *)((long)puVar79 + uVar83) = *(byte *)((long)puVar74 + uVar83);
            uVar83 = uVar83 + 1;
          } while (uVar63 != uVar83);
          puVar79 = (uint *)((long)puVar79 + uVar83);
        }
        *(byte *)puVar79 = 0x22;
        local_40 = (uint *)((long)puVar79 + 1);
        goto LAB_0124059d;
      }
      break;
    case 6:
switchD_0123a220_caseD_6:
      puVar102 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar102 != (uint *)0x0) {
        *(ushort *)puVar102 = 0x5d5b;
LAB_0124058e:
        local_40 = (uint *)((long)puVar102 + 2);
        goto LAB_0124059d;
      }
      break;
    case 7:
switchD_0123a220_caseD_7:
      puVar102 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar102 != (uint *)0x0) {
        *(ushort *)puVar102 = 0x7d7b;
        goto LAB_0124058e;
      }
    }
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar66 = &local_60;
    if (err != (yyjson_write_err *)0x0) {
      pyVar66 = err;
    }
    pyVar67->code = 2;
    pcVar59 = "memory allocation failed";
  }
  else {
    puVar99 = enc_table_esc_slash;
    if ((flg & 4) == 0) {
      puVar99 = enc_table_esc;
    }
    switch(bVar77 & 7) {
    case 1:
      goto switchD_0123a220_caseD_1;
    case 2:
      goto switchD_0123a220_caseD_2;
    case 3:
      goto switchD_0123a220_caseD_3;
    case 4:
      goto switchD_0123a220_caseD_4;
    case 5:
      goto switchD_0123a220_caseD_5;
    case 6:
      goto switchD_0123a220_caseD_6;
    case 7:
      goto switchD_0123a220_caseD_7;
    }
switchD_0123a220_caseD_0:
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar66 = &local_60;
    if (err != (yyjson_write_err *)0x0) {
      pyVar66 = err;
    }
    pyVar67->code = 3;
    pcVar59 = "invalid JSON value type";
  }
LAB_01240601:
  pyVar66->msg = pcVar59;
  return (char *)0x0;
LAB_0123f6ef:
  *(byte *)puVar103 = bVar77;
  puVar103 = (uint *)((long)puVar103 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_0123f74d;
LAB_0123f704:
  *(ushort *)puVar103 = (ushort)*puVar57;
  puVar103 = (uint *)((long)puVar103 + 2);
  puVar57 = (uint *)((long)puVar57 + 2);
  goto LAB_0123f74d;
LAB_0123f71f:
  *(byte *)((long)puVar103 + 2) = *(byte *)((long)puVar57 + 2);
  *(ushort *)puVar103 = (ushort)*puVar57;
  puVar103 = (uint *)((long)puVar103 + 3);
  puVar57 = (uint *)((long)puVar57 + 3);
LAB_0123f74d:
  puVar102 = puVar57 + 1;
  if (puVar61 < puVar102) {
    if (puVar61 != puVar57) {
      bVar77 = (byte)*puVar57;
      uVar63 = (ulong)bVar77;
      bVar1 = puVar99[uVar63];
      if ((long)(ulong)(bVar1 >> 1) <= (long)puVar61 - (long)puVar57) goto LAB_0123f768;
switchD_0123f77d_caseD_1:
      if ((flg & 2) != 0) goto LAB_0123f899;
      goto LAB_0123fa4d;
    }
    goto switchD_0123dc70_default;
  }
  bVar77 = (byte)*puVar57;
  uVar63 = (ulong)bVar77;
  bVar1 = puVar99[uVar63];
LAB_0123f768:
  switch(bVar1) {
  case 0:
    goto switchD_0123f77d_caseD_0;
  case 1:
    goto switchD_0123f77d_caseD_1;
  case 2:
    *(ushort *)puVar103 = *(ushort *)(esc_single_char_table + uVar63 * 2);
    puVar103 = (uint *)((long)puVar103 + 2);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_0123f74d;
  case 3:
    *puVar103 = 0x3030755c;
    *(ushort *)(puVar103 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar57 * 2);
    puVar103 = (uint *)((long)puVar103 + 6);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_0123f74d;
  case 4:
    uVar2 = (ushort)*puVar57;
    bVar77 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar103 = uVar2;
      puVar103 = (uint *)((long)puVar103 + 2);
      puVar57 = (uint *)((long)puVar57 + 2);
      goto LAB_0123f74d;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar57;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_0123f899;
    *(ushort *)puVar103 = 0x755c;
    *(ushort *)((long)puVar103 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar103 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar103 = (uint *)((long)puVar103 + 6);
    puVar57 = (uint *)((long)puVar57 + 2);
    goto LAB_0123f74d;
  case 6:
    if (puVar61 < puVar102) {
      uVar2 = (ushort)*puVar57;
      bVar77 = (byte)uVar2;
      uVar69 = (uint)(uint3)*puVar57;
      if ((((uVar69 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
         ((uVar2 & 0x200f) != 0x200d)) goto LAB_0123f857;
    }
    else {
      uVar69 = *puVar57;
      bVar77 = (byte)uVar69;
      if ((((uVar69 & 0xc0c0f0) == 0x8080e0) && ((uVar69 & 0x200f) != 0)) &&
         ((uVar69 & 0x200f) != 0x200d)) {
LAB_0123f857:
        *puVar103 = uVar69;
        puVar103 = (uint *)((long)puVar103 + 3);
        puVar57 = (uint *)((long)puVar57 + 3);
        goto LAB_0123f74d;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar57;
    bVar77 = *(byte *)((long)puVar57 + 2);
    if ((((*puVar57 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar69 = *puVar57;
      *(ushort *)puVar103 = 0x755c;
      *(ushort *)((long)puVar103 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar69 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar103 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar77 & 0x3f) * 2);
      puVar103 = (uint *)((long)puVar103 + 6);
      puVar57 = (uint *)((long)puVar57 + 3);
    }
    else {
LAB_0123f899:
      if ((flg & 0x20) == 0) goto LAB_01240158;
      *(ushort *)puVar103 = 0x755c;
      ((ushort *)((long)puVar103 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar103 + 2))[1] = 0x4446;
      puVar103 = (uint *)((long)puVar103 + 6);
      puVar57 = (uint *)((long)puVar57 + 1);
    }
    goto LAB_0123f74d;
  case 8:
    uVar69 = *puVar57;
    bVar77 = (byte)uVar69;
    if ((((uVar69 & 0xc0c0c0f8) == 0x808080f0) && ((uVar69 & 0x3007) != 0)) &&
       ((bVar77 >> 2 & (uVar69 & 0x3003) != 0) == 0)) {
      *puVar103 = uVar69;
      puVar103 = puVar103 + 1;
      puVar57 = puVar102;
      goto LAB_0123f74d;
    }
    break;
  case 9:
    uVar69 = *puVar57;
    if ((((uVar69 & 0xc0c0c0f8) != 0x808080f0) || ((uVar69 & 0x3007) == 0)) ||
       (((byte)uVar69 >> 2 & (uVar69 & 0x3003) != 0) != 0)) goto LAB_0123f899;
    iVar70 = (uVar69 & 7) * 0x40000;
    iVar60 = (uVar69 & 0x3f00) * 0x10;
    *(ushort *)puVar103 = 0x755c;
    *(ushort *)((long)puVar103 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar70 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar103 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar69 >> 10 & 0xc00) + iVar70 + iVar60) - 0x10000 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar103 + 6) = 0x755c;
    *(ushort *)(puVar103 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar69 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar103 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar69 >> 10 & 0xc0 | uVar69 >> 0x18 & 0x3f) * 2);
    puVar103 = puVar103 + 3;
    puVar57 = puVar102;
    goto LAB_0123f74d;
  default:
    goto switchD_0123dc70_default;
  }
LAB_0123fa4d:
  if ((flg & 0x20) == 0) goto LAB_01240158;
  *(byte *)puVar103 = bVar77;
  puVar103 = (uint *)((long)puVar103 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_0123f74d;
switchD_0123f77d_caseD_0:
  puVar102 = (uint *)((long)puVar57 + 1);
  *(byte *)puVar103 = bVar77;
  puVar79 = puVar103;
  goto LAB_0123f513;
LAB_0123dbfa:
  *(byte *)puVar103 = bVar77;
  puVar103 = (uint *)((long)puVar103 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_0123dc45;
LAB_0123dc0f:
  *(ushort *)puVar103 = (ushort)*puVar57;
  puVar103 = (uint *)((long)puVar103 + 2);
  puVar57 = (uint *)((long)puVar57 + 2);
  goto LAB_0123dc45;
LAB_0123dc2a:
  *(byte *)((long)puVar103 + 2) = *(byte *)((long)puVar57 + 2);
  *(ushort *)puVar103 = (ushort)*puVar57;
  puVar103 = (uint *)((long)puVar103 + 3);
  puVar57 = (uint *)((long)puVar57 + 3);
LAB_0123dc45:
  puVar102 = puVar57 + 1;
  if (puVar61 < puVar102) {
    if (puVar61 != puVar57) {
      bVar77 = (byte)*puVar57;
      uVar63 = (ulong)bVar77;
      bVar1 = enc_table_cpy[uVar63];
      if ((long)(ulong)(bVar1 >> 1) <= (long)puVar61 - (long)puVar57) goto LAB_0123dc5b;
switchD_0123dc70_caseD_1:
      if ((flg & 2) != 0) goto LAB_0123dd85;
      goto LAB_0123df46;
    }
    goto switchD_0123dc70_default;
  }
  bVar77 = (byte)*puVar57;
  uVar63 = (ulong)bVar77;
  bVar1 = enc_table_cpy[uVar63];
LAB_0123dc5b:
  switch(bVar1) {
  case 0:
    goto switchD_0123dc70_caseD_0;
  case 1:
    goto switchD_0123dc70_caseD_1;
  case 2:
    *(ushort *)puVar103 = *(ushort *)(esc_single_char_table + uVar63 * 2);
    puVar103 = (uint *)((long)puVar103 + 2);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_0123dc45;
  case 3:
    *puVar103 = 0x3030755c;
    *(ushort *)(puVar103 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar57 * 2);
    goto LAB_0123dd9e;
  case 4:
    uVar2 = (ushort)*puVar57;
    bVar77 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar103 = uVar2;
      puVar103 = (uint *)((long)puVar103 + 2);
      puVar57 = (uint *)((long)puVar57 + 2);
      goto LAB_0123dc45;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar57;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_0123dd85;
    *(ushort *)puVar103 = 0x755c;
    *(ushort *)((long)puVar103 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar103 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar103 = (uint *)((long)puVar103 + 6);
    puVar57 = (uint *)((long)puVar57 + 2);
    goto LAB_0123dc45;
  case 6:
    if (puVar61 < puVar102) {
      uVar2 = (ushort)*puVar57;
      bVar77 = (byte)uVar2;
      uVar69 = (uint)(uint3)*puVar57;
      if (((uVar69 & 0xc0c0f0) == 0x8080e0) &&
         (uVar87 = uVar2 & 0x200f, uVar82 = (uint)uVar2, (uVar2 & 0x200f) != 0)) goto LAB_0123dd37;
    }
    else {
      uVar69 = *puVar57;
      if (((uVar69 & 0xc0c0f0) == 0x8080e0) &&
         (uVar87 = uVar69 & 0x200f, uVar82 = uVar69, uVar87 != 0)) {
LAB_0123dd37:
        bVar77 = (byte)uVar82;
        if (uVar87 != 0x200d) {
          *puVar103 = uVar69;
          puVar103 = (uint *)((long)puVar103 + 3);
          puVar57 = (uint *)((long)puVar57 + 3);
          goto LAB_0123dc45;
        }
      }
      else {
        bVar77 = (byte)uVar69;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar57;
    bVar77 = *(byte *)((long)puVar57 + 2);
    if ((((*puVar57 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar69 = *puVar57;
      *(ushort *)puVar103 = 0x755c;
      *(ushort *)((long)puVar103 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar69 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar103 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar77 & 0x3f) * 2);
      puVar103 = (uint *)((long)puVar103 + 6);
      puVar57 = (uint *)((long)puVar57 + 3);
    }
    else {
LAB_0123dd85:
      if ((flg & 0x20) == 0) goto LAB_01240158;
      *(ushort *)puVar103 = 0x755c;
      ((ushort *)((long)puVar103 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar103 + 2))[1] = 0x4446;
LAB_0123dd9e:
      puVar103 = (uint *)((long)puVar103 + 6);
      puVar57 = (uint *)((long)puVar57 + 1);
    }
    goto LAB_0123dc45;
  case 8:
    uVar69 = *puVar57;
    bVar77 = (byte)uVar69;
    if ((((uVar69 & 0xc0c0c0f8) == 0x808080f0) && ((uVar69 & 0x3007) != 0)) &&
       ((bVar77 >> 2 & (uVar69 & 0x3003) != 0) == 0)) {
      *puVar103 = uVar69;
      puVar103 = puVar103 + 1;
      puVar57 = puVar102;
      goto LAB_0123dc45;
    }
    break;
  case 9:
    uVar69 = *puVar57;
    if ((((uVar69 & 0xc0c0c0f8) != 0x808080f0) || ((uVar69 & 0x3007) == 0)) ||
       (((byte)uVar69 >> 2 & (uVar69 & 0x3003) != 0) != 0)) goto LAB_0123dd85;
    iVar70 = (uVar69 & 7) * 0x40000;
    iVar60 = (uVar69 & 0x3f00) * 0x10;
    *(ushort *)puVar103 = 0x755c;
    *(ushort *)((long)puVar103 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar70 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar103 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar69 >> 10 & 0xc00) + iVar70 + iVar60) - 0x10000 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar103 + 6) = 0x755c;
    *(ushort *)(puVar103 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar69 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)puVar103 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar69 >> 10 & 0xc0 | uVar69 >> 0x18 & 0x3f) * 2);
    puVar103 = puVar103 + 3;
    puVar57 = puVar102;
    goto LAB_0123dc45;
  default:
    goto switchD_0123dc70_default;
  }
LAB_0123df46:
  if ((flg & 0x20) == 0) goto LAB_01240158;
  *(byte *)puVar103 = bVar77;
  puVar103 = (uint *)((long)puVar103 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_0123dc45;
switchD_0123dc70_caseD_0:
  puVar102 = (uint *)((long)puVar57 + 1);
  *(byte *)puVar103 = bVar77;
  puVar79 = puVar103;
  goto LAB_0123da2d;
LAB_0123c7cd:
  *(byte *)puVar57 = bVar77;
  puVar57 = (uint *)((long)puVar57 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123c841;
LAB_0123c7e7:
  *(ushort *)puVar57 = (ushort)*puVar61;
  puVar57 = (uint *)((long)puVar57 + 2);
  puVar61 = (uint *)((long)puVar61 + 2);
  goto LAB_0123c841;
LAB_0123c807:
  *(byte *)((long)puVar57 + 2) = *(byte *)((long)puVar61 + 2);
  *(ushort *)puVar57 = (ushort)*puVar61;
  puVar57 = (uint *)((long)puVar57 + 3);
  puVar61 = (uint *)((long)puVar61 + 3);
LAB_0123c841:
  puVar102 = puVar61 + 1;
  if (puVar79 < puVar102) {
    if (puVar79 != puVar61) {
      uVar87 = (uint)(byte)*puVar61;
      uVar83 = (ulong)(byte)*puVar61;
      bVar77 = *(byte *)((long)local_d0 + uVar83);
      if ((long)(ulong)(bVar77 >> 1) <= (long)puVar79 - (long)puVar61) goto LAB_0123c859;
switchD_0123c86e_caseD_1:
      if ((flg & 2) != 0) goto LAB_0123c985;
      goto LAB_0123cb4c;
    }
    goto switchD_0123ab17_default;
  }
  uVar87 = (uint)(byte)*puVar61;
  uVar83 = (ulong)(byte)*puVar61;
  bVar77 = *(byte *)((long)local_d0 + uVar83);
LAB_0123c859:
  switch(bVar77) {
  case 0:
    goto switchD_0123c86e_caseD_0;
  case 1:
    goto switchD_0123c86e_caseD_1;
  case 2:
    *(ushort *)puVar57 = *(ushort *)(esc_single_char_table + uVar83 * 2);
    puVar57 = (uint *)((long)puVar57 + 2);
    puVar61 = (uint *)((long)puVar61 + 1);
    goto LAB_0123c841;
  case 3:
    *puVar57 = 0x3030755c;
    *(ushort *)(puVar57 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar61 * 2);
    puVar57 = (uint *)((long)puVar57 + 6);
    puVar61 = (uint *)((long)puVar61 + 1);
    goto LAB_0123c841;
  case 4:
    uVar2 = (ushort)*puVar61;
    uVar87 = (uint)uVar2;
    if (((uVar87 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar57 = uVar2;
      puVar57 = (uint *)((long)puVar57 + 2);
      puVar61 = (uint *)((long)puVar61 + 2);
      goto LAB_0123c841;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar61;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_0123c985;
    *(ushort *)puVar57 = 0x755c;
    *(ushort *)((long)puVar57 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar57 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar57 = (uint *)((long)puVar57 + 6);
    puVar61 = (uint *)((long)puVar61 + 2);
    goto LAB_0123c841;
  case 6:
    if (puVar79 < puVar102) {
      uVar2 = (ushort)*puVar61;
      uVar87 = (uint)uVar2;
      uVar92 = (uint)(uint3)*puVar61;
      if ((((uVar92 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
         ((uVar2 & 0x200f) != 0x200d)) goto LAB_0123c944;
    }
    else {
      uVar92 = *puVar61;
      uVar87 = uVar92;
      if ((((uVar92 & 0xc0c0f0) == 0x8080e0) && ((uVar92 & 0x200f) != 0)) &&
         ((uVar92 & 0x200f) != 0x200d)) {
LAB_0123c944:
        *puVar57 = uVar92;
        puVar57 = (uint *)((long)puVar57 + 3);
        puVar61 = (uint *)((long)puVar61 + 3);
        goto LAB_0123c841;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar61;
    bVar77 = *(byte *)((long)puVar61 + 2);
    if ((((*puVar61 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar87 = *puVar61;
      *(ushort *)puVar57 = 0x755c;
      *(ushort *)((long)puVar57 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar87 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar57 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar77 & 0x3f) * 2);
      puVar57 = (uint *)((long)puVar57 + 6);
      puVar61 = (uint *)((long)puVar61 + 3);
    }
    else {
LAB_0123c985:
      if ((flg & 0x20) == 0) goto LAB_01240158;
      *(ushort *)puVar57 = 0x755c;
      ((ushort *)((long)puVar57 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar57 + 2))[1] = 0x4446;
      puVar57 = (uint *)((long)puVar57 + 6);
      puVar61 = (uint *)((long)puVar61 + 1);
    }
    goto LAB_0123c841;
  case 8:
    uVar87 = *puVar61;
    if ((((uVar87 & 0xc0c0c0f8) == 0x808080f0) && ((uVar87 & 0x3007) != 0)) &&
       (((byte)uVar87 >> 2 & (uVar87 & 0x3003) != 0) == 0)) {
      *puVar57 = uVar87;
      puVar57 = puVar57 + 1;
      puVar61 = puVar102;
      goto LAB_0123c841;
    }
    break;
  case 9:
    uVar87 = *puVar61;
    if ((((uVar87 & 0xc0c0c0f8) != 0x808080f0) || ((uVar87 & 0x3007) == 0)) ||
       (((byte)uVar87 >> 2 & (uVar87 & 0x3003) != 0) != 0)) goto LAB_0123c985;
    iVar70 = (uVar87 & 7) * 0x40000;
    iVar60 = (uVar87 & 0x3f00) * 0x10;
    *(ushort *)puVar57 = 0x755c;
    *(ushort *)((long)puVar57 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar70 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar57 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar87 >> 10 & 0xc00) + iVar70 + iVar60) - 0x10000 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar57 + 6) = 0x755c;
    *(ushort *)(puVar57 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(uVar87 >> 0x11 & 6) + 0x1b8)
    ;
    *(ushort *)((long)puVar57 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar87 >> 10 & 0xc0 | uVar87 >> 0x18 & 0x3f) * 2);
    puVar57 = puVar57 + 3;
    puVar61 = puVar102;
    goto LAB_0123c841;
  default:
    goto switchD_0123ab17_default;
  }
LAB_0123cb4c:
  if ((flg & 0x20) == 0) goto LAB_01240158;
  *(byte *)puVar57 = (byte)uVar87;
  puVar57 = (uint *)((long)puVar57 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123c841;
switchD_0123c86e_caseD_0:
  puVar74 = (uint *)((long)puVar61 + 1);
  *(byte *)puVar57 = (byte)uVar87;
  puVar102 = puVar57;
  goto LAB_0123c587;
LAB_0123aa8d:
  *(byte *)puVar57 = bVar77;
  puVar57 = (uint *)((long)puVar57 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123aaea;
LAB_0123aaa2:
  *(ushort *)puVar57 = (ushort)*puVar61;
  puVar57 = (uint *)((long)puVar57 + 2);
  puVar61 = (uint *)((long)puVar61 + 2);
  goto LAB_0123aaea;
LAB_0123aabd:
  *(byte *)((long)puVar57 + 2) = *(byte *)((long)puVar61 + 2);
  *(ushort *)puVar57 = (ushort)*puVar61;
  puVar57 = (uint *)((long)puVar57 + 3);
  puVar61 = (uint *)((long)puVar61 + 3);
LAB_0123aaea:
  puVar102 = puVar61 + 1;
  if (puVar79 < puVar102) {
    if (puVar79 != puVar61) {
      uVar87 = (uint)(byte)*puVar61;
      uVar83 = (ulong)(byte)*puVar61;
      bVar77 = enc_table_cpy[uVar83];
      if ((long)(ulong)(bVar77 >> 1) <= (long)puVar79 - (long)puVar61) goto LAB_0123ab02;
switchD_0123ab17_caseD_1:
      if ((flg & 2) != 0) goto LAB_0123ac27;
      goto LAB_0123adef;
    }
    goto switchD_0123ab17_default;
  }
  uVar87 = (uint)(byte)*puVar61;
  uVar83 = (ulong)(byte)*puVar61;
  bVar77 = enc_table_cpy[uVar83];
LAB_0123ab02:
  switch(bVar77) {
  case 0:
    goto switchD_0123ab17_caseD_0;
  case 1:
    goto switchD_0123ab17_caseD_1;
  case 2:
    *(ushort *)puVar57 = *(ushort *)(esc_single_char_table + uVar83 * 2);
    puVar57 = (uint *)((long)puVar57 + 2);
    puVar61 = (uint *)((long)puVar61 + 1);
    goto LAB_0123aaea;
  case 3:
    *puVar57 = 0x3030755c;
    *(ushort *)(puVar57 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar61 * 2);
    goto LAB_0123ac3d;
  case 4:
    uVar2 = (ushort)*puVar61;
    uVar87 = (uint)uVar2;
    if (((uVar87 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)puVar57 = uVar2;
      puVar57 = (uint *)((long)puVar57 + 2);
      puVar61 = (uint *)((long)puVar61 + 2);
      goto LAB_0123aaea;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar61;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_0123ac27;
    *(ushort *)puVar57 = 0x755c;
    *(ushort *)((long)puVar57 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(puVar57 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    puVar57 = (uint *)((long)puVar57 + 6);
    puVar61 = (uint *)((long)puVar61 + 2);
    goto LAB_0123aaea;
  case 6:
    if (puVar79 < puVar102) {
      uVar2 = (ushort)*puVar61;
      uVar87 = (uint)uVar2;
      uVar92 = (uint)(uint3)*puVar61;
      if (((uVar92 & 0xc0c0f0) == 0x8080e0) && (uVar95 = uVar2 & 0x200f, (uVar2 & 0x200f) != 0))
      goto LAB_0123abda;
    }
    else {
      uVar92 = *puVar61;
      uVar87 = uVar92;
      if (((uVar92 & 0xc0c0f0) == 0x8080e0) && (uVar95 = uVar92 & 0x200f, uVar95 != 0)) {
LAB_0123abda:
        if (uVar95 != 0x200d) {
          *puVar57 = uVar92;
          puVar57 = (uint *)((long)puVar57 + 3);
          puVar61 = (uint *)((long)puVar61 + 3);
          goto LAB_0123aaea;
        }
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar61;
    bVar77 = *(byte *)((long)puVar61 + 2);
    if ((((*puVar61 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar87 = *puVar61;
      *(ushort *)puVar57 = 0x755c;
      *(ushort *)((long)puVar57 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar87 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(puVar57 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar77 & 0x3f) * 2);
      puVar57 = (uint *)((long)puVar57 + 6);
      puVar61 = (uint *)((long)puVar61 + 3);
    }
    else {
LAB_0123ac27:
      if ((flg & 0x20) == 0) goto LAB_01240158;
      *(ushort *)puVar57 = 0x755c;
      ((ushort *)((long)puVar57 + 2))[0] = 0x4646;
      ((ushort *)((long)puVar57 + 2))[1] = 0x4446;
LAB_0123ac3d:
      puVar57 = (uint *)((long)puVar57 + 6);
      puVar61 = (uint *)((long)puVar61 + 1);
    }
    goto LAB_0123aaea;
  case 8:
    uVar87 = *puVar61;
    if ((((uVar87 & 0xc0c0c0f8) == 0x808080f0) && ((uVar87 & 0x3007) != 0)) &&
       (((byte)uVar87 >> 2 & (uVar87 & 0x3003) != 0) == 0)) {
      *puVar57 = uVar87;
      puVar57 = puVar57 + 1;
      puVar61 = puVar102;
      goto LAB_0123aaea;
    }
    break;
  case 9:
    uVar87 = *puVar61;
    if ((((uVar87 & 0xc0c0c0f8) != 0x808080f0) || ((uVar87 & 0x3007) == 0)) ||
       (((byte)uVar87 >> 2 & (uVar87 & 0x3003) != 0) != 0)) goto LAB_0123ac27;
    iVar70 = (uVar87 & 7) * 0x40000;
    iVar60 = (uVar87 & 0x3f00) * 0x10;
    *(ushort *)puVar57 = 0x755c;
    *(ushort *)((long)puVar57 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar70 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(puVar57 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar87 >> 10 & 0xc00) + iVar70 + iVar60) - 0x10000 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)puVar57 + 6) = 0x755c;
    *(ushort *)(puVar57 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(uVar87 >> 0x11 & 6) + 0x1b8)
    ;
    *(ushort *)((long)puVar57 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar87 >> 10 & 0xc0 | uVar87 >> 0x18 & 0x3f) * 2);
    puVar57 = puVar57 + 3;
    puVar61 = puVar102;
    goto LAB_0123aaea;
  default:
    goto switchD_0123ab17_default;
  }
LAB_0123adef:
  if ((flg & 0x20) == 0) goto LAB_01240158;
  *(byte *)puVar57 = (byte)uVar87;
  puVar57 = (uint *)((long)puVar57 + 1);
  puVar61 = (uint *)((long)puVar61 + 1);
  goto LAB_0123aaea;
switchD_0123ab17_caseD_0:
  puVar74 = (uint *)((long)puVar61 + 1);
  *(byte *)puVar57 = (byte)uVar87;
  puVar102 = puVar57;
  goto LAB_0123a888;
LAB_0124024c:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar66 = &local_60;
  if (err != (yyjson_write_err *)0x0) {
    pyVar66 = err;
  }
  pyVar67->code = 3;
  pcVar59 = "invalid JSON value type";
  goto LAB_0124018f;
  while( true ) {
    pyVar65 = local_68->next;
    puVar101 = puVar106 + 2;
    uVar63 = *puVar106;
    local_68 = (yyjson_mut_val *)puVar106[1];
    local_78 = uVar63 & 0xffffffffffffff01;
    puVar102 = (uint *)(pbVar80 + 3);
    pbVar80[1] = 0x2c;
    pbVar80[2] = 10;
    lVar97 = (uVar63 >> 1) - 1;
    sVar62 = uVar83;
    lVar86 = lVar84;
    if (lVar97 != 0) break;
LAB_0123d336:
    pbVar80 = (byte *)((long)puVar102 + -1);
    *(byte *)((long)puVar102 + -2) = 10;
    puVar106 = puVar101;
    uVar83 = sVar62;
    if (puVar101 <= (ulong *)((long)puVar102 + lVar86 * 4 + -1)) {
      uVar83 = sVar62 >> 1;
      if (sVar62 >> 1 <= (ulong)(lVar86 * 4)) {
        uVar83 = lVar86 * 4;
      }
      uVar83 = (uVar83 + 0xf & 0xfffffffffffffff0) + sVar62;
      pbVar108 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar62,uVar83);
      if (pbVar108 == (byte *)0x0) goto LAB_012401b4;
      puVar106 = (ulong *)(pbVar108 + (uVar83 - ((long)local_90 - (long)puVar101)));
      memmove(puVar106,pbVar108 + ((long)puVar101 - (long)local_f8),(long)local_90 - (long)puVar101)
      ;
      pbVar80 = pbVar108 + ((long)pbVar80 - (long)local_f8);
      local_90 = (ulong *)(pbVar108 + uVar83);
      local_f8 = pbVar108;
    }
    lVar84 = lVar86 + -1;
    if (lVar84 != 0) {
      lVar97 = 1;
      do {
        pbVar80[0] = 0x20;
        pbVar80[1] = 0x20;
        pbVar80[2] = 0x20;
        pbVar80[3] = 0x20;
        pbVar80 = pbVar80 + lVar81;
        lVar97 = lVar97 + 1;
      } while (lVar86 != lVar97);
    }
    *pbVar80 = (char)local_78 * ' ' + 0x5d;
    if (local_90 <= puVar106) {
      pbVar108 = pbVar80 + 1;
      if (local_fc < '\0') {
        if (puVar106 <= pbVar80 + 3) {
          uVar63 = 2;
          if (2 < uVar83 >> 1) {
            uVar63 = uVar83 >> 1;
          }
          sVar76 = (uVar63 + 0xf & 0xfffffffffffffff0) + uVar83;
          pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,uVar83,sVar76);
          if (pbVar80 == (byte *)0x0) goto LAB_012401b4;
          memmove(pbVar80 + (sVar76 - ((long)local_90 - (long)puVar106)),
                  pbVar80 + ((long)puVar106 - (long)local_f8),(long)local_90 - (long)puVar106);
          pbVar108 = pbVar80 + ((long)pbVar108 - (long)local_f8);
          local_f8 = pbVar80;
        }
        *pbVar108 = 10;
        pbVar108 = pbVar108 + 1;
      }
      *pbVar108 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar108 - (long)local_f8;
      }
LAB_01242978:
      pyVar67->code = 0;
      pyVar67 = &local_60;
      if (err != (yyjson_write_err *)0x0) {
        pyVar67 = err;
      }
      pyVar67->msg = "success";
      return (char *)local_f8;
    }
  }
  goto LAB_0123a34d;
LAB_01242260:
  *(byte *)local_40 = bVar77;
  local_40 = (uint *)((long)local_40 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_012422b1;
LAB_01242275:
  *(ushort *)local_40 = (ushort)*puVar57;
  local_40 = (uint *)((long)local_40 + 2);
  puVar57 = (uint *)((long)puVar57 + 2);
  goto LAB_012422b1;
LAB_01242292:
  *(byte *)((long)local_40 + 2) = *(byte *)((long)puVar57 + 2);
  *(ushort *)local_40 = (ushort)*puVar57;
  local_40 = (uint *)((long)local_40 + 3);
  puVar57 = (uint *)((long)puVar57 + 3);
LAB_012422b1:
  puVar74 = puVar57 + 1;
  if (puVar61 < puVar74) {
    if (puVar61 == puVar57) goto switchD_012422dc_default;
    uVar69 = (uint)(byte)*puVar57;
    uVar83 = (ulong)(byte)*puVar57;
    bVar77 = puVar99[uVar83];
    if ((long)(ulong)(bVar77 >> 1) <= (long)puVar61 - (long)puVar57) goto LAB_012422c9;
switchD_012422dc_caseD_1:
    if ((flg & 2) != 0) goto LAB_01242402;
    goto LAB_012425bd;
  }
  uVar69 = (uint)(byte)*puVar57;
  uVar83 = (ulong)(byte)*puVar57;
  bVar77 = puVar99[uVar83];
LAB_012422c9:
  switch(bVar77) {
  case 0:
    goto switchD_012422dc_caseD_0;
  case 1:
    goto switchD_012422dc_caseD_1;
  case 2:
    *(ushort *)local_40 = *(ushort *)(esc_single_char_table + uVar83 * 2);
    local_40 = (uint *)((long)local_40 + 2);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_012422b1;
  case 3:
    *local_40 = 0x3030755c;
    *(ushort *)(local_40 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar57 * 2);
    goto LAB_0124241e;
  case 4:
    uVar2 = (ushort)*puVar57;
    uVar69 = (uint)uVar2;
    if (((uVar69 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)local_40 = uVar2;
      local_40 = (uint *)((long)local_40 + 2);
      puVar57 = (uint *)((long)puVar57 + 2);
      goto LAB_012422b1;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar57;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_01242402;
    *(ushort *)local_40 = 0x755c;
    *(ushort *)((long)local_40 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(local_40 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    local_40 = (uint *)((long)local_40 + 6);
    puVar57 = (uint *)((long)puVar57 + 2);
    goto LAB_012422b1;
  case 6:
    if (puVar61 < puVar74) {
      uVar2 = (ushort)*puVar57;
      uVar69 = (uint)uVar2;
      uVar82 = (uint)(uint3)*puVar57;
      if (((uVar82 & 0xc0c0f0) == 0x8080e0) && (uVar87 = uVar2 & 0x200f, (uVar2 & 0x200f) != 0))
      goto LAB_012423a9;
    }
    else {
      uVar82 = *puVar57;
      uVar69 = uVar82;
      if (((uVar82 & 0xc0c0f0) == 0x8080e0) && (uVar87 = uVar82 & 0x200f, uVar87 != 0)) {
LAB_012423a9:
        if (uVar87 != 0x200d) {
          *local_40 = uVar82;
          local_40 = (uint *)((long)local_40 + 3);
          puVar57 = (uint *)((long)puVar57 + 3);
          goto LAB_012422b1;
        }
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar57;
    bVar77 = *(byte *)((long)puVar57 + 2);
    if ((((*puVar57 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar69 = *puVar57;
      *(ushort *)local_40 = 0x755c;
      *(ushort *)((long)local_40 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar69 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(local_40 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar77 & 0x3f) * 2);
      local_40 = (uint *)((long)local_40 + 6);
      puVar57 = (uint *)((long)puVar57 + 3);
    }
    else {
LAB_01242402:
      if ((flg & 0x20) == 0) goto LAB_0124283e;
      *(ushort *)local_40 = 0x755c;
      ((ushort *)((long)local_40 + 2))[0] = 0x4646;
      ((ushort *)((long)local_40 + 2))[1] = 0x4446;
LAB_0124241e:
      local_40 = (uint *)((long)local_40 + 6);
      puVar57 = (uint *)((long)puVar57 + 1);
    }
    goto LAB_012422b1;
  case 8:
    uVar69 = *puVar57;
    if ((((uVar69 & 0xc0c0c0f8) == 0x808080f0) && ((uVar69 & 0x3007) != 0)) &&
       (((byte)uVar69 >> 2 & (uVar69 & 0x3003) != 0) == 0)) {
      *local_40 = uVar69;
      local_40 = local_40 + 1;
      puVar57 = puVar74;
      goto LAB_012422b1;
    }
    break;
  case 9:
    uVar69 = *puVar57;
    if ((((uVar69 & 0xc0c0c0f8) != 0x808080f0) || ((uVar69 & 0x3007) == 0)) ||
       (((byte)uVar69 >> 2 & (uVar69 & 0x3003) != 0) != 0)) goto LAB_01242402;
    iVar70 = (uVar69 & 7) * 0x40000;
    iVar60 = (uVar69 & 0x3f00) * 0x10;
    *(ushort *)local_40 = 0x755c;
    *(ushort *)((long)local_40 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar70 + iVar60) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(local_40 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar69 >> 10 & 0xc00) - 0x10000) + iVar70 + iVar60 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)local_40 + 6) = 0x755c;
    *(ushort *)(local_40 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar69 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)local_40 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar69 >> 10 & 0xc0 | uVar69 >> 0x18 & 0x3f) * 2);
    local_40 = local_40 + 3;
    puVar57 = puVar74;
    goto LAB_012422b1;
  default:
switchD_012422dc_default:
    *(byte *)local_40 = 0x22;
    local_40 = (uint *)((long)local_40 + 1);
    goto LAB_0124059d;
  }
LAB_012425bd:
  if ((flg & 0x20) == 0) goto LAB_0124283e;
  *(byte *)local_40 = (byte)uVar69;
  local_40 = (uint *)((long)local_40 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_012422b1;
switchD_012422dc_caseD_0:
  puVar74 = (uint *)((long)puVar57 + 1);
  *(byte *)local_40 = (byte)uVar69;
  puVar79 = local_40;
  goto LAB_01242079;
LAB_01240a3c:
  *(byte *)local_40 = bVar77;
  local_40 = (uint *)((long)local_40 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_01240a92;
LAB_01240a51:
  *(ushort *)local_40 = (ushort)*puVar57;
  local_40 = (uint *)((long)local_40 + 2);
  puVar57 = (uint *)((long)puVar57 + 2);
  goto LAB_01240a92;
LAB_01240a6e:
  *(byte *)((long)local_40 + 2) = *(byte *)((long)puVar57 + 2);
  *(ushort *)local_40 = (ushort)*puVar57;
  local_40 = (uint *)((long)local_40 + 3);
  puVar57 = (uint *)((long)puVar57 + 3);
LAB_01240a92:
  puVar74 = puVar57 + 1;
  if (puVar61 < puVar74) {
    if (puVar61 == puVar57) goto switchD_01240abf_default;
    uVar83 = (ulong)(byte)*puVar57;
    bVar77 = enc_table_cpy[uVar83];
    if ((long)(ulong)(bVar77 >> 1) <= (long)puVar61 - (long)puVar57) goto LAB_01240aaa;
switchD_01240abf_caseD_1:
    bVar77 = (byte)uVar83;
    if ((flg & 2) != 0) goto LAB_01240be0;
    goto LAB_01240d9b;
  }
  uVar83 = (ulong)(byte)*puVar57;
  bVar77 = enc_table_cpy[uVar83];
LAB_01240aaa:
  switch(bVar77) {
  case 0:
    goto switchD_01240abf_caseD_0;
  case 1:
    goto switchD_01240abf_caseD_1;
  case 2:
    *(ushort *)local_40 = *(ushort *)(esc_single_char_table + uVar83 * 2);
    local_40 = (uint *)((long)local_40 + 2);
    puVar57 = (uint *)((long)puVar57 + 1);
    goto LAB_01240a92;
  case 3:
    *local_40 = 0x3030755c;
    *(ushort *)(local_40 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar57 * 2);
    goto LAB_01240bf9;
  case 4:
    uVar2 = (ushort)*puVar57;
    bVar77 = (byte)uVar2;
    if (((uVar2 & 0xc0e0) == 0x80c0) && ((uVar2 & 0x1e) != 0)) {
      *(ushort *)local_40 = uVar2;
      local_40 = (uint *)((long)local_40 + 2);
      puVar57 = (uint *)((long)puVar57 + 2);
      goto LAB_01240a92;
    }
    break;
  case 5:
    uVar2 = (ushort)*puVar57;
    if (((uVar2 & 0xc0e0) != 0x80c0) || ((uVar2 & 0x1e) == 0)) goto LAB_01240be0;
    *(ushort *)local_40 = 0x755c;
    *(ushort *)((long)local_40 + 2) =
         *(ushort *)(esc_hex_char_table + ((byte)((byte)uVar2 >> 1) & 0xe));
    *(ushort *)(local_40 + 1) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(byte)((byte)(uVar2 >> 8) & 0x3f | (byte)uVar2 << 6) * 2);
    local_40 = (uint *)((long)local_40 + 6);
    puVar57 = (uint *)((long)puVar57 + 2);
    goto LAB_01240a92;
  case 6:
    if (puVar61 < puVar74) {
      uVar2 = (ushort)*puVar57;
      bVar77 = (byte)uVar2;
      uVar69 = (uint)(uint3)*puVar57;
      if ((((uVar69 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
         ((uVar2 & 0x200f) != 0x200d)) goto LAB_01240b99;
    }
    else {
      uVar69 = *puVar57;
      bVar77 = (byte)uVar69;
      if ((((uVar69 & 0xc0c0f0) == 0x8080e0) && ((uVar69 & 0x200f) != 0)) &&
         ((uVar69 & 0x200f) != 0x200d)) {
LAB_01240b99:
        *local_40 = uVar69;
        local_40 = (uint *)((long)local_40 + 3);
        puVar57 = (uint *)((long)puVar57 + 3);
        goto LAB_01240a92;
      }
    }
    break;
  case 7:
    uVar2 = (ushort)*puVar57;
    bVar77 = *(byte *)((long)puVar57 + 2);
    if ((((*puVar57 & 0xc0c0f0) == 0x8080e0) && ((uVar2 & 0x200f) != 0)) &&
       ((uVar2 & 0x200f) != 0x200d)) {
      uVar69 = *puVar57;
      *(ushort *)local_40 = 0x755c;
      *(ushort *)((long)local_40 + 2) =
           *(ushort *)
            (esc_hex_char_table +
            (ulong)((uVar2 >> 2 & 0xfc0 | (uint)(byte)uVar69 << 0xc) >> 8 & 0xff) * 2);
      *(ushort *)(local_40 + 1) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar2 >> 2 & 0xc0 | bVar77 & 0x3f) * 2);
      local_40 = (uint *)((long)local_40 + 6);
      puVar57 = (uint *)((long)puVar57 + 3);
    }
    else {
LAB_01240be0:
      if ((flg & 0x20) == 0) goto LAB_0124283e;
      *(ushort *)local_40 = 0x755c;
      ((ushort *)((long)local_40 + 2))[0] = 0x4646;
      ((ushort *)((long)local_40 + 2))[1] = 0x4446;
LAB_01240bf9:
      local_40 = (uint *)((long)local_40 + 6);
      puVar57 = (uint *)((long)puVar57 + 1);
    }
    goto LAB_01240a92;
  case 8:
    uVar69 = *puVar57;
    bVar77 = (byte)uVar69;
    if ((((uVar69 & 0xc0c0c0f8) == 0x808080f0) && ((uVar69 & 0x3007) != 0)) &&
       (((byte)(uVar69 >> 2) & 0x3f & (uVar69 & 0x3003) != 0) == 0)) {
      *local_40 = uVar69;
      local_40 = local_40 + 1;
      puVar57 = puVar74;
      goto LAB_01240a92;
    }
    break;
  case 9:
    uVar69 = *puVar57;
    if ((((uVar69 & 0xc0c0c0f8) != 0x808080f0) || ((uVar69 & 0x3007) == 0)) ||
       (((byte)uVar69 >> 2 & (uVar69 & 0x3003) != 0) != 0)) goto LAB_01240be0;
    iVar60 = (uVar69 & 7) * 0x40000;
    iVar70 = (uVar69 & 0x3f00) * 0x10;
    *(ushort *)local_40 = 0x755c;
    *(ushort *)((long)local_40 + 2) =
         *(ushort *)
          (esc_hex_char_table + (ulong)(((iVar60 + iVar70) - 0x10000U >> 10) + 0xd800 >> 8) * 2);
    *(ushort *)(local_40 + 1) =
         *(ushort *)
          (esc_hex_char_table + (((uVar69 >> 10 & 0xc00) - 0x10000) + iVar60 + iVar70 >> 9 & 0x1fe))
    ;
    *(ushort *)((long)local_40 + 6) = 0x755c;
    *(ushort *)(local_40 + 2) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar69 >> 0x11 & 6) + 0x1b8);
    *(ushort *)((long)local_40 + 10) =
         *(ushort *)(esc_hex_char_table + (ulong)(uVar69 >> 10 & 0xc0 | uVar69 >> 0x18 & 0x3f) * 2);
    local_40 = local_40 + 3;
    puVar57 = puVar74;
    goto LAB_01240a92;
  default:
switchD_01240abf_default:
    *(byte *)local_40 = 0x22;
    local_40 = (uint *)((long)local_40 + 1);
    goto LAB_0124059d;
  }
LAB_01240d9b:
  if ((flg & 0x20) == 0) goto LAB_0124283e;
  *(byte *)local_40 = bVar77;
  local_40 = (uint *)((long)local_40 + 1);
  puVar57 = (uint *)((long)puVar57 + 1);
  goto LAB_01240a92;
LAB_0124283e:
  (*p_Var5)(pvVar6,puVar102);
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar66 = &local_60;
  if (err != (yyjson_write_err *)0x0) {
    pyVar66 = err;
  }
  pyVar67->code = 7;
  pcVar59 = "invalid utf-8 encoding in string";
  goto LAB_01240601;
switchD_01240abf_caseD_0:
  puVar74 = (uint *)((long)puVar57 + 1);
  *(byte *)local_40 = (byte)uVar83;
  puVar79 = local_40;
  goto LAB_01240852;
LAB_01240158:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar66 = &local_60;
  if (err != (yyjson_write_err *)0x0) {
    pyVar66 = err;
  }
  pyVar67->code = 7;
  pcVar59 = "invalid utf-8 encoding in string";
LAB_0124018f:
  pyVar66->msg = pcVar59;
  if (local_f8 != (byte *)0x0) {
    (*p_Var5)(pvVar6,local_f8);
  }
  return (char *)0x0;
}

Assistant:

static char *yyjson_mut_write_opts_impl(const yyjson_mut_val *val,
                                        usize estimated_val_num,
                                        yyjson_write_flag flg,
                                        const yyjson_alc *alc_ptr,
                                        usize *dat_len,
                                        yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_mut_val *root = constcast(yyjson_mut_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_WRITE_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_mut_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_mut_write_pretty(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_mut_write_minify(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    }
}